

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLaplacian_misc.cpp
# Opt level: O3

void __thiscall
amrex::MLNodeLaplacian::compRHS
          (MLNodeLaplacian *this,Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *rhs,
          Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *vel,
          Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *rhnd,
          Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *a_rhcc)

{
  iMultiFab *piVar1;
  undefined **ppuVar2;
  undefined **ppuVar3;
  undefined **ppuVar4;
  undefined **ppuVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  pointer paVar17;
  FabArray<amrex::FArrayBox> *pFVar18;
  pointer ppMVar19;
  MultiFab *pMVar20;
  long *plVar21;
  EBCellFlagFab *this_00;
  tuple<amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_> this_01;
  pointer paVar22;
  pointer ppMVar23;
  double dVar24;
  int iVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  iMultiFab *piVar28;
  int idim;
  FabType FVar29;
  uint uVar30;
  uint uVar31;
  long lVar32;
  MultiFab *pMVar33;
  EBFArrayBoxFactory *pEVar34;
  int *piVar35;
  long lVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  int iVar46;
  long lVar47;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *pVVar48;
  int iVar49;
  uint uVar50;
  int iVar51;
  undefined8 *puVar52;
  long lVar53;
  long lVar54;
  long lVar55;
  int iVar56;
  int iVar57;
  size_type __n;
  long lVar58;
  long lVar59;
  long lVar60;
  long lVar61;
  long lVar62;
  ulong uVar63;
  int iVar64;
  EBFArrayBoxFactory *this_02;
  long lVar65;
  long lVar66;
  long lVar67;
  Geometry *pGVar68;
  bool bVar69;
  int iVar70;
  int iVar71;
  long lVar72;
  long lVar73;
  long lVar74;
  long lVar75;
  long lVar76;
  int iVar77;
  long lVar78;
  long lVar79;
  long lVar80;
  long lVar81;
  long lVar82;
  long lVar83;
  long lVar84;
  long lVar85;
  long lVar86;
  long lVar87;
  long lVar88;
  int in;
  long lVar89;
  long lVar90;
  int iVar91;
  long lVar92;
  double *pdVar93;
  long lVar94;
  long lVar95;
  long lVar96;
  void *pvVar97;
  long lVar98;
  long lVar99;
  long lVar100;
  bool bVar101;
  bool bVar102;
  bool bVar103;
  double dVar104;
  double dVar105;
  double dVar106;
  double dVar107;
  double dVar108;
  double dVar109;
  double dVar110;
  double dVar111;
  double dVar112;
  double dVar113;
  double dVar114;
  double dVar115;
  double dVar116;
  undefined *puVar117;
  int iVar118;
  double dVar119;
  double dVar120;
  undefined1 auVar121 [16];
  undefined4 uVar122;
  double dVar123;
  double dVar124;
  double dVar125;
  double dVar126;
  double dVar127;
  double dVar128;
  double dVar129;
  double dVar130;
  double dVar131;
  double dVar132;
  Periodicity PVar133;
  int jlo;
  int klo;
  Box bx;
  Real facz;
  Real facy;
  Box cccdom_pi;
  Real facx;
  IntVect dlo;
  MFIter mfi_3;
  Box domain;
  IntVect cell;
  Box result;
  IntVect dhi;
  Box bx_2;
  Box bx_vel;
  Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  rhcc;
  Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  frhs;
  Vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  rhs_cc;
  MFIter mfi;
  long local_8d8;
  long local_8d0;
  long local_8c8;
  long local_8b0;
  long local_8a8;
  long local_8a0;
  double *local_898;
  long local_890;
  long local_888;
  double *local_880;
  double *local_878;
  long local_870;
  long local_868;
  double *local_860;
  iMultiFab *local_858;
  long local_850;
  long local_840;
  long local_838;
  long local_830;
  long local_828;
  long local_808;
  long local_7f0;
  ulong local_7e8;
  long local_7c8;
  long local_7c0;
  double *local_7a8;
  undefined1 *local_790;
  Box local_778;
  undefined8 local_758;
  undefined8 uStack_750;
  double *local_740;
  double *local_738;
  Geometry *local_730;
  ulong local_728;
  double *local_720;
  Box local_718;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *local_6f0;
  double *local_6e8;
  double *local_6e0;
  double *local_6d8;
  double *local_6d0;
  double local_6c8;
  long local_6c0;
  ulong local_6b8;
  double local_6b0;
  _Head_base<0UL,_amrex::LayoutData<int>_*,_false> local_6a8;
  long local_6a0;
  long local_698;
  long local_690;
  double local_688;
  double *local_680;
  int local_674;
  double local_670;
  long local_668;
  undefined1 local_660 [20];
  int iStack_64c;
  LinOpBCType local_648;
  double *local_640;
  long local_638;
  long local_630;
  __uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> local_628;
  FabArray<amrex::IArrayBox> *local_620;
  long local_618;
  long local_610;
  undefined1 local_608 [24];
  undefined4 uStack_5f0;
  int local_5e8;
  int local_5e4;
  int local_5e0;
  undefined1 local_5c8 [20];
  int iStack_5b4;
  undefined1 local_5b0 [16];
  int local_5a0;
  Vector<int,_std::allocator<int>_> *local_588;
  double local_568;
  ulong uStack_560;
  iMultiFab *local_558;
  long local_550;
  long local_548;
  __uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> local_540;
  long local_538;
  long local_530;
  long local_528;
  long local_520;
  double *local_518;
  double *local_510;
  long local_508;
  undefined4 local_4fc;
  Array4<const_double> local_4f8;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *local_4b8;
  iMultiFab *local_4b0;
  long local_4a8;
  long local_4a0;
  iMultiFab *local_498;
  ulong uStack_490;
  Array4<const_double> local_488;
  undefined1 local_448 [16];
  long local_438;
  ulong local_430;
  Array4<const_double> local_428;
  Box local_3e8;
  Array4<const_double> local_3c8;
  Array4<const_double> local_388;
  Array4<const_double> local_348;
  FabArray<amrex::FArrayBox> *local_308;
  long local_300;
  undefined1 local_2f8 [16];
  double local_2e8;
  ulong uStack_2e0;
  double local_2d8;
  ulong uStack_2d0;
  double local_2c8;
  ulong uStack_2c0;
  MultiCutFab *local_2b0;
  Real local_2a8;
  FabArray<amrex::EBCellFlagFab> *local_2a0;
  FabArray<amrex::IArrayBox> *local_298;
  Box local_28c;
  vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  local_270;
  double local_258;
  ulong uStack_250;
  double local_248;
  ulong uStack_240;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *local_238;
  _Head_base<0UL,_amrex::MultiFab_*,_false> local_230;
  double local_228;
  ulong uStack_220;
  MFItInfo local_214;
  vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  local_200;
  Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *local_1e8;
  ulong local_1e0;
  _Head_base<0UL,_amrex::MultiFab_*,_false> local_1d8;
  FabArray<amrex::IArrayBox> *local_1d0;
  vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  local_1c8;
  undefined1 local_1b0 [32];
  int aiStack_190 [40];
  IntVect local_f0;
  int local_e4;
  
  local_4b8 = vel;
  local_238 = a_rhcc;
  local_1e8 = rhnd;
  if ((this->super_MLNodeLinOp).m_masks_built == false) {
    MLNodeLinOp::buildMasks(&this->super_MLNodeLinOp);
  }
  if (this->m_integral_built == false) {
    buildIntegral(this);
  }
  if ((this->m_build_surface_integral == true) && (this->m_surface_integral_built == false)) {
    buildSurfaceIntegral(this);
  }
  paVar17 = (this->super_MLNodeLinOp).super_MLLinOp.m_lobc.
            super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
            .
            super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  stack0xfffffffffffff9b0 = *(pointer *)paVar17->_M_elems;
  local_648 = paVar17->_M_elems[2];
  paVar17 = (this->super_MLNodeLinOp).super_MLLinOp.m_hibc.
            super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
            .
            super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_660._0_8_ = *(pointer *)paVar17->_M_elems;
  local_660._8_4_ = paVar17->_M_elems[2];
  lVar32 = 0;
  uVar63 = 0;
  do {
    local_1e0 = 1;
    if ((uVar63 == 0) && (*(int *)(local_660 + lVar32 * 4 + 0x10) != 0x6a)) {
      local_1e0 = (ulong)(*(int *)(local_660 + lVar32 * 4) == 0x6a);
    }
    lVar32 = lVar32 + 1;
    uVar63 = local_1e0;
  } while (lVar32 != 3);
  std::
  vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  ::vector(&local_270,(long)(this->super_MLNodeLinOp).super_MLLinOp.m_num_amr_levels,
           (allocator_type *)local_1b0);
  std::
  vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  ::vector(&local_1c8,(long)(this->super_MLNodeLinOp).super_MLLinOp.m_num_amr_levels,
           (allocator_type *)local_1b0);
  __n = (size_type)(this->super_MLNodeLinOp).super_MLLinOp.m_num_amr_levels;
  local_6f0 = rhs;
  if (0 < (long)__n) {
    dVar119 = 0.0;
    do {
      pGVar68 = *(Geometry **)
                 &(this->super_MLNodeLinOp).super_MLLinOp.m_geom.
                  super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                  .
                  super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[(long)dVar119].
                  super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                  super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
      local_670 = dVar119;
      if ((char)local_1e0 != '\0') {
        uVar26 = *(undefined8 *)((pGVar68->domain).smallend.vect + 2);
        uVar27 = *(undefined8 *)((pGVar68->domain).bigend.vect + 2);
        local_488.kstride._0_4_ =
             (undefined4)((ulong)*(undefined8 *)(pGVar68->domain).bigend.vect >> 0x20);
        local_488.kstride._4_4_ = (undefined4)uVar27;
        local_488.nstride._0_4_ = (undefined4)((ulong)uVar27 >> 0x20);
        local_488.p = (double *)*(undefined ***)(pGVar68->domain).smallend.vect;
        local_488.jstride._0_4_ = (uint)uVar26;
        local_488.jstride._4_4_ = (int)((ulong)uVar26 >> 0x20);
        lVar32 = 0;
        do {
          if (*(int *)(local_660 + lVar32 * 4 + 0x10) != 0x6a) {
            piVar35 = (int *)((long)&local_488.p + lVar32 * 4);
            *piVar35 = *piVar35 + -1;
          }
          if (*(int *)(local_660 + lVar32 * 4) != 0x6a) {
            *(int *)(local_448 + lVar32 * 4 + -0x34) = *(int *)(local_448 + lVar32 * 4 + -0x34) + 1;
          }
          lVar32 = lVar32 + 1;
        } while (lVar32 != 3);
        local_608._8_4_ = (uint)local_488.jstride;
        local_608._0_8_ = local_488.p;
        local_3c8.jstride._0_4_ = local_488.kstride._4_4_;
        local_3c8.p = (double *)CONCAT44((undefined4)local_488.kstride,local_488.jstride._4_4_);
        local_730 = pGVar68;
        MFIter::MFIter((MFIter *)local_1b0,
                       (FabArrayBase *)
                       (local_4b8->
                       super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                       super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                       _M_impl.super__Vector_impl_data._M_start[(long)dVar119],true);
        iVar71 = local_488.jstride._4_4_;
        uVar31 = (uint)local_488.jstride;
        if (aiStack_190[0] < aiStack_190[2]) {
          local_758 = (double)CONCAT44(local_488.kstride._4_4_,(undefined4)local_488.kstride);
          uStack_750 = 0;
          iVar49 = (int)local_488.p;
          iVar77 = local_488.p._4_4_;
          do {
            uVar122 = SUB84(a_rhcc,0);
            MFIter::growntilebox((Box *)&local_4f8,(MFIter *)local_1b0,1);
            FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                      ((Array4<double> *)local_5c8,
                       &(local_4b8->
                        super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                        super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                        _M_impl.super__Vector_impl_data._M_start[(long)dVar119]->
                        super_FabArray<amrex::FArrayBox>,(MFIter *)local_1b0);
            auVar121._0_4_ = -(uint)((int)local_758 < (int)local_4f8.kstride);
            auVar121._4_4_ = -(uint)(local_758._4_4_ < local_4f8.kstride._4_4_);
            auVar121._8_4_ = -(uint)((int)local_4f8.p < iVar49);
            iVar118 = (int)((ulong)local_4f8.p >> 0x20);
            auVar121._12_4_ = -(uint)(iVar118 < iVar77);
            iVar70 = movmskps(uVar122,auVar121);
            a_rhcc = (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                     (ulong)CONCAT31((int3)((uint)iVar70 >> 8),iVar70 == 0);
            if ((int)local_4f8.jstride <= local_4f8.kstride._4_4_ &&
                ((iVar71 < local_4f8.jstride._4_4_ || (int)local_4f8.jstride < (int)uVar31) ||
                iVar70 != 0)) {
              a_rhcc = (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                       ((ulong)local_4f8.p & 0xffffffff);
              iVar70 = (int)local_4f8.jstride;
              do {
                if (iVar118 <= (int)local_4f8.kstride) {
                  iVar37 = iVar118;
                  do {
                    if ((int)local_4f8.p <= local_4f8.jstride._4_4_) {
                      uVar63 = (ulong)local_4f8.p & 0xffffffff;
                      do {
                        local_428.p._0_4_ = (int)uVar63;
                        local_428.p._4_4_ = iVar37;
                        local_428.jstride._0_4_ = iVar70;
                        lVar32 = 0;
                        do {
                          puVar52 = (undefined8 *)
                                    (((long)iVar37 - (long)(int)local_5b0._12_4_) *
                                     CONCAT44(local_5c8._12_4_,local_5c8._8_4_) * 8 +
                                     ((long)iVar70 - (long)local_5a0) *
                                     CONCAT44(iStack_5b4,local_5c8._16_4_) * 8 +
                                     (long)(int)local_5b0._8_4_ * -8 +
                                    CONCAT44(local_5c8._4_4_,local_5c8._0_4_) +
                                    (long)(int)local_428.p * 8);
                          lVar92 = 0;
                          do {
                            if ((lVar32 != lVar92) &&
                               ((iVar91 = *(int *)((long)&local_428.p + lVar32 * 4),
                                iVar91 < *(int *)(local_608 + lVar32 * 4) ||
                                (*(int *)((long)&local_3c8.p + lVar32 * 4) < iVar91)))) {
                              *puVar52 = 0;
                            }
                            lVar92 = lVar92 + 1;
                            puVar52 = puVar52 + local_5b0._0_8_;
                          } while (lVar92 != 3);
                          lVar32 = lVar32 + 1;
                        } while (lVar32 != 3);
                        uVar63 = (ulong)((int)local_428.p + 1);
                      } while ((int)local_428.p != local_4f8.jstride._4_4_);
                    }
                    bVar101 = iVar37 != (int)local_4f8.kstride;
                    iVar37 = iVar37 + 1;
                  } while (bVar101);
                }
                bVar101 = iVar70 != local_4f8.kstride._4_4_;
                iVar70 = iVar70 + 1;
              } while (bVar101);
            }
            MFIter::operator++((MFIter *)local_1b0);
            dVar119 = local_670;
          } while (aiStack_190[0] < aiStack_190[2]);
        }
        MFIter::~MFIter((MFIter *)local_1b0);
        rhs = local_6f0;
        pGVar68 = local_730;
      }
      pFVar18 = &(local_4b8->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                 super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
                 super__Vector_impl_data._M_start[(long)dVar119]->super_FabArray<amrex::FArrayBox>;
      local_1b0._0_8_ =
           (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)
           0x100000001;
      local_1b0._8_4_ = 1;
      PVar133 = Geometry::periodicity(pGVar68);
      local_5c8._0_4_ = PVar133.period.vect[0];
      local_5c8._4_4_ = PVar133.period.vect[1];
      local_5c8._8_4_ = PVar133.period.vect[2];
      a_rhcc = (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)local_5c8;
      FabArray<amrex::FArrayBox>::FillBoundary<double>
                (pFVar18,0,3,(IntVect *)local_1b0,(Periodicity *)a_rhcc,false);
      ppMVar19 = (local_238->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                 super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      if (((long)dVar119 <
           (long)(local_238->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                 super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)ppMVar19 >> 3) &&
         (pMVar20 = ppMVar19[(long)dVar119], pMVar20 != (MultiFab *)0x0)) {
        pMVar33 = (MultiFab *)operator_new(0x180);
        local_1b0._0_8_ =
             (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
        stack0xfffffffffffffe68 = (undefined1  [16])0x0;
        local_1b0._8_4_ = 0;
        local_1b0._12_4_ = 0;
        local_1b0._16_8_ = (pointer)0x0;
        local_5c8._0_4_ = 0x712918;
        local_5c8._4_4_ = 0;
        MultiFab::MultiFab(pMVar33,(BoxArray *)
                                   ((long)&(pMVar20->super_FabArray<amrex::FArrayBox>).
                                           super_FabArrayBase + 8),
                           (DistributionMapping *)
                           ((long)&(pMVar20->super_FabArray<amrex::FArrayBox>).super_FabArrayBase +
                           0x70),1,1,(MFInfo *)local_1b0,(FabFactory<amrex::FArrayBox> *)local_5c8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_1b0 + 0x10));
        pMVar20 = local_270.
                  super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[(long)dVar119]._M_t.
                  super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t
                  .super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
        local_270.
        super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[(long)dVar119]._M_t.
        super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
        super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
        super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl = pMVar33;
        if (pMVar20 != (MultiFab *)0x0) {
          (**(code **)(*(long *)&(pMVar20->super_FabArray<amrex::FArrayBox>).super_FabArrayBase + 8)
          )();
        }
        pFVar18 = &(local_270.
                    super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[(long)dVar119]._M_t.
                    super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                    .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl)->
                   super_FabArray<amrex::FArrayBox>;
        FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                  (pFVar18,0.0,0,(pFVar18->super_FabArrayBase).n_comp,
                   &(pFVar18->super_FabArrayBase).n_grow);
        MultiFab::Copy(local_270.
                       super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[(long)dVar119]._M_t.
                       super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                       .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,
                       (local_238->
                       super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                       super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                       _M_impl.super__Vector_impl_data._M_start[(long)dVar119],0,0,1,0);
        pFVar18 = &(local_270.
                    super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[(long)dVar119]._M_t.
                    super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                    .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl)->
                   super_FabArray<amrex::FArrayBox>;
        PVar133 = Geometry::periodicity(pGVar68);
        local_1b0._0_8_ = PVar133.period.vect._0_8_;
        local_1b0._8_4_ = PVar133.period.vect[2];
        FabArray<amrex::FArrayBox>::FillBoundary<double>(pFVar18,(Periodicity *)local_1b0,false);
        pMVar20 = (rhs->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                  super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
                  super__Vector_impl_data._M_start[(long)dVar119];
        pMVar33 = (MultiFab *)operator_new(0x180);
        local_1b0._0_8_ =
             (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
        stack0xfffffffffffffe68 = (undefined1  [16])0x0;
        local_1b0._8_4_ = 0;
        local_1b0._12_4_ = 0;
        local_1b0._16_8_ = (pointer)0x0;
        local_5c8._0_4_ = 0x712918;
        local_5c8._4_4_ = 0;
        a_rhcc = (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)0x0;
        MultiFab::MultiFab(pMVar33,(BoxArray *)
                                   ((long)&(pMVar20->super_FabArray<amrex::FArrayBox>).
                                           super_FabArrayBase + 8),
                           (DistributionMapping *)
                           ((long)&(pMVar20->super_FabArray<amrex::FArrayBox>).super_FabArrayBase +
                           0x70),1,0,(MFInfo *)local_1b0,(FabFactory<amrex::FArrayBox> *)local_5c8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_1b0 + 0x10));
        pMVar20 = local_1c8.
                  super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[(long)dVar119]._M_t.
                  super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t
                  .super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
        local_1c8.
        super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[(long)dVar119]._M_t.
        super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
        super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
        super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl = pMVar33;
        if (pMVar20 != (MultiFab *)0x0) {
          (**(code **)(*(long *)&(pMVar20->super_FabArray<amrex::FArrayBox>).super_FabArrayBase + 8)
          )();
        }
      }
      local_2a8 = (pGVar68->super_CoordSys).inv_dx[0];
      local_730 = (Geometry *)(pGVar68->super_CoordSys).inv_dx[1];
      local_738 = (double *)(pGVar68->super_CoordSys).inv_dx[2];
      local_778.smallend.vect._0_8_ = *(undefined8 *)(pGVar68->domain).smallend.vect;
      uVar26 = *(undefined8 *)((pGVar68->domain).smallend.vect + 2);
      local_778.bigend.vect[1] = (int)((ulong)*(undefined8 *)(pGVar68->domain).bigend.vect >> 0x20);
      local_778._20_8_ = *(undefined8 *)((pGVar68->domain).bigend.vect + 2);
      local_778.smallend.vect[2] = (int)uVar26;
      local_778.bigend.vect[0] = (int)((ulong)uVar26 >> 0x20);
      lVar32 = 0;
      do {
        if ((local_778.btype.itype >> ((uint)lVar32 & 0x1f) & 1) == 0) {
          piVar35 = local_778.bigend.vect + lVar32;
          *piVar35 = *piVar35 + 1;
        }
        lVar32 = lVar32 + 1;
      } while (lVar32 != 3);
      local_778.btype.itype = 7;
      local_1d0 = (FabArray<amrex::IArrayBox> *)
                  **(undefined8 **)
                    &(this->super_MLNodeLinOp).m_dirichlet_mask.
                     super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                     .
                     super__Vector_base<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[(long)dVar119].
                     super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                     .
                     super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
      ;
      plVar21 = *(long **)&(this->super_MLNodeLinOp).super_MLLinOp.m_factory.
                           super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                           .
                           super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[(long)dVar119].
                           super_vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                           .
                           super__Vector_base<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
      ;
      lVar32 = *plVar21;
      local_4fc = (undefined4)CONCAT71((int7)((ulong)plVar21 >> 8),1);
      if (lVar32 == 0) {
        local_308 = (FabArray<amrex::FArrayBox> *)0x0;
        this_02 = (EBFArrayBoxFactory *)0x0;
        local_2a0 = (FabArray<amrex::EBCellFlagFab> *)0x0;
        local_2b0 = (MultiCutFab *)0x0;
      }
      else {
        pEVar34 = (EBFArrayBoxFactory *)
                  __dynamic_cast(lVar32,&FabFactory<amrex::FArrayBox>::typeinfo,
                                 &EBFArrayBoxFactory::typeinfo,0);
        local_308 = (FabArray<amrex::FArrayBox> *)0x0;
        local_2a0 = (FabArray<amrex::EBCellFlagFab> *)0x0;
        local_2b0 = (MultiCutFab *)0x0;
        this_02 = (EBFArrayBoxFactory *)0x0;
        if (pEVar34 != (EBFArrayBoxFactory *)0x0) {
          local_2a0 = EBDataCollection::getMultiEBCellFlagFab
                                ((pEVar34->m_ebdc).
                                 super___shared_ptr<amrex::EBDataCollection,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr);
          local_308 = &EBDataCollection::getVolFrac
                                 ((pEVar34->m_ebdc).
                                  super___shared_ptr<amrex::EBDataCollection,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->super_FabArray<amrex::FArrayBox>;
          local_2b0 = EBDataCollection::getBndryArea
                                ((pEVar34->m_ebdc).
                                 super___shared_ptr<amrex::EBDataCollection,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr);
          local_4fc = 0;
          this_02 = pEVar34;
        }
      }
      local_230._M_head_impl =
           *(MultiFab **)
            &(this->m_integral).
             super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
             .
             super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[(long)dVar119]._M_t.
             super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
      local_1d8._M_head_impl =
           *(MultiFab **)
            &(this->m_surface_integral).
             super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
             .
             super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[(long)dVar119]._M_t.
             super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
      if (((dVar119 != (double)(ulong)((this->super_MLNodeLinOp).super_MLLinOp.m_num_amr_levels - 1)
           ) && ((this->super_MLNodeLinOp).super_MLLinOp.m_amr_ref_ratio.
                 super_vector<int,_std::allocator<int>_>.
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start[(long)dVar119] != 2 && (char)local_4fc == '\0')) &&
         (bVar101 = EBFArrayBoxFactory::isAllRegular(this_02), !bVar101)) {
        Assert_host("ilev == m_num_amr_levels-1 || AMRRefRatio(ilev) == 2 || factory == nullptr || factory->isAllRegular()"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/LinearSolvers/MLMG/AMReX_MLNodeLaplacian_misc.cpp"
                    ,0x3df,(char *)0x0);
      }
      rhs = local_6f0;
      local_28c.smallend.vect[0] = CONCAT13(local_28c.smallend.vect[0]._3_1_,0x10000);
      local_28c.smallend.vect[1] = Gpu::Device::max_gpu_streams;
      local_28c.bigend.vect[1] = DAT_00717ec0;
      local_28c.smallend.vect[2] = (int)FabArrayBase::mfiter_tile_size;
      local_28c.bigend.vect[0] = FabArrayBase::mfiter_tile_size._4_4_;
      local_28c.smallend.vect[0] = CONCAT22(local_28c.smallend.vect[0]._2_2_,0x101);
      MFIter::MFIter((MFIter *)local_1b0,
                     (FabArrayBase *)
                     (local_6f0->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                     ).super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                     _M_impl.super__Vector_impl_data._M_start[(long)dVar119],(MFItInfo *)&local_28c)
      ;
      if (aiStack_190[0] < aiStack_190[2]) {
        local_6b0 = local_2a8 * 0.25;
        local_730 = (Geometry *)((double)local_730 * 0.25);
        local_738 = (double *)((double)local_738 * 0.25);
        local_2a8 = local_2a8 * 0.125;
        do {
          MFIter::tilebox(&local_718,(MFIter *)local_1b0);
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    ((Array4<double> *)local_5c8,
                     &(rhs->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                      _M_impl.super__Vector_impl_data._M_start[(long)dVar119]->
                      super_FabArray<amrex::FArrayBox>,(MFIter *)local_1b0);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_488,
                     &(local_4b8->
                      super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                      _M_impl.super__Vector_impl_data._M_start[(long)dVar119]->
                      super_FabArray<amrex::FArrayBox>,(MFIter *)local_1b0);
          FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                    ((Array4<const_int> *)&local_4f8,local_1d0,(MFIter *)local_1b0);
          FVar29 = regular;
          if ((char)local_4fc == '\0') {
            piVar35 = aiStack_190;
            if ((Vector<int,_std::allocator<int>_> *)aiStack_190._32_8_ !=
                (Vector<int,_std::allocator<int>_> *)0x0) {
              piVar35 = (int *)((long)aiStack_190[0] * 4 + *(long *)aiStack_190._32_8_);
            }
            this_00 = (local_2a0->m_fabs_v).
                      super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                      ._M_impl.super__Vector_impl_data._M_start[*piVar35];
            local_608._16_4_ = local_718.bigend.vect[1];
            local_608._20_4_ = local_718.bigend.vect[2];
            uStack_5f0 = local_718.btype.itype;
            local_608._0_4_ = local_718.smallend.vect[0];
            local_608._4_4_ = local_718.smallend.vect[1];
            local_608._8_4_ = local_718.smallend.vect[2];
            local_608._12_4_ = local_718.bigend.vect[0];
            lVar32 = 0;
            do {
              if ((uStack_5f0 >> ((uint)lVar32 & 0x1f) & 1) != 0) {
                *(int *)(local_608 + lVar32 * 4 + 0xc) = *(int *)(local_608 + lVar32 * 4 + 0xc) + -1
                ;
              }
              lVar32 = lVar32 + 1;
            } while (lVar32 != 3);
            uStack_5f0 = 0;
            local_3e8.btype.itype = 0;
            local_3e8.smallend.vect[0] = local_718.smallend.vect[0];
            local_3e8.smallend.vect[1] = local_718.smallend.vect[1];
            local_3e8.smallend.vect[2] = local_718.smallend.vect[2] - 1;
            local_3e8.bigend.vect[0] = local_608._12_4_ + 1;
            local_3e8.smallend.vect[1] = local_3e8.smallend.vect[1] + -1;
            local_3e8.smallend.vect[0] = local_3e8.smallend.vect[0] + -1;
            local_3e8.bigend.vect[1] = local_608._16_4_ + 1;
            local_3e8.bigend.vect[2] = local_608._20_4_ + 1;
            FVar29 = EBCellFlagFab::getType(this_00,&local_3e8);
            iVar49 = local_718.bigend.vect[1];
            iVar71 = local_718.bigend.vect[0];
            if (FVar29 == singlevalued) {
              local_2c8 = (double)CONCAT44(local_2c8._4_4_,1);
              FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                        ((Array4<const_double> *)local_608,local_308,(MFIter *)local_1b0);
              FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                        (&local_3c8,&(local_230._M_head_impl)->super_FabArray<amrex::FArrayBox>,
                         (MFIter *)local_1b0);
              local_300 = CONCAT44(local_300._4_4_,local_718.bigend.vect[2]);
              local_6a8._M_head_impl = (LayoutData<int> *)(ulong)(uint)local_718.smallend.vect[2];
              if (local_718.smallend.vect[2] <= local_718.bigend.vect[2]) {
                local_248 = (double)(ulong)(uint)local_718.bigend.vect[1];
                local_558 = (iMultiFab *)(long)local_718.smallend.vect[1];
                local_438 = (long)local_718.smallend.vect[0];
                local_674 = local_718.bigend.vect[1] + 1;
                local_550 = local_438 * 8;
                local_258 = (double)-local_438;
                local_298 = (FabArray<amrex::IArrayBox> *)
                            ((long)&local_558[-1].super_FabArray<amrex::IArrayBox>.os_temp + 7);
                local_4b0 = (iMultiFab *)CONCAT44(local_4b0._4_4_,local_718.smallend.vect[2] - 1);
                local_228 = (double)(local_438 * 4);
                local_430 = CONCAT44(local_430._4_4_,local_718.bigend.vect[0]);
                do {
                  if (local_718.smallend.vect[1] <= local_718.bigend.vect[1]) {
                    local_630 = (long)(int)local_4b0;
                    local_548 = (long)(int)(uint)local_6a8._M_head_impl;
                    local_498 = (iMultiFab *)(long)local_778.smallend.vect[1];
                    local_448._0_4_ = local_778.smallend.vect[2];
                    local_620 = (FabArray<amrex::IArrayBox> *)
                                CONCAT44(local_620._4_4_,local_778.bigend.vect[2]);
                    local_628._M_t.
                    super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                    .super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl =
                         (tuple<amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>)
                         (long)local_778.bigend.vect[1];
                    local_568 = (double)((long)local_778.bigend.vect[0] + (long)local_258);
                    local_6c8 = (double)((long)local_778.smallend.vect[0] + (long)local_258);
                    local_4a8 = CONCAT44(local_4f8.jstride._4_4_,(int)local_4f8.jstride) * 4;
                    lVar32 = (long)local_4f8.p +
                             ((long)local_558 - (long)local_4f8.begin.y) * local_4a8 +
                             (local_548 - local_4f8.begin.z) *
                             CONCAT44(local_4f8.kstride._4_4_,(int)local_4f8.kstride) * 4 +
                             (long)local_4f8.begin.x * -4 + (long)local_228;
                    local_858 = local_558;
                    local_790 = (undefined1 *)local_298;
                    do {
                      if (local_718.smallend.vect[0] <= local_718.bigend.vect[0]) {
                        local_720 = (double *)CONCAT44(local_720._4_4_,iStack_64c);
                        bVar69 = local_858 == local_498 && iStack_64c == 0x6a;
                        local_540._M_t.
                        super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                        .super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl._0_1_ =
                             bVar69;
                        local_6d0 = (double *)CONCAT44(local_6d0._4_4_,local_660._4_4_);
                        bVar101 = (tuple<amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                                  )local_858 ==
                                  (_Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                                   )local_628._M_t.
                                    super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                                    .super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl
                                  && local_660._4_4_ == 0x6a;
                        local_2d8 = (double)CONCAT71(local_2d8._1_7_,bVar101);
                        local_740 = (double *)CONCAT44(local_740._4_4_,local_648);
                        bVar102 = local_648 == inflow &&
                                  local_778.smallend.vect[2] == (uint)local_6a8._M_head_impl;
                        local_2e8 = (double)CONCAT71(local_2e8._1_7_,bVar102);
                        local_6d8 = (double *)CONCAT44(local_6d8._4_4_,local_660._8_4_);
                        bVar103 = local_660._8_4_ == inflow &&
                                  local_778.bigend.vect[2] == (uint)local_6a8._M_head_impl;
                        local_2f8[0] = bVar103;
                        lVar42 = CONCAT44(local_488.nstride._4_4_,(undefined4)local_488.nstride);
                        lVar65 = CONCAT44(local_488.jstride._4_4_,(uint)local_488.jstride) * 8;
                        lVar72 = ((long)local_790 - (long)local_488.begin.y) * lVar65;
                        lVar78 = CONCAT44(local_488.kstride._4_4_,(undefined4)local_488.kstride) * 8
                        ;
                        lVar85 = (local_630 - local_488.begin.z) * lVar78;
                        lVar92 = lVar72 + lVar85;
                        lVar78 = (local_548 - local_488.begin.z) * lVar78;
                        lVar72 = lVar72 + lVar78;
                        lVar65 = ((long)local_858 - (long)local_488.begin.y) * lVar65;
                        lVar85 = lVar85 + lVar65;
                        lVar65 = lVar65 + lVar78;
                        lVar81 = lVar42 * 0x10;
                        lVar78 = (long)local_488.begin.x;
                        local_6c0 = (long)local_488.p + lVar92 + lVar81 + lVar78 * -8 + local_550;
                        local_688 = (double)((long)local_488.p +
                                            lVar92 + lVar42 * 8 + lVar78 * -8 + local_550);
                        local_680 = (double *)((long)local_488.p + lVar92 + lVar78 * -8 + local_550)
                        ;
                        local_698 = (long)local_488.p + lVar72 + lVar81 + lVar78 * -8 + local_550;
                        local_638 = (long)local_488.p +
                                    lVar72 + lVar42 * 8 + lVar78 * -8 + local_550;
                        local_6e0 = (double *)((long)local_488.p + lVar72 + lVar78 * -8 + local_550)
                        ;
                        local_4a0 = (long)local_488.p + lVar85 + lVar81 + lVar78 * -8 + local_550;
                        local_690 = (long)local_488.p +
                                    lVar85 + lVar42 * 8 + lVar78 * -8 + local_550;
                        local_6e8 = (double *)((long)local_488.p + lVar85 + lVar78 * -8 + local_550)
                        ;
                        local_508 = (long)local_488.p + lVar81 + lVar65 + lVar78 * -8 + local_550;
                        local_668 = (long)local_488.p +
                                    lVar65 + lVar42 * 8 + lVar78 * -8 + local_550;
                        local_6b8 = (long)local_488.p + lVar65 + lVar78 * -8 + local_550;
                        lVar60 = (local_630 - local_3c8.begin.z) * local_3c8.kstride * 8;
                        lVar42 = (local_548 - local_3c8.begin.z) * local_3c8.kstride * 8;
                        lVar76 = CONCAT44(local_3c8.jstride._4_4_,(undefined4)local_3c8.jstride) * 8
                        ;
                        lVar82 = ((long)local_790 - (long)local_3c8.begin.y) * lVar76;
                        lVar76 = ((long)local_858 - (long)local_3c8.begin.y) * lVar76;
                        lVar92 = lVar82 + lVar60;
                        lVar82 = lVar82 + lVar42;
                        lVar60 = lVar60 + lVar76;
                        lVar76 = lVar76 + lVar42;
                        lVar95 = local_3c8.nstride * 0x38;
                        lVar83 = local_3c8.nstride * 0x10;
                        lVar90 = (long)local_3c8.begin.x;
                        lVar42 = local_3c8.nstride * 0x30;
                        lVar67 = local_3c8.nstride * 0x40;
                        lVar65 = lVar92 + lVar42 + lVar90 * -8 + local_550;
                        lVar78 = lVar92 + lVar95 + lVar90 * -8 + local_550;
                        lVar81 = lVar92 + lVar90 * -8 + local_550;
                        lVar72 = lVar92 + lVar67 + lVar90 * -8 + local_550;
                        lVar85 = lVar92 + lVar83 + lVar90 * -8 + local_550;
                        lVar92 = lVar92 + local_3c8.nstride * 8 + lVar90 * -8 + local_550;
                        lVar100 = lVar82 + lVar42 + lVar90 * -8 + local_550;
                        lVar61 = lVar82 + lVar95 + lVar90 * -8 + local_550;
                        local_520 = (long)local_3c8.p + lVar82 + lVar90 * -8 + local_550;
                        local_640 = (double *)
                                    ((long)local_3c8.p + lVar82 + lVar67 + lVar90 * -8 + local_550);
                        local_518 = (double *)
                                    ((long)local_3c8.p + lVar82 + lVar83 + lVar90 * -8 + local_550);
                        lVar82 = lVar82 + local_3c8.nstride * 8 + lVar90 * -8 + local_550;
                        local_528 = (long)local_3c8.p + lVar60 + lVar42 + lVar90 * -8 + local_550;
                        local_530 = (long)local_3c8.p + lVar60 + lVar95 + lVar90 * -8 + local_550;
                        local_538 = (long)local_3c8.p + lVar60 + lVar90 * -8 + local_550;
                        local_610 = (long)local_3c8.p + lVar60 + lVar67 + lVar90 * -8 + local_550;
                        local_618 = (long)local_3c8.p + lVar60 + lVar83 + lVar90 * -8 + local_550;
                        lVar60 = lVar60 + local_3c8.nstride * 8 + lVar90 * -8 + local_550;
                        lVar42 = lVar42 + lVar76 + lVar90 * -8 + local_550;
                        lVar95 = lVar95 + lVar76 + lVar90 * -8 + local_550;
                        lVar62 = lVar76 + lVar90 * -8 + local_550;
                        lVar67 = lVar67 + lVar76 + lVar90 * -8 + local_550;
                        local_510 = (double *)
                                    ((long)local_3c8.p + lVar83 + lVar76 + lVar90 * -8 + local_550);
                        lVar76 = lVar76 + local_3c8.nstride * 8 + lVar90 * -8 + local_550;
                        lVar55 = CONCAT44(local_608._20_4_,local_608._16_4_) * 8;
                        lVar96 = (local_630 - local_5e0) * lVar55;
                        lVar55 = (local_548 - local_5e0) * lVar55;
                        lVar43 = CONCAT44(local_608._12_4_,local_608._8_4_) * 8;
                        lVar90 = ((long)local_790 - (long)local_5e4) * lVar43;
                        lVar43 = ((long)local_858 - (long)local_5e4) * lVar43;
                        lVar44 = (long)local_5e8;
                        lVar83 = lVar96 + lVar90 + lVar44 * -8 + local_550;
                        lVar90 = lVar90 + lVar55 + lVar44 * -8 + local_550;
                        lVar96 = lVar96 + lVar43 + lVar44 * -8 + local_550;
                        lVar55 = lVar43 + lVar55 + lVar44 * -8 + local_550;
                        dVar119 = 0.0;
                        local_728 = CONCAT44(local_728._4_4_,local_660._16_4_);
                        local_6a0 = CONCAT44(local_6a0._4_4_,local_660._0_4_);
                        do {
                          dVar111 = 0.0;
                          if (*(int *)(lVar32 + (long)dVar119 * 4) == 0) {
                            dVar111 = 1.0;
                            if (((local_660._16_4_ == 0x66) ||
                                (dVar110 = 1.0, local_660._16_4_ == 0x6a)) &&
                               (dVar110 = 1.0, local_6c8 == dVar119)) {
                              dVar110 = 0.0;
                            }
                            if (((local_660._0_4_ == 0x66) ||
                                (local_758 = 1.0, local_660._0_4_ == 0x6a)) &&
                               (local_758 = 1.0, local_568 == dVar119)) {
                              local_758 = 0.0;
                            }
                            if (iStack_64c == 0x66) {
                              dVar126 = dVar111;
                              if (local_858 == local_498) {
LAB_005c86a2:
                                dVar126 = 0.0;
                              }
                            }
                            else {
                              dVar126 = 1.0;
                              if (bVar69) goto LAB_005c86a2;
                            }
                            uVar31 = 0x3ff00000;
                            if (local_660._4_4_ == 0x66) {
                              if ((tuple<amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                                  )local_858 ==
                                  (_Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                                   )local_628._M_t.
                                    super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                                    .super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl)
                              {
LAB_005c86d7:
                                uVar31 = 0;
                              }
                            }
                            else if (bVar101) goto LAB_005c86d7;
                            if (local_648 == Neumann) {
                              dVar125 = dVar111;
                              if (local_778.smallend.vect[2] == (uint)local_6a8._M_head_impl) {
LAB_005c8709:
                                dVar125 = 0.0;
                              }
                            }
                            else {
                              dVar125 = 1.0;
                              if (bVar102) goto LAB_005c8709;
                            }
                            if (local_660._8_4_ == Neumann) {
                              if (local_778.bigend.vect[2] == (uint)local_6a8._M_head_impl) {
LAB_005c8756:
                                dVar111 = 0.0;
                              }
                            }
                            else {
                              dVar111 = 1.0;
                              if (bVar103) goto LAB_005c8756;
                            }
                            dVar6 = *(double *)((long)local_3c8.p + (long)dVar119 * 8 + lVar82 + -8)
                            ;
                            dVar104 = *(double *)((long)local_3c8.p + (long)dVar119 * 8 + lVar82);
                            dVar7 = *(double *)(local_608._0_8_ + (long)dVar119 * 8 + lVar90 + -8);
                            dVar8 = *(double *)(local_608._0_8_ + (long)dVar119 * 8 + lVar90);
                            dVar112 = local_518[(long)dVar119 - 1] + local_518[(long)dVar119 - 1];
                            dVar104 = dVar104 + dVar104;
                            dVar113 = local_518[(long)dVar119] + local_518[(long)dVar119];
                            dVar105 = *(double *)
                                       ((long)local_3c8.p + (long)dVar119 * 8 + lVar76 + -8);
                            dVar9 = *(double *)(local_608._0_8_ + (long)dVar119 * 8 + lVar55 + -8);
                            dVar105 = dVar105 + dVar105;
                            dVar10 = *(double *)
                                      ((long)local_3c8.p + (long)dVar119 * 8 + lVar62 + -8);
                            dVar123 = dVar10 + dVar10 + dVar9;
                            dVar131 = local_510[(long)dVar119 - 1] + local_510[(long)dVar119 - 1];
                            dVar106 = *(double *)((long)local_3c8.p + (long)dVar119 * 8 + lVar76) *
                                      -2.0;
                            dVar10 = *(double *)(local_608._0_8_ + (long)dVar119 * 8 + lVar55);
                            dVar107 = *(double *)
                                       ((long)local_3c8.p + (long)dVar119 * 8 + lVar92 + -8) * -2.0;
                            dVar11 = *(double *)(local_608._0_8_ + (long)dVar119 * 8 + lVar83 + -8);
                            dVar114 = *(double *)
                                       ((long)local_3c8.p + (long)dVar119 * 8 + lVar85 + -8) * -2.0;
                            dVar108 = *(double *)((long)local_3c8.p + (long)dVar119 * 8 + lVar92);
                            dVar108 = dVar108 + dVar108;
                            dVar109 = *(double *)((long)local_3c8.p + (long)dVar119 * 8 + lVar81);
                            dVar12 = *(double *)(local_608._0_8_ + (long)dVar119 * 8 + lVar83);
                            dVar124 = (dVar109 + dVar109) - dVar12;
                            dVar24 = (double)((ulong)uVar31 << 0x20);
                            dVar109 = *(double *)((long)local_3c8.p + (long)dVar119 * 8 + lVar85);
                            dVar109 = dVar109 + dVar109;
                            dVar115 = *(double *)
                                       ((long)local_3c8.p + (long)dVar119 * 8 + lVar60 + -8);
                            dVar115 = dVar115 + dVar115;
                            dVar13 = *(double *)(local_538 + -8 + (long)dVar119 * 8);
                            dVar14 = *(double *)(local_608._0_8_ + (long)dVar119 * 8 + lVar96 + -8);
                            dVar116 = *(double *)(local_618 + -8 + (long)dVar119 * 8);
                            dVar116 = dVar116 + dVar116;
                            dVar120 = *(double *)((long)local_3c8.p + (long)dVar119 * 8 + lVar60);
                            dVar120 = dVar120 + dVar120;
                            dVar130 = *(double *)(local_538 + (long)dVar119 * 8);
                            dVar130 = dVar130 + dVar130;
                            dVar15 = *(double *)(local_608._0_8_ + (long)dVar119 * 8 + lVar96);
                            dVar129 = *(double *)(local_618 + (long)dVar119 * 8);
                            dVar129 = dVar129 + dVar129;
                            dVar16 = *(double *)(local_520 + -8 + (long)dVar119 * 8);
                            dVar127 = *(double *)(local_520 + (long)dVar119 * 8);
                            dVar127 = dVar127 + dVar127;
                            dVar128 = *(double *)((long)local_3c8.p + (long)dVar119 * 8 + lVar62);
                            dVar132 = dVar10 - (dVar128 + dVar128);
                            dVar128 = *(double *)
                                       ((long)local_3c8.p + (long)dVar119 * 8 + lVar81 + -8) * -2.0
                                      - dVar11;
                            dVar111 = ((*(double *)(local_528 + (long)dVar119 * 8) * -4.0 +
                                       (dVar130 - dVar15) + dVar120) *
                                       *(double *)(local_4a0 + (long)dVar119 * 8) * local_758 *
                                       dVar24 + (*(double *)(local_528 + -8 + (long)dVar119 * 8) *
                                                 4.0 + (dVar13 * -2.0 - dVar14) + dVar115) *
                                                *(double *)(local_4a0 + -8 + (long)dVar119 * 8) *
                                                dVar110 * dVar24 +
                                                (*(double *)
                                                  ((long)local_3c8.p + (long)dVar119 * 8 + lVar65) *
                                                 4.0 + (dVar124 - dVar108)) *
                                                *(double *)(local_6c0 + (long)dVar119 * 8) *
                                                local_758 * dVar126 +
                                                (*(double *)
                                                  ((long)local_3c8.p +
                                                  (long)dVar119 * 8 + lVar65 + -8) * -4.0 +
                                                dVar128 + dVar107) *
                                                *(double *)(local_6c0 + -8 + (long)dVar119 * 8) *
                                                dVar110 * dVar126 +
                                                (*(double *)
                                                  ((long)local_3c8.p + (long)dVar119 * 8 + lVar42) *
                                                 4.0 + dVar132 + dVar106) *
                                                *(double *)(local_508 + (long)dVar119 * 8) *
                                                local_758 * dVar24 +
                                                (*(double *)
                                                  ((long)local_3c8.p +
                                                  (long)dVar119 * 8 + lVar42 + -8) * -4.0 +
                                                (dVar123 - dVar105)) *
                                                *(double *)(local_508 + -8 + (long)dVar119 * 8) *
                                                dVar110 * dVar24 +
                                                (*(double *)
                                                  ((long)local_3c8.p +
                                                  (long)dVar119 * 8 + lVar100 + -8) * 4.0 +
                                                dVar6 + dVar6 + dVar16 + dVar16 + dVar7) *
                                                *(double *)(local_698 + -8 + (long)dVar119 * 8) *
                                                dVar110 * dVar126 +
                                                (*(double *)
                                                  ((long)local_3c8.p + (long)dVar119 * 8 + lVar100)
                                                 * -4.0 + (dVar8 - dVar127) + dVar104) *
                                                *(double *)(local_698 + (long)dVar119 * 8) *
                                                local_758 * dVar126) * (double)local_738 +
                                      ((*(double *)(local_610 + (long)dVar119 * 8) * -4.0 +
                                       (dVar15 - dVar120) + dVar129) * local_6e8[(long)dVar119] *
                                       dVar24 * dVar125 +
                                      (*(double *)(local_610 + -8 + (long)dVar119 * 8) * 4.0 +
                                      ((dVar115 - dVar14) - dVar116)) * local_6e8[(long)dVar119 - 1]
                                      * dVar24 * dVar125 +
                                      (*(double *)((long)local_3c8.p + (long)dVar119 * 8 + lVar72) *
                                       4.0 + dVar108 + dVar12 + dVar109) * local_680[(long)dVar119]
                                      * dVar126 * dVar125 +
                                      (*(double *)
                                        ((long)local_3c8.p + (long)dVar119 * 8 + lVar72 + -8) * -4.0
                                      + (dVar107 - dVar11) + dVar114) * local_680[(long)dVar119 - 1]
                                      * dVar126 * dVar125 +
                                      (*(double *)((long)local_3c8.p + (long)dVar119 * 8 + lVar67) *
                                       4.0 + dVar106 + dVar10 + local_510[(long)dVar119] * -2.0) *
                                      *(double *)(local_6b8 + (long)dVar119 * 8) *
                                      (double)((ulong)uVar31 << 0x20) * dVar111 +
                                      (*(double *)
                                        ((long)local_3c8.p + (long)dVar119 * 8 + lVar67 + -8) * -4.0
                                      + (dVar105 - dVar9) + dVar131) *
                                      *(double *)((local_6b8 - 8) + (long)dVar119 * 8) *
                                      (double)((ulong)uVar31 << 0x20) * dVar111 +
                                      (local_640[(long)dVar119 - 1] * 4.0 +
                                      (dVar6 * -2.0 - dVar7) + dVar112) *
                                      local_6e0[(long)dVar119 - 1] * dVar126 * dVar111 +
                                      (local_640[(long)dVar119] * -4.0 +
                                      ((dVar104 + dVar8) - dVar113)) * local_6e0[(long)dVar119] *
                                      dVar126 * dVar111) * local_6b0 +
                                      ((*(double *)(local_530 + (long)dVar119 * 8) * -4.0 +
                                       (dVar15 - dVar130) + dVar129) *
                                       *(double *)(local_690 + (long)dVar119 * 8) * local_758 *
                                       dVar125 +
                                      (*(double *)(local_530 + -8 + (long)dVar119 * 8) * 4.0 +
                                      dVar13 + dVar13 + dVar14 + dVar116) *
                                      *(double *)(local_690 + -8 + (long)dVar119 * 8) * dVar110 *
                                      dVar125 + (*(double *)
                                                  ((long)local_3c8.p + (long)dVar119 * 8 + lVar78) *
                                                 4.0 + (dVar124 - dVar109)) *
                                                *(double *)((long)local_688 + (long)dVar119 * 8) *
                                                local_758 * dVar125 +
                                                (*(double *)
                                                  ((long)local_3c8.p +
                                                  (long)dVar119 * 8 + lVar78 + -8) * -4.0 +
                                                dVar114 + dVar128) *
                                                *(double *)
                                                 (((long)local_688 - 8U) + (long)dVar119 * 8) *
                                                dVar110 * dVar125 +
                                                (*(double *)
                                                  ((long)local_3c8.p + (long)dVar119 * 8 + lVar95) *
                                                 4.0 + local_510[(long)dVar119] * -2.0 + dVar132) *
                                                *(double *)(local_668 + (long)dVar119 * 8) *
                                                local_758 * dVar111 +
                                                (*(double *)
                                                  ((long)local_3c8.p +
                                                  (long)dVar119 * 8 + lVar95 + -8) * -4.0 +
                                                (dVar123 - dVar131)) *
                                                *(double *)(local_668 + -8 + (long)dVar119 * 8) *
                                                dVar110 * dVar111 +
                                                (*(double *)
                                                  ((long)local_3c8.p +
                                                  (long)dVar119 * 8 + lVar61 + -8) * 4.0 +
                                                (dVar16 * -2.0 - dVar7) + dVar112) *
                                                *(double *)(local_638 + -8 + (long)dVar119 * 8) *
                                                dVar110 * dVar111 +
                                                (*(double *)
                                                  ((long)local_3c8.p + (long)dVar119 * 8 + lVar61) *
                                                 -4.0 + (dVar127 - dVar8) + dVar113) *
                                                *(double *)(local_638 + (long)dVar119 * 8) *
                                                local_758 * dVar111) * (double)local_730;
                          }
                          *(double *)
                           (((long)local_858 - (long)(int)local_5b0._12_4_) *
                            CONCAT44(local_5c8._12_4_,local_5c8._8_4_) * 8 +
                            CONCAT44(local_5c8._4_4_,local_5c8._0_4_) +
                            ((long)(int)(uint)local_6a8._M_head_impl - (long)local_5a0) *
                            CONCAT44(iStack_5b4,local_5c8._16_4_) * 8 +
                            (long)(int)local_5b0._8_4_ * -8 + local_550 + (long)dVar119 * 8) =
                               dVar111;
                          dVar119 = (double)((long)dVar119 + 1);
                        } while ((local_718.bigend.vect[0] - local_718.smallend.vect[0]) + 1 !=
                                 SUB84(dVar119,0));
                      }
                      local_858 = (iMultiFab *)
                                  ((long)&(local_858->super_FabArray<amrex::IArrayBox>).
                                          super_FabArrayBase._vptr_FabArrayBase + 1);
                      local_790 = local_790 + 1;
                      lVar32 = lVar32 + local_4a8;
                    } while (local_674 != (int)local_858);
                  }
                  uVar31 = (uint)local_6a8._M_head_impl + 1;
                  local_4b0 = (iMultiFab *)CONCAT44(local_4b0._4_4_,(int)local_4b0 + 1);
                  bVar101 = (uint)local_6a8._M_head_impl != local_718.bigend.vect[2];
                  local_6a8._M_head_impl = (LayoutData<int> *)(ulong)uVar31;
                } while (bVar101);
              }
              this_01.
              super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
              super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
                   *(_Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_> *)
                    &(this->m_eb_vel_dot_n).
                     super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                     .
                     super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[(long)local_670]._M_t.
                     super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>;
              if (this_01.
                  super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl !=
                  (_Head_base<0UL,_amrex::MultiFab_*,_false>)0x0) {
                FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                          (&local_428,
                           (FabArray<amrex::FArrayBox> *)
                           this_01.
                           super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                           .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,
                           (MFIter *)local_1b0);
                MultiCutFab::const_array(&local_388,local_2b0,(MFIter *)local_1b0);
                FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                          (&local_348,&(local_1d8._M_head_impl)->super_FabArray<amrex::FArrayBox>,
                           (MFIter *)local_1b0);
                local_740 = (double *)CONCAT44(local_740._4_4_,local_718.bigend.vect[2]);
                if (local_718.smallend.vect[2] <= local_718.bigend.vect[2]) {
                  local_6d8 = (double *)(ulong)(uint)local_718.bigend.vect[1];
                  local_720 = (double *)(long)local_718.smallend.vect[1];
                  lVar32 = (long)local_718.smallend.vect[0] * 8;
                  local_6e0 = (double *)((long)local_720 + -1);
                  local_6d0 = (double *)CONCAT44(local_6d0._4_4_,local_718.smallend.vect[2] - 1);
                  local_6e8 = (double *)((long)local_718.smallend.vect[0] * 4);
                  uVar31 = local_718.smallend.vect[2];
                  do {
                    if (local_718.smallend.vect[1] <= local_718.bigend.vect[1]) {
                      lVar92 = (long)(int)local_6d0;
                      lVar42 = (long)(int)uVar31;
                      lVar65 = CONCAT44(local_4f8.jstride._4_4_,(int)local_4f8.jstride) * 4;
                      local_8d0 = (long)local_4f8.p +
                                  ((long)local_720 - (long)local_4f8.begin.y) * lVar65 +
                                  (lVar42 - local_4f8.begin.z) *
                                  CONCAT44(local_4f8.kstride._4_4_,(int)local_4f8.kstride) * 4 +
                                  (long)local_4f8.begin.x * -4 + (long)local_6e8;
                      local_880 = local_720;
                      local_860 = local_6e0;
                      do {
                        if (local_718.smallend.vect[0] <= local_718.bigend.vect[0]) {
                          lVar59 = (long)local_348.begin.x;
                          lVar66 = CONCAT44(local_348.jstride._4_4_,(int)local_348.jstride) * 8;
                          lVar43 = ((long)local_860 - (long)local_348.begin.y) * lVar66;
                          lVar81 = CONCAT44(local_348.kstride._4_4_,(int)local_348.kstride) * 8;
                          lVar79 = (lVar92 - local_348.begin.z) * lVar81;
                          lVar78 = lVar43 + lVar79;
                          lVar81 = (lVar42 - local_348.begin.z) * lVar81;
                          lVar43 = lVar43 + lVar81;
                          lVar66 = ((long)local_880 - (long)local_348.begin.y) * lVar66;
                          lVar79 = lVar79 + lVar66;
                          lVar66 = lVar66 + lVar81;
                          lVar98 = local_348.nstride * 0x10;
                          lVar81 = local_348.nstride * 0x30;
                          lVar47 = local_348.nstride * 0x20;
                          lVar72 = local_348.nstride * 0x28;
                          lVar85 = local_348.nstride * 0x18;
                          lVar100 = lVar78 + lVar81 + lVar59 * -8 + lVar32;
                          lVar61 = lVar78 + lVar47 + lVar59 * -8 + lVar32;
                          lVar82 = lVar78 + lVar72 + lVar59 * -8 + lVar32;
                          lVar60 = lVar78 + lVar98 + lVar59 * -8 + lVar32;
                          lVar95 = lVar78 + lVar85 + lVar59 * -8 + lVar32;
                          lVar62 = lVar78 + local_348.nstride * 8 + lVar59 * -8 + lVar32;
                          lVar78 = lVar78 + lVar59 * -8 + lVar32;
                          lVar67 = lVar43 + lVar81 + lVar59 * -8 + lVar32;
                          lVar76 = lVar43 + lVar47 + lVar59 * -8 + lVar32;
                          lVar83 = lVar43 + lVar72 + lVar59 * -8 + lVar32;
                          lVar90 = lVar43 + lVar98 + lVar59 * -8 + lVar32;
                          lVar96 = lVar43 + lVar85 + lVar59 * -8 + lVar32;
                          lVar55 = lVar43 + local_348.nstride * 8 + lVar59 * -8 + lVar32;
                          local_758 = (double)((long)local_348.p + lVar43 + lVar59 * -8 + lVar32);
                          lVar43 = lVar79 + lVar81 + lVar59 * -8 + lVar32;
                          lVar44 = lVar79 + lVar47 + lVar59 * -8 + lVar32;
                          lVar36 = lVar79 + lVar72 + lVar59 * -8 + lVar32;
                          lVar58 = lVar79 + lVar98 + lVar59 * -8 + lVar32;
                          lVar45 = lVar79 + lVar85 + lVar59 * -8 + lVar32;
                          lVar53 = lVar79 + local_348.nstride * 8 + lVar59 * -8 + lVar32;
                          lVar79 = lVar79 + lVar59 * -8 + lVar32;
                          lVar81 = lVar81 + lVar66 + lVar59 * -8 + lVar32;
                          lVar47 = lVar47 + lVar66 + lVar59 * -8 + lVar32;
                          lVar72 = lVar72 + lVar66 + lVar59 * -8 + lVar32;
                          lVar98 = lVar98 + lVar66 + lVar59 * -8 + lVar32;
                          lVar85 = lVar85 + lVar66 + lVar59 * -8 + lVar32;
                          lVar54 = lVar66 + local_348.nstride * 8 + lVar59 * -8 + lVar32;
                          lVar59 = lVar66 + lVar59 * -8 + lVar32;
                          lVar66 = CONCAT44(local_428.kstride._4_4_,(uint)local_428.kstride) * 8;
                          lVar88 = (lVar92 - local_428.begin.z) * lVar66;
                          lVar66 = (lVar42 - local_428.begin.z) * lVar66;
                          lVar75 = CONCAT44(local_428.jstride._4_4_,(int)local_428.jstride) * 8;
                          lVar84 = ((long)local_860 - (long)local_428.begin.y) * lVar75;
                          lVar75 = ((long)local_880 - (long)local_428.begin.y) * lVar75;
                          lVar73 = (long)local_428.begin.x;
                          lVar74 = CONCAT44(local_428.p._4_4_,(int)local_428.p) + lVar32;
                          lVar80 = lVar84 + lVar88 + lVar73 * -8 + lVar74;
                          lVar84 = lVar84 + lVar66 + lVar73 * -8 + lVar74;
                          lVar88 = lVar88 + lVar75 + lVar73 * -8 + lVar74;
                          lVar74 = lVar75 + lVar66 + lVar73 * -8 + lVar74;
                          lVar66 = CONCAT44(local_388.kstride._4_4_,(int)local_388.kstride) * 8;
                          lVar75 = (lVar92 - local_388.begin.z) * lVar66;
                          lVar66 = (lVar42 - local_388.begin.z) * lVar66;
                          lVar86 = CONCAT44(local_388.jstride._4_4_,(int)local_388.jstride) * 8;
                          lVar73 = ((long)local_860 - (long)local_388.begin.y) * lVar86;
                          lVar86 = ((long)local_880 - (long)local_388.begin.y) * lVar86;
                          lVar94 = (long)local_388.begin.x;
                          lVar87 = CONCAT44(local_388.p._4_4_,(int)local_388.p) + lVar32;
                          lVar89 = lVar73 + lVar75 + lVar94 * -8 + lVar87;
                          lVar73 = lVar73 + lVar66 + lVar94 * -8 + lVar87;
                          lVar75 = lVar75 + lVar86 + lVar94 * -8 + lVar87;
                          lVar87 = lVar86 + lVar66 + lVar94 * -8 + lVar87;
                          lVar86 = ((long)local_880 - (long)(int)local_5b0._12_4_) *
                                   CONCAT44(local_5c8._12_4_,local_5c8._8_4_) * 8 +
                                   (lVar42 - local_5a0) * CONCAT44(iStack_5b4,local_5c8._16_4_) * 8
                                   + (long)(int)local_5b0._8_4_ * -8 +
                                   CONCAT44(local_5c8._4_4_,local_5c8._0_4_) + lVar32;
                          lVar66 = 0;
                          do {
                            if (*(int *)(local_8d0 + lVar66 * 4) == 0) {
                              dVar119 = *(double *)((long)local_758 + -8 + lVar66 * 8);
                              dVar111 = *(double *)((long)local_758 + lVar66 * 8);
                              dVar110 = *(double *)((long)local_348.p + lVar66 * 8 + lVar55 + -8);
                              dVar126 = *(double *)((long)local_348.p + lVar66 * 8 + lVar55);
                              dVar125 = *(double *)((long)local_348.p + lVar66 * 8 + lVar90 + -8);
                              dVar6 = *(double *)((long)local_348.p + lVar66 * 8 + lVar90);
                              dVar104 = *(double *)((long)local_348.p + lVar66 * 8 + lVar59 + -8);
                              dVar7 = *(double *)((long)local_348.p + lVar66 * 8 + lVar59);
                              dVar8 = *(double *)((long)local_348.p + lVar66 * 8 + lVar54 + -8);
                              dVar105 = *(double *)((long)local_348.p + lVar66 * 8 + lVar54);
                              dVar9 = *(double *)((long)local_348.p + lVar66 * 8 + lVar98 + -8);
                              dVar10 = *(double *)((long)local_348.p + lVar66 * 8 + lVar98);
                              dVar11 = *(double *)((long)local_348.p + lVar66 * 8 + lVar78 + -8);
                              dVar108 = *(double *)((long)local_348.p + lVar66 * 8 + lVar78);
                              dVar109 = *(double *)((long)local_348.p + lVar66 * 8 + lVar62 + -8);
                              dVar12 = *(double *)((long)local_348.p + lVar66 * 8 + lVar62);
                              dVar115 = *(double *)((long)local_348.p + lVar66 * 8 + lVar60 + -8);
                              dVar13 = *(double *)((long)local_348.p + lVar66 * 8 + lVar60);
                              dVar14 = *(double *)((long)local_348.p + lVar66 * 8 + lVar79 + -8);
                              dVar116 = *(double *)((long)local_348.p + lVar66 * 8 + lVar79);
                              dVar120 = *(double *)((long)local_348.p + lVar66 * 8 + lVar53 + -8);
                              dVar130 = *(double *)((long)local_348.p + lVar66 * 8 + lVar53);
                              dVar15 = *(double *)((long)local_348.p + lVar66 * 8 + lVar58 + -8);
                              dVar129 = *(double *)((long)local_348.p + lVar66 * 8 + lVar58);
                              *(double *)(lVar86 + lVar66 * 8) =
                                   ((*(double *)((long)local_348.p + lVar66 * 8 + lVar43) * 8.0 +
                                    *(double *)((long)local_348.p + lVar66 * 8 + lVar44) * -4.0 +
                                    *(double *)((long)local_348.p + lVar66 * 8 + lVar36) * -4.0 +
                                    dVar129 + dVar129 +
                                    *(double *)((long)local_348.p + lVar66 * 8 + lVar45) * 4.0 +
                                    ((*(double *)(lVar75 + lVar66 * 8) - (dVar116 + dVar116)) -
                                    (dVar130 + dVar130))) * *(double *)(lVar88 + lVar66 * 8) +
                                   (*(double *)((long)local_348.p + lVar66 * 8 + lVar43 + -8) * -8.0
                                   + *(double *)((long)local_348.p + lVar66 * 8 + lVar44 + -8) * 4.0
                                     + *(double *)((long)local_348.p + lVar66 * 8 + lVar36 + -8) *
                                       -4.0 + dVar15 + dVar15 +
                                              *(double *)
                                               ((long)local_348.p + lVar66 * 8 + lVar45 + -8) * -4.0
                                              + ((dVar14 + dVar14 +
                                                 *(double *)(lVar75 + -8 + lVar66 * 8)) -
                                                (dVar120 + dVar120))) *
                                   *(double *)(lVar88 + -8 + lVar66 * 8) +
                                   (*(double *)((long)local_348.p + lVar66 * 8 + lVar100) * -8.0 +
                                   *(double *)((long)local_348.p + lVar66 * 8 + lVar61) * -4.0 +
                                   *(double *)((long)local_348.p + lVar66 * 8 + lVar82) * 4.0 +
                                   dVar13 + dVar13 +
                                   *(double *)((long)local_348.p + lVar66 * 8 + lVar95) * -4.0 +
                                   dVar12 + dVar12 +
                                   (*(double *)(lVar89 + lVar66 * 8) - (dVar108 + dVar108))) *
                                   *(double *)(lVar80 + lVar66 * 8) +
                                   (*(double *)((long)local_348.p + lVar66 * 8 + lVar100 + -8) * 8.0
                                   + *(double *)((long)local_348.p + lVar66 * 8 + lVar61 + -8) * 4.0
                                     + *(double *)((long)local_348.p + lVar66 * 8 + lVar82 + -8) *
                                       4.0 + dVar115 + dVar115 +
                                             *(double *)
                                              ((long)local_348.p + lVar66 * 8 + lVar95 + -8) * 4.0 +
                                             dVar109 + dVar109 +
                                             dVar11 + dVar11 + *(double *)(lVar89 + -8 + lVar66 * 8)
                                   ) * *(double *)(lVar80 + -8 + lVar66 * 8) +
                                   (*(double *)((long)local_348.p + lVar66 * 8 + lVar81) * -8.0 +
                                   *(double *)((long)local_348.p + lVar66 * 8 + lVar47) * 4.0 +
                                   *(double *)((long)local_348.p + lVar66 * 8 + lVar72) * 4.0 +
                                   ((*(double *)((long)local_348.p + lVar66 * 8 + lVar85) * 4.0 +
                                    ((*(double *)(lVar87 + lVar66 * 8) - (dVar7 + dVar7)) -
                                    (dVar105 + dVar105))) - (dVar10 + dVar10))) *
                                   *(double *)(lVar74 + lVar66 * 8) +
                                   (*(double *)((long)local_348.p + lVar66 * 8 + lVar81 + -8) * 8.0
                                   + *(double *)((long)local_348.p + lVar66 * 8 + lVar47 + -8) *
                                     -4.0 + *(double *)
                                             ((long)local_348.p + lVar66 * 8 + lVar72 + -8) * 4.0 +
                                            ((*(double *)
                                               ((long)local_348.p + lVar66 * 8 + lVar85 + -8) * -4.0
                                             + ((dVar104 + dVar104 +
                                                *(double *)(lVar87 + -8 + lVar66 * 8)) -
                                               (dVar8 + dVar8))) - (dVar9 + dVar9))) *
                                   *(double *)(lVar74 + -8 + lVar66 * 8) +
                                   (*(double *)((long)local_348.p + lVar66 * 8 + lVar67 + -8) * -8.0
                                   + *(double *)((long)local_348.p + lVar66 * 8 + lVar76 + -8) *
                                     -4.0 + *(double *)
                                             ((long)local_348.p + lVar66 * 8 + lVar83 + -8) * -4.0 +
                                            ((*(double *)
                                               ((long)local_348.p + lVar66 * 8 + lVar96 + -8) * 4.0
                                             + dVar110 + dVar110 +
                                               dVar119 + dVar119 +
                                               *(double *)(lVar73 + -8 + lVar66 * 8)) -
                                            (dVar125 + dVar125))) *
                                   *(double *)(lVar84 + -8 + lVar66 * 8) +
                                   (*(double *)((long)local_348.p + lVar66 * 8 + lVar67) * 8.0 +
                                   *(double *)((long)local_348.p + lVar66 * 8 + lVar76) * 4.0 +
                                   *(double *)((long)local_348.p + lVar66 * 8 + lVar83) * -4.0 +
                                   ((*(double *)((long)local_348.p + lVar66 * 8 + lVar96) * -4.0 +
                                    dVar126 + dVar126 +
                                    (*(double *)(lVar73 + lVar66 * 8) - (dVar111 + dVar111))) -
                                   (dVar6 + dVar6))) * *(double *)(lVar84 + lVar66 * 8)) * local_2a8
                                   + *(double *)(lVar86 + lVar66 * 8);
                            }
                            lVar66 = lVar66 + 1;
                          } while ((local_718.bigend.vect[0] - local_718.smallend.vect[0]) + 1 !=
                                   (int)lVar66);
                        }
                        local_880 = (double *)((long)local_880 + 1);
                        local_860 = (double *)((long)local_860 + 1);
                        local_8d0 = local_8d0 + lVar65;
                      } while (local_718.bigend.vect[1] + 1U != (int)local_880);
                    }
                    local_6d0 = (double *)CONCAT44(local_6d0._4_4_,(int)local_6d0 + 1);
                    bVar101 = uVar31 != local_718.bigend.vect[2];
                    uVar31 = uVar31 + 1;
                  } while (bVar101);
                }
              }
            }
            else {
              if (FVar29 != covered) goto LAB_005c6567;
              local_2c8 = (double)CONCAT44(local_2c8._4_4_,0xffffffff);
              iVar77 = local_718.bigend.vect[2];
              if (local_718.smallend.vect[2] <= local_718.bigend.vect[2]) {
                iVar118 = local_718.smallend.vect[1];
                lVar32 = (long)local_718.smallend.vect[1];
                iVar70 = local_718.smallend.vect[0];
                local_758 = (double)((long)local_718.smallend.vect[0] << 3);
                uVar30 = local_718.bigend.vect[0] - local_718.smallend.vect[0];
                iVar37 = local_718.bigend.vect[1] - local_718.smallend.vect[1];
                uVar31 = local_718.smallend.vect[2];
                do {
                  if (iVar118 <= iVar49) {
                    lVar92 = CONCAT44(local_5c8._12_4_,local_5c8._8_4_) * 8;
                    pvVar97 = (void *)((lVar32 - (int)local_5b0._12_4_) * lVar92 +
                                       (long)(int)(uVar31 - local_5a0) *
                                       CONCAT44(iStack_5b4,local_5c8._16_4_) * 8 +
                                       (long)(int)local_5b0._8_4_ * -8 +
                                      CONCAT44(local_5c8._4_4_,local_5c8._0_4_) + (long)local_758);
                    iVar91 = iVar37 + 1;
                    do {
                      if (iVar70 <= iVar71) {
                        memset(pvVar97,0,(ulong)uVar30 * 8 + 8);
                      }
                      pvVar97 = (void *)((long)pvVar97 + lVar92);
                      iVar91 = iVar91 + -1;
                    } while (iVar91 != 0);
                  }
                  bVar101 = uVar31 != iVar77;
                  uVar31 = uVar31 + 1;
                } while (bVar101);
              }
            }
LAB_005c6e55:
            rhs = local_6f0;
            dVar119 = local_670;
            FVar29 = local_2c8._0_4_;
          }
          else {
LAB_005c6567:
            local_680 = (double *)CONCAT44(local_680._4_4_,local_718.bigend.vect[2]);
            if (local_718.smallend.vect[2] <= local_718.bigend.vect[2]) {
              local_2c8 = (double)CONCAT44(local_2c8._4_4_,FVar29);
              local_6b8 = (ulong)(uint)local_718.bigend.vect[1];
              local_6e8 = (double *)(long)local_718.smallend.vect[1];
              local_638 = (long)local_718.smallend.vect[0];
              lVar32 = local_638 * 8;
              local_688 = (double)-local_638;
              local_638 = local_638 * 4;
              local_690 = CONCAT44(local_690._4_4_,local_718.smallend.vect[1] + -1);
              local_740 = (double *)CONCAT44(local_740._4_4_,local_718.smallend.vect[2] - 1);
              local_6e0 = (double *)CONCAT44(local_6e0._4_4_,local_718.smallend.vect[0] + -1);
              uVar31 = local_718.smallend.vect[2];
              do {
                if (local_718.smallend.vect[1] <= local_718.bigend.vect[1]) {
                  local_6d8 = (double *)(long)(int)uVar31;
                  lVar92 = CONCAT44(local_4f8.jstride._4_4_,(int)local_4f8.jstride) * 4;
                  pdVar93 = (double *)
                            ((long)local_4f8.p +
                            ((long)local_6e8 - (long)local_4f8.begin.y) * lVar92 +
                            ((long)local_6d8 - (long)local_4f8.begin.z) *
                            CONCAT44(local_4f8.kstride._4_4_,(int)local_4f8.kstride) * 4 +
                            (long)local_4f8.begin.x * -4 + local_638);
                  local_7a8 = local_6e8;
                  iVar71 = local_718.smallend.vect[1] + -1;
                  do {
                    if (local_718.smallend.vect[0] <= local_718.bigend.vect[0]) {
                      local_6d0 = (double *)
                                  (((long)local_6d8 - (long)local_5a0) *
                                   CONCAT44(iStack_5b4,local_5c8._16_4_) * 8 +
                                   ((long)local_7a8 - (long)(int)local_5b0._12_4_) *
                                   CONCAT44(local_5c8._12_4_,local_5c8._8_4_) * 8 +
                                   (long)(int)local_5b0._8_4_ * -8 +
                                  CONCAT44(local_5c8._4_4_,local_5c8._0_4_) + lVar32);
                      lVar42 = CONCAT44(local_488.kstride._4_4_,(undefined4)local_488.kstride);
                      lVar81 = (int)(~local_488.begin.z + uVar31) * lVar42;
                      lVar72 = (int)(uVar31 - local_488.begin.z) * lVar42;
                      lVar60 = ((long)local_6d8 - (long)local_488.begin.z) * lVar42 * 8;
                      lVar65 = (long)((int)local_740 - local_488.begin.z) * lVar42 * 8;
                      lVar42 = CONCAT44(local_488.jstride._4_4_,(uint)local_488.jstride);
                      lVar62 = (~local_488.begin.y + (int)local_7a8) * lVar42;
                      lVar78 = lVar42 * ((long)local_7a8 - (long)local_488.begin.y);
                      lVar95 = (long)(iVar71 - local_488.begin.y) * lVar42 * 8;
                      lVar61 = lVar42 * 8 * ((long)local_7a8 - (long)local_488.begin.y);
                      lVar42 = lVar60 + lVar95;
                      lVar95 = lVar95 + lVar65;
                      lVar60 = lVar60 + lVar61;
                      lVar61 = lVar61 + lVar65;
                      lVar65 = CONCAT44(local_488.nstride._4_4_,(undefined4)local_488.nstride);
                      lVar85 = lVar65 * 0x10;
                      lVar82 = (long)local_488.begin.x;
                      lVar100 = 0;
                      do {
                        dVar119 = 0.0;
                        if (*(int *)((long)pdVar93 + lVar100 * 4) == 0) {
                          if (((local_660._16_4_ == 0x66) ||
                              (dVar119 = 1.0, local_660._16_4_ == 0x6a)) &&
                             (dVar119 = 1.0,
                             (long)local_778.smallend.vect[0] + (long)local_688 == lVar100)) {
                            dVar119 = 0.0;
                          }
                          if (((local_660._0_4_ == 0x66) || (dVar111 = 1.0, local_660._0_4_ == 0x6a)
                              ) && (dVar111 = 1.0,
                                   (long)local_778.bigend.vect[0] + (long)local_688 == lVar100)) {
                            dVar111 = 0.0;
                          }
                          if (iStack_64c == 0x66) {
                            dVar110 = 1.0;
                            if (local_7a8 == (double *)(long)local_778.smallend.vect[1]) {
LAB_005c6abd:
                              dVar110 = 0.0;
                            }
                          }
                          else {
                            dVar110 = 1.0;
                            if (local_7a8 == (double *)(long)local_778.smallend.vect[1] &&
                                iStack_64c == 0x6a) goto LAB_005c6abd;
                          }
                          if (local_660._4_4_ == 0x66) {
                            uVar30 = 0x3ff00000;
                            if (local_7a8 == (double *)(long)local_778.bigend.vect[1]) {
LAB_005c6aeb:
                              uVar30 = 0;
                            }
                          }
                          else {
                            uVar30 = 0x3ff00000;
                            if (local_7a8 == (double *)(long)local_778.bigend.vect[1] &&
                                local_660._4_4_ == 0x6a) goto LAB_005c6aeb;
                          }
                          if (local_648 == Neumann) {
                            dVar126 = 1.0;
                            if (local_778.smallend.vect[2] == uVar31) {
LAB_005c6b17:
                              dVar126 = 0.0;
                            }
                          }
                          else {
                            dVar126 = 1.0;
                            if (local_648 == inflow && local_778.smallend.vect[2] == uVar31)
                            goto LAB_005c6b17;
                          }
                          dVar125 = (double)((ulong)uVar30 << 0x20);
                          uVar30 = 0x3ff00000;
                          if (local_660._8_4_ == Neumann) {
                            if (local_778.bigend.vect[2] == uVar31) {
LAB_005c6b4e:
                              uVar30 = 0;
                            }
                          }
                          else if (local_660._8_4_ == inflow && local_778.bigend.vect[2] == uVar31)
                          goto LAB_005c6b4e;
                          lVar67 = (long)(((local_718.smallend.vect[0] + -1) - local_488.begin.x) +
                                         (int)lVar100);
                          ppuVar2 = (undefined **)(local_488.p + lVar62 + lVar67 + lVar81);
                          ppuVar3 = (undefined **)(local_488.p + lVar78 + lVar67 + lVar81);
                          ppuVar4 = (undefined **)(local_488.p + lVar62 + lVar67 + lVar72);
                          ppuVar5 = (undefined **)(local_488.p + lVar78 + lVar67 + lVar72);
                          local_758 = -(double)ppuVar2[lVar65] * dVar119;
                          uStack_750 = 0x8000000000000000;
                          dVar119 = (dVar111 * *(double *)
                                                ((long)local_488.p +
                                                lVar100 * 8 + lVar60 + lVar85 + lVar82 * -8 + lVar32
                                                ) * dVar125 +
                                    dVar119 * (double)ppuVar5[lVar65 * 2] * dVar125 +
                                    *(double *)
                                     ((long)local_488.p +
                                     lVar100 * 8 + lVar42 + lVar85 + lVar82 * -8 + lVar32) * dVar111
                                    * dVar110 +
                                    (double)ppuVar4[lVar65 * 2] * dVar119 * dVar110 +
                                    (((-(double)ppuVar2[lVar65 * 2] * dVar119 * dVar110 -
                                      *(double *)
                                       ((long)local_488.p +
                                       lVar100 * 8 + lVar95 + lVar85 + lVar82 * -8 + lVar32) *
                                      dVar111 * dVar110) -
                                     (double)ppuVar3[lVar65 * 2] * dVar119 * dVar125) -
                                    *(double *)
                                     ((long)local_488.p +
                                     lVar100 * 8 + lVar85 + lVar61 + lVar82 * -8 + lVar32) * dVar111
                                    * dVar125)) * (double)local_738 +
                                    (*(double *)
                                      ((long)local_488.p +
                                      lVar100 * 8 + lVar60 + lVar82 * -8 + lVar32) * dVar125 *
                                     (double)((ulong)uVar30 << 0x20) +
                                    ((*(double *)
                                       ((long)local_488.p +
                                       lVar100 * 8 + lVar42 + lVar82 * -8 + lVar32) * dVar110 *
                                      (double)((ulong)uVar30 << 0x20) +
                                     ((*(double *)
                                        ((long)local_488.p +
                                        lVar100 * 8 + lVar61 + lVar82 * -8 + lVar32) * dVar125 *
                                       dVar126 +
                                      ((*(double *)
                                         ((long)local_488.p +
                                         lVar100 * 8 + lVar95 + lVar82 * -8 + lVar32) * dVar110 *
                                        dVar126 - (double)*ppuVar2 * dVar110 * dVar126) -
                                      (double)*ppuVar3 * dVar125 * dVar126)) -
                                     (double)*ppuVar4 * dVar110 * (double)((ulong)uVar30 << 0x20)))
                                    - (double)*ppuVar5 * dVar125 * (double)((ulong)uVar30 << 0x20)))
                                    * local_6b0 +
                                    (*(double *)
                                      ((long)local_488.p +
                                      lVar100 * 8 + lVar60 + lVar65 * 8 + lVar82 * -8 + lVar32) *
                                     dVar111 * (double)((ulong)uVar30 << 0x20) +
                                    (double)ppuVar5[lVar65] * dVar119 *
                                    (double)((ulong)uVar30 << 0x20) +
                                    (((*(double *)
                                        ((long)local_488.p +
                                        lVar100 * 8 + lVar61 + lVar65 * 8 + lVar82 * -8 + lVar32) *
                                       dVar111 * dVar126 +
                                      (double)ppuVar3[lVar65] * dVar119 * dVar126 +
                                      (local_758 * dVar126 -
                                      *(double *)
                                       ((long)local_488.p +
                                       lVar100 * 8 + lVar95 + lVar65 * 8 + lVar82 * -8 + lVar32) *
                                      dVar111 * dVar126)) -
                                     (double)ppuVar4[lVar65] * dVar119 *
                                     (double)((ulong)uVar30 << 0x20)) -
                                    *(double *)
                                     ((long)local_488.p +
                                     lVar100 * 8 + lVar42 + lVar65 * 8 + lVar82 * -8 + lVar32) *
                                    dVar111 * (double)((ulong)uVar30 << 0x20))) * (double)local_730;
                        }
                        local_6d0[lVar100] = dVar119;
                        lVar100 = lVar100 + 1;
                        local_720 = pdVar93;
                      } while ((local_718.bigend.vect[0] - local_718.smallend.vect[0]) + 1 !=
                               (int)lVar100);
                    }
                    local_7a8 = (double *)((long)local_7a8 + 1);
                    pdVar93 = (double *)((long)pdVar93 + lVar92);
                    iVar71 = iVar71 + 1;
                  } while (local_718.bigend.vect[1] + 1U != (int)local_7a8);
                }
                local_740 = (double *)CONCAT44(local_740._4_4_,(int)local_740 + 1);
                bVar101 = uVar31 != local_718.bigend.vect[2];
                uVar31 = uVar31 + 1;
              } while (bVar101);
              goto LAB_005c6e55;
            }
          }
          a_rhcc = (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)local_660;
          mlndlap_impose_neumann_bc
                    (&local_718,(Array4<double> *)local_5c8,&local_778,
                     (GpuArray<amrex::LinOpBCType,_3U> *)(local_660 + 0x10),
                     (GpuArray<amrex::LinOpBCType,_3U> *)a_rhcc);
          if (local_270.
              super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[(long)dVar119]._M_t.
              super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
              super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
              super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl != (MultiFab *)0x0) {
            FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                      ((Array4<double> *)local_608,
                       &(local_1c8.
                         super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[(long)dVar119]._M_t.
                         super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                         .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl)->
                        super_FabArray<amrex::FArrayBox>,(MFIter *)local_1b0);
            FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      (&local_3c8,
                       &(local_270.
                         super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[(long)dVar119]._M_t.
                         super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                         .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl)->
                        super_FabArray<amrex::FArrayBox>,(MFIter *)local_1b0);
            iVar70 = local_718.bigend.vect[1];
            iVar77 = local_718.bigend.vect[0];
            iVar118 = local_718.bigend.vect[2];
            iVar71 = local_718.smallend.vect[0];
            iVar49 = local_718.smallend.vect[1];
            if (FVar29 == covered) {
              if (local_718.smallend.vect[2] <= local_718.bigend.vect[2]) {
                lVar32 = (long)local_718.smallend.vect[1];
                local_758 = (double)((long)local_718.smallend.vect[0] << 3);
                uVar30 = local_718.bigend.vect[0] - local_718.smallend.vect[0];
                iVar37 = local_718.bigend.vect[1] - local_718.smallend.vect[1];
                uVar31 = local_718.smallend.vect[2];
                do {
                  if (iVar49 <= iVar70) {
                    lVar92 = CONCAT44(local_608._12_4_,local_608._8_4_) * 8;
                    pvVar97 = (void *)(local_608._0_8_ +
                                      (lVar32 - local_5e4) * lVar92 +
                                      (long)(int)(uVar31 - local_5e0) *
                                      CONCAT44(local_608._20_4_,local_608._16_4_) * 8 +
                                      (long)local_5e8 * -8 + (long)local_758);
                    iVar91 = iVar37 + 1;
                    do {
                      if (iVar71 <= iVar77) {
                        memset(pvVar97,0,(ulong)uVar30 * 8 + 8);
                      }
                      pvVar97 = (void *)((long)pvVar97 + lVar92);
                      iVar91 = iVar91 + -1;
                    } while (iVar91 != 0);
                  }
                  bVar101 = uVar31 != iVar118;
                  uVar31 = uVar31 + 1;
                } while (bVar101);
              }
            }
            else if (FVar29 == singlevalued) {
              FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                        (&local_428,local_308,(MFIter *)local_1b0);
              FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                        (&local_388,&(local_230._M_head_impl)->super_FabArray<amrex::FArrayBox>,
                         (MFIter *)local_1b0);
              local_6e8 = (double *)CONCAT44(local_6e8._4_4_,local_718.bigend.vect[2]);
              local_740 = (double *)(ulong)(uint)local_718.smallend.vect[2];
              if (local_718.smallend.vect[2] <= local_718.bigend.vect[2]) {
                local_680 = (double *)(ulong)(uint)local_718.bigend.vect[1];
                local_6d8 = (double *)(long)local_718.smallend.vect[1];
                local_720 = (double *)(long)local_718.smallend.vect[0];
                local_6d0 = (double *)CONCAT44(local_6d0._4_4_,local_718.bigend.vect[1] + 1U);
                lVar32 = (long)local_720 * 8;
                local_6e0 = (double *)CONCAT44(local_6e0._4_4_,local_718.smallend.vect[2] - 1);
                local_6b8 = (long)local_6d8 - 1;
                local_688 = (double)((long)local_720 * 4);
                do {
                  if (local_718.smallend.vect[1] <= local_718.bigend.vect[1]) {
                    lVar78 = (long)(int)local_740;
                    lVar92 = (long)(int)local_6e0;
                    lVar65 = CONCAT44(local_608._12_4_,local_608._8_4_) * 8;
                    local_8d0 = local_608._0_8_ +
                                ((long)local_6d8 - (long)local_5e4) * lVar65 +
                                (lVar78 - local_5e0) * CONCAT44(local_608._20_4_,local_608._16_4_) *
                                8 + (long)local_5e8 * -8 + lVar32;
                    lVar42 = CONCAT44(local_4f8.jstride._4_4_,(int)local_4f8.jstride) * 4;
                    local_8c8 = (long)local_4f8.p +
                                ((long)local_6d8 - (long)local_4f8.begin.y) * lVar42 +
                                (lVar78 - local_4f8.begin.z) *
                                CONCAT44(local_4f8.kstride._4_4_,(int)local_4f8.kstride) * 4 +
                                (long)local_4f8.begin.x * -4 + (long)local_688;
                    local_898 = local_6d8;
                    local_7e8 = local_6b8;
                    do {
                      if (local_718.smallend.vect[0] <= local_718.bigend.vect[0]) {
                        lVar44 = (long)local_388.begin.x;
                        lVar55 = CONCAT44(local_388.nstride._4_4_,(undefined4)local_388.nstride);
                        lVar43 = CONCAT44(local_388.jstride._4_4_,(int)local_388.jstride) * 8;
                        lVar83 = ((long)local_898 - (long)local_388.begin.y) * lVar43;
                        lVar72 = CONCAT44(local_388.kstride._4_4_,(int)local_388.kstride) * 8;
                        lVar58 = (lVar92 - local_388.begin.z) * lVar72;
                        lVar81 = lVar83 + lVar58;
                        lVar53 = lVar55 * 0x38;
                        lVar72 = (lVar78 - local_388.begin.z) * lVar72;
                        lVar83 = lVar83 + lVar72;
                        lVar43 = (local_7e8 - (long)local_388.begin.y) * lVar43;
                        lVar58 = lVar58 + lVar43;
                        lVar43 = lVar43 + lVar72;
                        lVar79 = lVar55 * 0x10;
                        lVar90 = lVar55 * 0x90;
                        lVar98 = lVar55 * 0x40;
                        lVar96 = lVar55 * 0x30;
                        lVar45 = CONCAT44(local_388.p._4_4_,(int)local_388.p) + lVar32;
                        lVar72 = lVar81 + lVar90 + lVar44 * -8 + lVar45;
                        lVar85 = lVar81 + lVar98 + lVar44 * -8 + lVar45;
                        lVar100 = lVar81 + lVar53 + lVar44 * -8 + lVar45;
                        lVar61 = lVar81 + lVar96 + lVar44 * -8 + lVar45;
                        lVar82 = lVar81 + lVar79 + lVar44 * -8 + lVar45;
                        local_758 = (double)(lVar81 + lVar55 * 8 + lVar44 * -8 + lVar45);
                        lVar81 = lVar81 + lVar44 * -8 + lVar45;
                        lVar60 = lVar83 + lVar90 + lVar44 * -8 + lVar45;
                        lVar95 = lVar83 + lVar98 + lVar44 * -8 + lVar45;
                        lVar62 = lVar83 + lVar53 + lVar44 * -8 + lVar45;
                        lVar67 = lVar83 + lVar96 + lVar44 * -8 + lVar45;
                        lVar89 = lVar83 + lVar79 + lVar44 * -8 + lVar45;
                        lVar76 = lVar83 + lVar55 * 8 + lVar44 * -8 + lVar45;
                        lVar83 = lVar83 + lVar44 * -8 + lVar45;
                        lVar86 = lVar58 + lVar90 + lVar44 * -8 + lVar45;
                        lVar94 = lVar58 + lVar98 + lVar44 * -8 + lVar45;
                        lVar47 = lVar58 + lVar53 + lVar44 * -8 + lVar45;
                        lVar84 = lVar58 + lVar96 + lVar44 * -8 + lVar45;
                        lVar73 = lVar58 + lVar79 + lVar44 * -8 + lVar45;
                        lVar36 = lVar58 + lVar55 * 8 + lVar44 * -8 + lVar45;
                        lVar58 = lVar58 + lVar44 * -8 + lVar45;
                        lVar66 = lVar90 + lVar43 + lVar44 * -8 + lVar45;
                        lVar99 = lVar98 + lVar43 + lVar44 * -8 + lVar45;
                        lVar54 = lVar53 + lVar43 + lVar44 * -8 + lVar45;
                        lVar59 = lVar96 + lVar43 + lVar44 * -8 + lVar45;
                        lVar80 = lVar79 + lVar43 + lVar44 * -8 + lVar45;
                        lVar90 = lVar43 + lVar55 * 8 + lVar44 * -8 + lVar45;
                        lVar45 = lVar43 + lVar44 * -8 + lVar45;
                        lVar43 = (lVar92 - local_3c8.begin.z) * local_3c8.kstride * 8;
                        lVar44 = (lVar78 - local_3c8.begin.z) * local_3c8.kstride * 8;
                        lVar79 = CONCAT44(local_3c8.jstride._4_4_,(undefined4)local_3c8.jstride) * 8
                        ;
                        lVar55 = ((long)local_898 - (long)local_3c8.begin.y) * lVar79;
                        lVar79 = (local_7e8 - (long)local_3c8.begin.y) * lVar79;
                        lVar53 = (long)local_3c8.begin.x;
                        lVar96 = lVar43 + lVar55 + lVar53 * -8 + lVar32;
                        lVar55 = lVar55 + lVar44 + lVar53 * -8 + lVar32;
                        lVar43 = lVar43 + lVar79 + lVar53 * -8 + lVar32;
                        lVar44 = lVar79 + lVar44 + lVar53 * -8 + lVar32;
                        lVar53 = CONCAT44(local_428.kstride._4_4_,(uint)local_428.kstride) * 8;
                        lVar98 = (lVar92 - local_428.begin.z) * lVar53;
                        lVar53 = (lVar78 - local_428.begin.z) * lVar53;
                        lVar74 = CONCAT44(local_428.jstride._4_4_,(int)local_428.jstride) * 8;
                        lVar79 = ((long)local_898 - (long)local_428.begin.y) * lVar74;
                        lVar74 = (local_7e8 - (long)local_428.begin.y) * lVar74;
                        lVar87 = (long)local_428.begin.x;
                        lVar88 = CONCAT44(local_428.p._4_4_,(int)local_428.p) + lVar32;
                        lVar75 = lVar79 + lVar98 + lVar87 * -8 + lVar88;
                        lVar79 = lVar79 + lVar53 + lVar87 * -8 + lVar88;
                        lVar98 = lVar98 + lVar74 + lVar87 * -8 + lVar88;
                        lVar88 = lVar74 + lVar53 + lVar87 * -8 + lVar88;
                        lVar53 = 0;
                        do {
                          dVar119 = 0.0;
                          if (*(int *)(local_8c8 + lVar53 * 4) == 0) {
                            dVar119 = ((*(double *)(lVar84 + -8 + lVar53 * 8) +
                                        *(double *)(lVar47 + -8 + lVar53 * 8) +
                                       *(double *)(lVar94 + -8 + lVar53 * 8)) * 0.5 +
                                       *(double *)(lVar98 + -8 + lVar53 * 8) * 0.125 +
                                       (*(double *)(lVar58 + -8 + lVar53 * 8) +
                                        *(double *)(lVar36 + -8 + lVar53 * 8) +
                                       *(double *)(lVar73 + -8 + lVar53 * 8)) * 0.25 +
                                      *(double *)(lVar86 + -8 + lVar53 * 8)) *
                                      *(double *)((long)local_3c8.p + lVar53 * 8 + lVar43 + -8) +
                                      ((((-*(double *)(lVar84 + lVar53 * 8) -
                                         *(double *)(lVar47 + lVar53 * 8)) +
                                        *(double *)(lVar94 + lVar53 * 8)) * 0.5 +
                                       *(double *)(lVar98 + lVar53 * 8) * 0.125 +
                                       ((*(double *)(lVar36 + lVar53 * 8) -
                                        *(double *)(lVar58 + lVar53 * 8)) +
                                       *(double *)(lVar73 + lVar53 * 8)) * 0.25) -
                                      *(double *)(lVar86 + lVar53 * 8)) *
                                      *(double *)((long)local_3c8.p + lVar53 * 8 + lVar43) +
                                      ((((*(double *)(lVar100 + -8 + lVar53 * 8) -
                                         *(double *)(lVar61 + -8 + lVar53 * 8)) -
                                        *(double *)(lVar85 + -8 + lVar53 * 8)) * 0.5 +
                                       *(double *)(lVar75 + -8 + lVar53 * 8) * 0.125 +
                                       ((*(double *)(lVar81 + -8 + lVar53 * 8) -
                                        *(double *)((long)local_758 + -8 + lVar53 * 8)) +
                                       *(double *)(lVar82 + -8 + lVar53 * 8)) * 0.25) -
                                      *(double *)(lVar72 + -8 + lVar53 * 8)) *
                                      *(double *)((long)local_3c8.p + lVar53 * 8 + lVar96 + -8) +
                                      (((*(double *)(lVar61 + lVar53 * 8) -
                                        *(double *)(lVar100 + lVar53 * 8)) -
                                       *(double *)(lVar85 + lVar53 * 8)) * 0.5 +
                                       *(double *)(lVar75 + lVar53 * 8) * 0.125 +
                                       ((-*(double *)(lVar81 + lVar53 * 8) -
                                        *(double *)((long)local_758 + lVar53 * 8)) +
                                       *(double *)(lVar82 + lVar53 * 8)) * 0.25 +
                                      *(double *)(lVar72 + lVar53 * 8)) *
                                      *(double *)((long)local_3c8.p + lVar53 * 8 + lVar96) +
                                      ((((*(double *)(lVar59 + -8 + lVar53 * 8) -
                                         *(double *)(lVar54 + -8 + lVar53 * 8)) -
                                        *(double *)(lVar99 + -8 + lVar53 * 8)) * 0.5 +
                                       *(double *)(lVar88 + -8 + lVar53 * 8) * 0.125 +
                                       ((*(double *)(lVar45 + -8 + lVar53 * 8) +
                                        *(double *)(lVar90 + -8 + lVar53 * 8)) -
                                       *(double *)(lVar80 + -8 + lVar53 * 8)) * 0.25) -
                                      *(double *)(lVar66 + -8 + lVar53 * 8)) *
                                      *(double *)((long)local_3c8.p + lVar53 * 8 + lVar44 + -8) +
                                      (((*(double *)(lVar54 + lVar53 * 8) -
                                        *(double *)(lVar59 + lVar53 * 8)) -
                                       *(double *)(lVar99 + lVar53 * 8)) * 0.5 +
                                       *(double *)(lVar88 + lVar53 * 8) * 0.125 +
                                       ((*(double *)(lVar90 + lVar53 * 8) -
                                        *(double *)(lVar45 + lVar53 * 8)) -
                                       *(double *)(lVar80 + lVar53 * 8)) * 0.25 +
                                      *(double *)(lVar66 + lVar53 * 8)) *
                                      *(double *)((long)local_3c8.p + lVar53 * 8 + lVar44) +
                                      (((*(double *)(lVar67 + lVar53 * 8) +
                                         *(double *)(lVar62 + lVar53 * 8) +
                                        *(double *)(lVar95 + lVar53 * 8)) * 0.5 +
                                       *(double *)(lVar79 + lVar53 * 8) * 0.125 +
                                       ((-*(double *)(lVar83 + lVar53 * 8) -
                                        *(double *)(lVar76 + lVar53 * 8)) -
                                       *(double *)(lVar89 + lVar53 * 8)) * 0.25) -
                                      *(double *)(lVar60 + lVar53 * 8)) *
                                      *(double *)((long)local_3c8.p + lVar53 * 8 + lVar55) +
                                      (((-*(double *)(lVar67 + -8 + lVar53 * 8) -
                                        *(double *)(lVar62 + -8 + lVar53 * 8)) +
                                       *(double *)(lVar95 + -8 + lVar53 * 8)) * 0.5 +
                                       *(double *)(lVar79 + -8 + lVar53 * 8) * 0.125 +
                                       ((*(double *)(lVar83 + -8 + lVar53 * 8) -
                                        *(double *)(lVar76 + -8 + lVar53 * 8)) -
                                       *(double *)(lVar89 + -8 + lVar53 * 8)) * 0.25 +
                                      *(double *)(lVar60 + -8 + lVar53 * 8)) *
                                      *(double *)((long)local_3c8.p + lVar53 * 8 + lVar55 + -8);
                          }
                          *(double *)(local_8d0 + lVar53 * 8) = dVar119;
                          lVar53 = lVar53 + 1;
                        } while ((local_718.bigend.vect[0] - local_718.smallend.vect[0]) + 1 !=
                                 (int)lVar53);
                      }
                      local_898 = (double *)((long)local_898 + 1);
                      local_8d0 = local_8d0 + lVar65;
                      local_7e8 = local_7e8 + 1;
                      local_8c8 = local_8c8 + lVar42;
                    } while (local_718.bigend.vect[1] + 1U != (int)local_898);
                  }
                  uVar31 = (int)local_740 + 1;
                  local_6e0 = (double *)CONCAT44(local_6e0._4_4_,(int)local_6e0 + 1);
                  bVar101 = (int)local_740 != local_718.bigend.vect[2];
                  local_740 = (double *)(ulong)uVar31;
                } while (bVar101);
              }
            }
            else if (local_718.smallend.vect[2] <= local_718.bigend.vect[2]) {
              lVar92 = (long)local_718.smallend.vect[1];
              lVar32 = (long)local_718.smallend.vect[0] * 8;
              iVar71 = local_718.smallend.vect[2] - 1;
              local_758 = (double)CONCAT44(local_758._4_4_,local_718.bigend.vect[0]);
              uVar31 = local_718.smallend.vect[2];
              do {
                if (local_718.smallend.vect[1] <= local_718.bigend.vect[1]) {
                  lVar81 = (long)(int)uVar31;
                  lVar78 = CONCAT44(local_608._12_4_,local_608._8_4_) * 8;
                  lVar72 = local_608._0_8_ +
                           (lVar92 - local_5e4) * lVar78 +
                           (lVar81 - local_5e0) * CONCAT44(local_608._20_4_,local_608._16_4_) * 8 +
                           (long)local_5e8 * -8 + lVar32;
                  lVar42 = CONCAT44(local_4f8.jstride._4_4_,(int)local_4f8.jstride) * 4;
                  lVar65 = (long)local_4f8.p +
                           (lVar92 - local_4f8.begin.y) * lVar42 +
                           (lVar81 - local_4f8.begin.z) *
                           CONCAT44(local_4f8.kstride._4_4_,(int)local_4f8.kstride) * 4 +
                           (long)local_4f8.begin.x * -4 + (long)local_718.smallend.vect[0] * 4;
                  local_8d0 = lVar92;
                  iVar49 = local_718.smallend.vect[1] + -1;
                  do {
                    if (local_718.smallend.vect[0] <= local_718.bigend.vect[0]) {
                      lVar62 = (long)local_3c8.begin.x;
                      lVar85 = CONCAT44(local_3c8.jstride._4_4_,(undefined4)local_3c8.jstride);
                      lVar76 = (~local_3c8.begin.y + (int)local_8d0) * lVar85;
                      lVar61 = (int)(~local_3c8.begin.z + uVar31) * local_3c8.kstride;
                      lVar100 = (int)(uVar31 - local_3c8.begin.z) * local_3c8.kstride;
                      lVar67 = (lVar81 - local_3c8.begin.z) * local_3c8.kstride * 8;
                      lVar83 = (long)(iVar71 - local_3c8.begin.z) * local_3c8.kstride * 8;
                      lVar82 = lVar85 * (local_8d0 - local_3c8.begin.y);
                      lVar95 = (long)(iVar49 - local_3c8.begin.y) * lVar85 * 8;
                      lVar85 = lVar85 * 8 * (local_8d0 - local_3c8.begin.y);
                      lVar60 = 0;
                      do {
                        dVar119 = 0.0;
                        if (*(int *)(lVar65 + lVar60 * 4) == 0) {
                          lVar90 = (long)(((local_718.smallend.vect[0] + -1) - local_3c8.begin.x) +
                                         (int)lVar60);
                          dVar119 = (local_3c8.p[lVar76 + lVar90 + lVar61] +
                                     *(double *)
                                      ((long)local_3c8.p +
                                      lVar60 * 8 + lVar95 + lVar83 + lVar62 * -8 + lVar32) +
                                     local_3c8.p[lVar82 + lVar90 + lVar61] +
                                     *(double *)
                                      ((long)local_3c8.p +
                                      lVar60 * 8 + lVar85 + lVar83 + lVar62 * -8 + lVar32) +
                                     local_3c8.p[lVar76 + lVar90 + lVar100] +
                                     *(double *)
                                      ((long)local_3c8.p +
                                      lVar60 * 8 + lVar67 + lVar95 + lVar62 * -8 + lVar32) +
                                     local_3c8.p[lVar82 + lVar90 + lVar100] +
                                    *(double *)
                                     ((long)local_3c8.p +
                                     lVar60 * 8 + lVar67 + lVar85 + lVar62 * -8 + lVar32)) * 0.125;
                        }
                        *(double *)(lVar72 + lVar60 * 8) = dVar119;
                        lVar60 = lVar60 + 1;
                      } while ((local_718.bigend.vect[0] - local_718.smallend.vect[0]) + 1 !=
                               (int)lVar60);
                    }
                    local_8d0 = local_8d0 + 1;
                    lVar72 = lVar72 + lVar78;
                    iVar49 = iVar49 + 1;
                    lVar65 = lVar65 + lVar42;
                  } while (local_718.bigend.vect[1] + 1U != (int)local_8d0);
                }
                iVar71 = iVar71 + 1;
                bVar101 = uVar31 != local_718.bigend.vect[2];
                uVar31 = uVar31 + 1;
              } while (bVar101);
            }
            a_rhcc = (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)local_660;
            mlndlap_impose_neumann_bc
                      (&local_718,(Array4<double> *)local_608,&local_778,
                       (GpuArray<amrex::LinOpBCType,_3U> *)(local_660 + 0x10),
                       (GpuArray<amrex::LinOpBCType,_3U> *)a_rhcc);
            rhs = local_6f0;
            dVar119 = local_670;
          }
          MFIter::operator++((MFIter *)local_1b0);
        } while (aiStack_190[0] < aiStack_190[2]);
      }
      MFIter::~MFIter((MFIter *)local_1b0);
      dVar119 = (double)((long)dVar119 + 1);
      __n = (size_type)(this->super_MLNodeLinOp).super_MLLinOp.m_num_amr_levels;
    } while ((long)dVar119 < (long)__n);
  }
  std::
  vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  ::vector(&local_200,__n,(allocator_type *)local_1b0);
  uVar31 = (this->super_MLNodeLinOp).super_MLLinOp.m_num_amr_levels;
  uVar63 = (ulong)uVar31;
  if (1 < (int)uVar31) {
    local_558 = (iMultiFab *)0x0;
    do {
      iVar71 = (this->super_MLNodeLinOp).super_MLLinOp.m_amr_ref_ratio.
               super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>
               ._M_impl.super__Vector_impl_data._M_start[(long)local_558];
      piVar1 = (iMultiFab *)
               ((long)&(local_558->super_FabArray<amrex::IArrayBox>).super_FabArrayBase.
                       _vptr_FabArrayBase + 1);
      local_300 = *(long *)&(this->super_MLNodeLinOp).super_MLLinOp.m_geom.
                            super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                            .
                            super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[(long)piVar1].
                            super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                            super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
      piVar28 = piVar1;
      local_4b0 = local_558;
      if ((iVar71 != 2) && (iVar71 != 4)) {
        local_558 = piVar1;
        Assert_host("amrrr == 2 || amrrr == 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/LinearSolvers/MLMG/AMReX_MLNodeLaplacian_misc.cpp"
                    ,0x454,(char *)0x0);
        piVar28 = local_558;
      }
      local_558 = piVar28;
      piVar28 = local_558;
      pVVar48 = local_6f0;
      local_674 = iVar71;
      amrex::coarsen((BoxArray *)local_1b0,
                     (BoxArray *)
                     ((long)&((local_6f0->
                              super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                              super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
                              ._M_impl.super__Vector_impl_data._M_start[(long)local_558]->
                             super_FabArray<amrex::FArrayBox>).super_FabArrayBase + 8),iVar71);
      pMVar20 = (pVVar48->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
                super__Vector_impl_data._M_start[(long)piVar28];
      pMVar33 = (MultiFab *)operator_new(0x180);
      local_5c8._0_4_ = 1;
      local_5c8._4_4_ = 0;
      local_5b0 = (undefined1  [16])0x0;
      local_5c8._8_4_ = 0;
      local_5c8._12_4_ = 0;
      local_5c8._16_4_ = 0;
      iStack_5b4 = 0;
      local_488.p = (double *)&PTR__FabFactory_00712918;
      MultiFab::MultiFab(pMVar33,(BoxArray *)local_1b0,
                         (DistributionMapping *)
                         ((long)&(pMVar20->super_FabArray<amrex::FArrayBox>).super_FabArrayBase +
                         0x70),1,0,(MFInfo *)local_5c8,(FabFactory<amrex::FArrayBox> *)&local_488);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_5c8 + 0x10));
      pMVar20 = local_200.
                super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[(long)local_4b0]._M_t.
                super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
                super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
      local_200.
      super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[(long)local_4b0]._M_t.
      super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
      super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
      super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl = pMVar33;
      if (pMVar20 != (MultiFab *)0x0) {
        (**(code **)(*(long *)&(pMVar20->super_FabArray<amrex::FArrayBox>).super_FabArrayBase + 8))
                  ();
      }
      BoxArray::~BoxArray((BoxArray *)local_1b0);
      local_248 = *(double *)(local_300 + 0x38);
      uStack_240 = 0;
      local_670 = *(double *)(local_300 + 0x40);
      local_258 = *(double *)(local_300 + 0x48);
      uStack_250 = 0;
      local_298 = (FabArray<amrex::IArrayBox> *)
                  **(long **)&(this->super_MLNodeLinOp).m_dirichlet_mask.
                              super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                              .
                              super__Vector_base<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[(long)piVar1].
                              super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                              .
                              super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
      ;
      local_778.smallend.vect[0]._0_3_ = 0x10000;
      local_778.smallend.vect[1] = Gpu::Device::max_gpu_streams;
      local_778.bigend.vect[1] = DAT_00717ec0;
      local_778.smallend.vect[2] = (int)FabArrayBase::mfiter_tile_size;
      local_778.bigend.vect[0] = SUB84(FabArrayBase::mfiter_tile_size,4);
      local_778.smallend.vect[0]._0_2_ = 0x101;
      MFIter::MFIter((MFIter *)local_1b0,
                     (FabArrayBase *)
                     local_200.
                     super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[(long)local_4b0]._M_t.
                     super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                     .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,
                     (MFItInfo *)&local_778);
      if (aiStack_190[0] < aiStack_190[2]) {
        local_248 = local_248 * 0.25;
        local_670 = local_670 * 0.25;
        local_258 = local_258 * 0.25;
        local_228 = -local_248;
        uStack_220 = uStack_240 ^ 0x8000000000000000;
        local_2c8 = -local_258;
        uStack_2c0 = uStack_250 ^ 0x8000000000000000;
        do {
          MFIter::tilebox((Box *)&local_428,(MFIter *)local_1b0);
          BATransformer::operator()
                    ((Box *)local_5c8,
                     (BATransformer *)(CONCAT44(local_1b0._12_4_,local_1b0._8_4_) + 8),
                     (Box *)((long)*(int *)(*(long *)aiStack_190._24_8_ + (long)aiStack_190[0] * 4)
                             * 0x1c + **(long **)(CONCAT44(local_1b0._12_4_,local_1b0._8_4_) + 0x50)
                            ));
          piVar1 = local_558;
          pVVar48 = local_6f0;
          iVar49 = local_5c8._0_4_;
          uVar31 = local_5c8._12_4_;
          iVar77 = local_5c8._16_4_;
          iVar70 = iStack_5b4;
          local_388.p._4_4_ = local_5c8._4_4_;
          iVar71 = local_5c8._8_4_;
          if (local_674 != 1) {
            iVar49 = local_5c8._0_4_ * local_674;
            local_388.p._4_4_ = local_5c8._4_4_ * local_674;
            iVar71 = local_5c8._8_4_ * local_674;
            uVar30 = (uint)((local_5b0 & (undefined1  [16])0x2) == (undefined1  [16])0x0);
            uVar50 = (uint)((local_5b0 & (undefined1  [16])0x4) == (undefined1  [16])0x0);
            uVar31 = (local_5c8._12_4_ + (~local_5b0._0_4_ & 1)) * local_674 -
                     (~local_5b0._0_4_ & 1);
            iVar77 = (local_5c8._16_4_ + uVar30) * local_674 - uVar30;
            iVar70 = (iStack_5b4 + uVar50) * local_674 - uVar50;
          }
          local_728 = CONCAT44(local_728._4_4_,local_388.p._4_4_);
          local_388.jstride._4_4_ = uVar31;
          local_388.kstride._0_4_ = iVar77;
          local_388.kstride._4_4_ = iVar70;
          lVar32 = 0;
          do {
            if (((uint)local_5b0._0_4_ >> ((uint)lVar32 & 0x1f) & 1) != 0) {
              piVar35 = (int *)((long)&local_388.jstride + lVar32 * 4 + 4);
              *piVar35 = *piVar35 + -1;
            }
            lVar32 = lVar32 + 1;
          } while (lVar32 != 3);
          local_388.nstride._0_4_ = 0;
          local_348.kstride._0_4_ = (int)local_388.kstride;
          local_348.kstride._4_4_ = local_388.kstride._4_4_;
          local_348.nstride = local_348.nstride & 0xffffffff00000000;
          local_348.p = (double *)CONCAT44(local_388.p._4_4_,iVar49);
          local_348.jstride._0_4_ = iVar71;
          local_348.jstride._4_4_ = local_388.jstride._4_4_;
          paVar17 = (this->super_MLNodeLinOp).super_MLLinOp.m_lobc.
                    super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                    .
                    super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          paVar22 = (this->super_MLNodeLinOp).super_MLLinOp.m_hibc.
                    super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                    .
                    super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar32 = 0;
          do {
            if ((*(int *)((long)paVar17->_M_elems + lVar32) == 0x6a) &&
               (iVar118 = *(int *)((long)&local_348.p + lVar32),
               iVar118 == *(int *)(local_300 + 0xac + lVar32))) {
              *(int *)((long)&local_348.p + lVar32) = iVar118 + -1;
            }
            if ((*(int *)((long)paVar22->_M_elems + lVar32) == 0x6a) &&
               (iVar118 = *(int *)((long)&local_348.jstride + lVar32 + 4),
               iVar118 == *(int *)(local_300 + 0xb8 + lVar32))) {
              *(int *)((long)&local_348.jstride + lVar32 + 4) = iVar118 + 1;
            }
            lVar32 = lVar32 + 4;
          } while (lVar32 != 0xc);
          local_4a8 = CONCAT44(local_4a8._4_4_,iVar70);
          local_498 = (iMultiFab *)CONCAT44(local_498._4_4_,iVar77);
          local_388.p._0_4_ = iVar49;
          local_388.jstride._0_4_ = iVar71;
          FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    ((Array4<double> *)local_5c8,
                     &(local_200.
                       super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[(long)local_4b0]._M_t.
                       super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                       .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl)->
                      super_FabArray<amrex::FArrayBox>,(MFIter *)local_1b0);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_488,
                     &(local_4b8->
                      super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                      _M_impl.super__Vector_impl_data._M_start[(long)piVar1]->
                      super_FabArray<amrex::FArrayBox>,(MFIter *)local_1b0);
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_4f8,
                     &(pVVar48->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>)
                      .super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                      _M_impl.super__Vector_impl_data._M_start[(long)piVar1]->
                      super_FabArray<amrex::FArrayBox>,(MFIter *)local_1b0);
          FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                    ((Array4<const_int> *)local_608,local_298,(MFIter *)local_1b0);
          local_6c0 = CONCAT44(local_6c0._4_4_,iVar49);
          local_4a0 = CONCAT44(local_4a0._4_4_,uVar31);
          if (local_674 == 2) {
            if ((int)local_428.jstride <= local_428.kstride._4_4_) {
              local_448._4_4_ = 0;
              local_448._0_4_ = local_428.jstride._4_4_;
              local_430 = (ulong)(uint)local_428.kstride;
              local_630 = (long)local_428.p._4_4_;
              local_6c8 = (double)(long)(int)local_428.p;
              local_758 = (double)(long)iVar49;
              local_2e8 = (double)CONCAT44(local_2e8._4_4_,(int)local_428.p * 2);
              local_2f8._0_4_ = (int)local_428.p * 2 + -1;
              local_730 = (Geometry *)(long)(int)uVar31;
              local_738 = (double *)(long)(int)local_728;
              iVar77 = local_428.p._4_4_ * 2 + -1;
              local_438 = CONCAT44(local_438._4_4_,iVar77);
              local_6b0 = (double)(long)(int)local_498;
              lVar65 = (long)iVar71;
              iVar70 = (int)local_428.jstride * 2 + -1;
              local_620 = (FabArray<amrex::IArrayBox> *)
                          CONCAT44(local_620._4_4_,(uint)local_428.kstride + 1);
              lVar42 = (long)(int)local_348.p;
              lVar32 = (long)(int)local_348.jstride._4_4_;
              lVar92 = (long)local_348.p._4_4_;
              lVar72 = (long)(int)local_348.kstride;
              lVar78 = (long)(int)local_348.jstride;
              lVar81 = (long)local_348.kstride._4_4_;
              local_548 = CONCAT44(local_548._4_4_,local_428.kstride._4_4_ + 1);
              local_538 = CONCAT44(local_538._4_4_,local_428.jstride._4_4_ + 1);
              dVar119 = (double)(long)(int)local_428.jstride;
              do {
                local_568 = dVar119;
                local_698 = (long)iVar70;
                if (iVar70 < lVar65) {
                  local_698 = lVar65;
                }
                local_550 = CONCAT44(local_550._4_4_,iVar70);
                iVar118 = iVar70;
                if (iVar70 < iVar71) {
                  iVar118 = iVar71;
                }
                if (local_428.p._4_4_ <= (int)(uint)local_428.kstride) {
                  local_530 = (long)iVar118;
                  local_6b8 = (long)local_568 * 2;
                  local_610 = (long)local_5e8;
                  local_628._M_t.
                  super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                  .super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl =
                       (tuple<amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>)
                       (long)local_5e4;
                  local_2d8 = (double)CONCAT44(local_608._12_4_,local_608._8_4_);
                  local_540._M_t.
                  super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                  .super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl =
                       (tuple<amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>)
                       ((local_6b8 - (long)local_5e0) * CONCAT44(local_608._20_4_,local_608._16_4_)
                        * 4 + local_608._0_8_);
                  iVar118 = (int)local_6b8;
                  iVar37 = iVar118 + -1;
                  if (iVar118 + -1 <= iVar71) {
                    iVar37 = iVar71;
                  }
                  local_508 = CONCAT44(local_508._4_4_,iVar37);
                  iVar91 = iVar118 + 1;
                  if ((int)local_4a8 < iVar118 + 1) {
                    iVar91 = (int)local_4a8;
                  }
                  local_510 = (double *)CONCAT44(local_510._4_4_,iVar91);
                  local_6e8 = (double *)(long)iVar91;
                  local_618 = local_698 + -1;
                  iVar64 = iVar77;
                  local_6a0 = local_630;
                  do {
                    local_640 = (double *)(long)iVar64;
                    if ((long)iVar64 < (long)local_738) {
                      local_640 = local_738;
                    }
                    local_6a8._M_head_impl._0_4_ = iVar64;
                    iVar38 = iVar64;
                    if (iVar64 < (int)local_728) {
                      iVar38 = (int)local_728;
                    }
                    if ((int)local_428.p <= (int)local_428.jstride._4_4_) {
                      local_680 = (double *)(long)iVar38;
                      local_518 = (double *)
                                  ((long)&(((iMultiFab *)
                                           local_540._M_t.
                                           super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                                           .super__Head_base<0UL,_amrex::iMultiFab_*,_false>.
                                           _M_head_impl)->super_FabArray<amrex::IArrayBox>).
                                          super_FabArrayBase._vptr_FabArrayBase +
                                  (local_6a0 * 2 -
                                  (long)local_628._M_t.
                                        super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                                        .super__Head_base<0UL,_amrex::iMultiFab_*,_false>.
                                        _M_head_impl) * (long)local_2d8 * 4);
                      iVar38 = (int)(local_6a0 * 2);
                      iVar56 = iVar38 + -1;
                      if (iVar38 + -1 <= (int)local_728) {
                        iVar56 = (int)local_728;
                      }
                      local_6d8 = (double *)CONCAT44(local_6d8._4_4_,iVar56);
                      iVar57 = iVar38 + 1;
                      if ((int)local_498 < iVar38 + 1) {
                        iVar57 = (int)local_498;
                      }
                      local_6e0 = (double *)CONCAT44(local_6e0._4_4_,iVar57);
                      local_520 = (long)(int)local_5b0._8_4_;
                      local_690 = (local_6a0 - (int)local_5b0._12_4_) *
                                  CONCAT44(local_5c8._12_4_,local_5c8._8_4_) * 8 +
                                  CONCAT44(local_5c8._4_4_,local_5c8._0_4_) +
                                  ((long)local_568 - (long)local_5a0) *
                                  CONCAT44(iStack_5b4,local_5c8._16_4_) * 8;
                      local_528 = (long)local_640 + -1;
                      local_668 = CONCAT44(local_668._4_4_,(int)local_428.p * 2);
                      dVar119 = local_6c8;
                      iVar41 = local_2f8._0_4_;
                      do {
                        local_688 = dVar119;
                        local_638 = CONCAT44(local_638._4_4_,iVar41);
                        dVar119 = (double)(long)iVar41;
                        if ((long)iVar41 < (long)local_758) {
                          dVar119 = local_758;
                        }
                        dVar110 = 0.0;
                        dVar111 = 0.0;
                        if ((*(int *)((long)local_518 + ((long)local_688 * 2 - local_610) * 4) != 0)
                           && (dVar111 = dVar110, iVar37 <= iVar91)) {
                          lVar85 = (long)dVar119 * 8;
                          uVar50 = (uint)((long)local_688 * 2);
                          uVar30 = uVar50 | 1;
                          if ((int)uVar31 < (int)uVar30) {
                            uVar30 = uVar31;
                          }
                          iVar51 = uVar50 - 1;
                          if (iVar51 <= iVar49) {
                            iVar51 = iVar49;
                          }
                          lVar100 = CONCAT44(local_488.nstride._4_4_,(undefined4)local_488.nstride);
                          local_740 = (double *)
                                      (CONCAT44(local_4f8.kstride._4_4_,(int)local_4f8.kstride) * 8)
                          ;
                          lVar60 = CONCAT44(local_4f8.jstride._4_4_,(int)local_4f8.jstride) * 8;
                          local_6d0 = (double *)
                                      (CONCAT44(local_488.kstride._4_4_,
                                                (undefined4)local_488.kstride) * 8);
                          lVar95 = (local_618 - local_488.begin.z) * (long)local_6d0;
                          lVar76 = CONCAT44(local_488.jstride._4_4_,(uint)local_488.jstride) * 8;
                          lVar61 = (local_528 - local_488.begin.y) * lVar76;
                          lVar83 = lVar95 + lVar61 + lVar85;
                          lVar82 = ((long)local_640 - (long)local_488.begin.y) * lVar76;
                          lVar96 = lVar95 + lVar82 + lVar85;
                          lVar95 = (local_698 - local_488.begin.z) * (long)local_6d0;
                          lVar67 = lVar61 + lVar95 + lVar85;
                          lVar55 = lVar95 + lVar82 + lVar85;
                          lVar95 = lVar100 * 0x10;
                          lVar61 = (long)local_488.begin.x;
                          lVar62 = ((long)local_640 - (long)local_4f8.begin.y) * lVar60 +
                                   (local_698 - local_4f8.begin.z) * (long)local_740 + lVar85 +
                                   (long)local_4f8.begin.x * -8 + (long)local_4f8.p;
                          local_720 = (double *)(lVar83 + lVar61 * -8 + (long)local_488.p);
                          lVar90 = lVar100 * 8 + lVar83 + lVar61 * -8 + (long)local_488.p;
                          lVar83 = lVar83 + lVar95 + lVar61 * -8 + (long)local_488.p;
                          local_7f0 = lVar96 + lVar61 * -8 + (long)local_488.p;
                          lVar82 = lVar96 + lVar100 * 8 + lVar61 * -8 + (long)local_488.p;
                          lVar96 = lVar96 + lVar95 + lVar61 * -8 + (long)local_488.p;
                          local_7c8 = lVar67 + lVar61 * -8 + (long)local_488.p;
                          local_840 = lVar67 + lVar100 * 8 + lVar61 * -8 + (long)local_488.p;
                          lVar67 = lVar67 + lVar95 + lVar61 * -8 + (long)local_488.p;
                          local_828 = lVar55 + lVar61 * -8 + (long)local_488.p;
                          local_7c0 = lVar55 + lVar100 * 8 + lVar61 * -8 + (long)local_488.p;
                          lVar100 = lVar55 + lVar95 + lVar61 * -8 + (long)local_488.p;
                          lVar85 = local_530;
                          do {
                            if (iVar56 <= iVar57) {
                              iVar39 = iVar118 - (int)lVar85;
                              iVar46 = -iVar39;
                              if (iVar39 < 1) {
                                iVar46 = iVar39;
                              }
                              lVar61 = lVar85 + -1;
                              local_8a0 = local_7c0;
                              local_8d8 = local_828;
                              local_830 = local_840;
                              local_868 = local_7c8;
                              local_8b0 = local_7f0;
                              local_878 = local_720;
                              pdVar93 = local_680;
                              local_8a8 = lVar67;
                              local_890 = lVar96;
                              local_888 = lVar100;
                              local_870 = lVar62;
                              local_850 = lVar82;
                              local_838 = lVar90;
                              local_808 = lVar83;
                              do {
                                if (iVar51 <= (int)uVar30) {
                                  iVar40 = iVar38 - (int)pdVar93;
                                  iVar39 = -iVar40;
                                  if (iVar40 < 1) {
                                    iVar39 = iVar40;
                                  }
                                  lVar95 = (long)pdVar93 - 1;
                                  lVar55 = 0;
                                  iVar40 = (int)local_668 - SUB84(dVar119,0);
                                  do {
                                    lVar43 = (long)dVar119 + lVar55;
                                    iVar25 = -iVar40;
                                    if (iVar40 < 1) {
                                      iVar25 = iVar40;
                                    }
                                    if (((((long)local_758 < lVar43) && (lVar43 < (long)local_730))
                                        && ((long)local_738 < (long)pdVar93)) &&
                                       ((((long)pdVar93 < (long)local_6b0 && (lVar65 < lVar85)) &&
                                        (lVar85 < (int)local_4a8)))) {
                                      dVar111 = *(double *)(local_870 + lVar55 * 8);
                                    }
                                    else {
                                      lVar44 = (long)dVar119 + lVar55 + -1;
                                      dVar111 = 0.0;
                                      if (((lVar42 < lVar43) && (lVar44 <= lVar32)) &&
                                         ((lVar92 < (long)pdVar93 &&
                                          (((lVar95 <= lVar72 && (lVar78 < lVar85)) &&
                                           (lVar61 <= lVar81)))))) {
                                        dVar111 = *(double *)(local_808 + -8 + lVar55 * 8) *
                                                  local_2c8 +
                                                  (local_878[lVar55 + -1] * local_228 -
                                                  *(double *)(local_838 + -8 + lVar55 * 8) *
                                                  local_670) + 0.0;
                                      }
                                      if (((lVar42 <= lVar43) && (lVar43 <= lVar32)) &&
                                         (((lVar92 < (long)pdVar93 &&
                                           ((lVar95 <= lVar72 && (lVar78 < lVar85)))) &&
                                          (lVar61 <= lVar81)))) {
                                        dVar111 = dVar111 + *(double *)(local_808 + lVar55 * 8) *
                                                            local_2c8 +
                                                            (local_878[lVar55] * local_248 -
                                                            *(double *)(local_838 + lVar55 * 8) *
                                                            local_670);
                                      }
                                      if (((((lVar42 < lVar43) && (lVar44 <= lVar32)) &&
                                           (lVar92 <= (long)pdVar93)) &&
                                          (((long)pdVar93 <= lVar72 && (lVar78 < lVar85)))) &&
                                         (lVar61 <= lVar81)) {
                                        dVar111 = dVar111 + *(double *)(local_890 + -8 + lVar55 * 8)
                                                            * local_2c8 +
                                                            *(double *)(local_8b0 + -8 + lVar55 * 8)
                                                            * local_228 +
                                                            *(double *)(local_850 + -8 + lVar55 * 8)
                                                            * local_670;
                                      }
                                      if (((lVar42 <= lVar43) && (lVar43 <= lVar32)) &&
                                         ((lVar92 <= (long)pdVar93 &&
                                          ((((long)pdVar93 <= lVar72 && (lVar78 < lVar85)) &&
                                           (lVar61 <= lVar81)))))) {
                                        dVar111 = dVar111 + *(double *)(local_890 + lVar55 * 8) *
                                                            local_2c8 +
                                                            *(double *)(local_8b0 + lVar55 * 8) *
                                                            local_248 +
                                                            *(double *)(local_850 + lVar55 * 8) *
                                                            local_670;
                                      }
                                      if (((lVar42 < lVar43) && (lVar44 <= lVar32)) &&
                                         (((lVar92 < (long)pdVar93 &&
                                           ((lVar95 <= lVar72 && (lVar78 <= lVar85)))) &&
                                          (lVar85 <= lVar81)))) {
                                        dVar111 = dVar111 + *(double *)(local_8a8 + -8 + lVar55 * 8)
                                                            * local_258 +
                                                            (*(double *)
                                                              (local_868 + -8 + lVar55 * 8) *
                                                             local_228 -
                                                            *(double *)(local_830 + -8 + lVar55 * 8)
                                                            * local_670);
                                      }
                                      if ((((lVar42 <= lVar43) && (lVar43 <= lVar32)) &&
                                          (lVar92 < (long)pdVar93)) &&
                                         (((lVar95 <= lVar72 && (lVar78 <= lVar85)) &&
                                          (lVar85 <= lVar81)))) {
                                        dVar111 = dVar111 + *(double *)(local_8a8 + lVar55 * 8) *
                                                            local_258 +
                                                            (*(double *)(local_868 + lVar55 * 8) *
                                                             local_248 -
                                                            *(double *)(local_830 + lVar55 * 8) *
                                                            local_670);
                                      }
                                      if (((lVar42 < lVar43) && (lVar44 <= lVar32)) &&
                                         ((lVar92 <= (long)pdVar93 &&
                                          ((((long)pdVar93 <= lVar72 && (lVar78 <= lVar85)) &&
                                           (lVar85 <= lVar81)))))) {
                                        dVar111 = dVar111 + *(double *)(local_888 + -8 + lVar55 * 8)
                                                            * local_258 +
                                                            *(double *)(local_8d8 + -8 + lVar55 * 8)
                                                            * local_228 +
                                                            *(double *)(local_8a0 + -8 + lVar55 * 8)
                                                            * local_670;
                                      }
                                      if ((((lVar42 <= lVar43) && (lVar43 <= lVar32)) &&
                                          ((lVar92 <= (long)pdVar93 &&
                                           (((long)pdVar93 <= lVar72 && (lVar78 <= lVar85)))))) &&
                                         (lVar85 <= lVar81)) {
                                        dVar111 = dVar111 + *(double *)(local_888 + lVar55 * 8) *
                                                            local_258 +
                                                            *(double *)(local_8d8 + lVar55 * 8) *
                                                            local_248 +
                                                            *(double *)(local_8a0 + lVar55 * 8) *
                                                            local_670;
                                      }
                                    }
                                    dVar110 = dVar110 + (double)((iVar25 + 2) *
                                                                (iVar39 + 2) * (iVar46 + 2)) *
                                                        dVar111;
                                    lVar43 = (long)dVar119 + lVar55;
                                    lVar55 = lVar55 + 1;
                                    iVar40 = iVar40 + -1;
                                  } while (lVar43 < (int)uVar30);
                                }
                                local_870 = local_870 + lVar60;
                                local_878 = local_878 +
                                            CONCAT44(local_488.jstride._4_4_,(uint)local_488.jstride
                                                    );
                                local_838 = local_838 + lVar76;
                                local_808 = local_808 + lVar76;
                                local_8b0 = local_8b0 + lVar76;
                                local_850 = local_850 + lVar76;
                                local_890 = local_890 + lVar76;
                                local_868 = local_868 + lVar76;
                                local_830 = local_830 + lVar76;
                                local_8a8 = local_8a8 + lVar76;
                                local_8d8 = local_8d8 + lVar76;
                                local_8a0 = local_8a0 + lVar76;
                                local_888 = local_888 + lVar76;
                                bVar101 = (long)pdVar93 < (long)iVar57;
                                pdVar93 = (double *)((long)pdVar93 + 1);
                              } while (bVar101);
                            }
                            lVar62 = lVar62 + (long)local_740;
                            local_720 = local_720 +
                                        CONCAT44(local_488.kstride._4_4_,
                                                 (undefined4)local_488.kstride);
                            lVar90 = lVar90 + (long)local_6d0;
                            lVar83 = lVar83 + (long)local_6d0;
                            local_7f0 = local_7f0 + (long)local_6d0;
                            lVar82 = lVar82 + (long)local_6d0;
                            lVar96 = lVar96 + (long)local_6d0;
                            local_7c8 = local_7c8 + (long)local_6d0;
                            local_840 = local_840 + (long)local_6d0;
                            lVar67 = lVar67 + (long)local_6d0;
                            local_828 = local_828 + (long)local_6d0;
                            local_7c0 = local_7c0 + (long)local_6d0;
                            lVar100 = lVar100 + (long)local_6d0;
                            bVar101 = lVar85 < (long)local_6e8;
                            lVar85 = lVar85 + 1;
                          } while (bVar101);
                          dVar111 = dVar110 * 0.015625;
                        }
                        *(double *)(local_690 + ((long)local_688 - local_520) * 8) = dVar111;
                        iVar41 = iVar41 + 2;
                        local_668 = CONCAT44(local_668._4_4_,(int)local_668 + 2);
                        dVar119 = (double)((long)local_688 + 1U);
                      } while (local_428.jstride._4_4_ + 1 != (int)((long)local_688 + 1U));
                    }
                    local_6a0 = local_6a0 + 1;
                    iVar64 = iVar64 + 2;
                  } while ((uint)local_428.kstride + 1 != (int)local_6a0);
                }
                iVar70 = iVar70 + 2;
                dVar119 = (double)((long)local_568 + 1U);
              } while (local_428.kstride._4_4_ + 1 != (int)((long)local_568 + 1U));
            }
          }
          else if ((int)local_428.jstride <= local_428.kstride._4_4_) {
            local_448._4_4_ = 0;
            local_448._0_4_ = local_428.jstride._4_4_;
            local_430 = (ulong)(uint)local_428.kstride;
            local_630 = (long)local_428.p._4_4_;
            local_6c8 = (double)(long)(int)local_428.p;
            local_758 = (double)(long)iVar49;
            local_2e8 = (double)CONCAT44(local_2e8._4_4_,(int)local_428.p * 4);
            local_2f8._0_4_ = (int)local_428.p * 4 + -3;
            local_730 = (Geometry *)(long)(int)uVar31;
            local_738 = (double *)(long)(int)local_728;
            iVar77 = local_428.p._4_4_ * 4 + -3;
            local_438 = CONCAT44(local_438._4_4_,iVar77);
            local_6b0 = (double)(long)(int)local_498;
            lVar65 = (long)iVar71;
            iVar70 = (int)local_428.jstride * 4 + -3;
            local_620 = (FabArray<amrex::IArrayBox> *)
                        CONCAT44(local_620._4_4_,(uint)local_428.kstride + 1);
            lVar42 = (long)(int)local_348.p;
            lVar32 = (long)(int)local_348.jstride._4_4_;
            lVar92 = (long)local_348.p._4_4_;
            lVar72 = (long)(int)local_348.kstride;
            lVar78 = (long)(int)local_348.jstride;
            lVar81 = (long)local_348.kstride._4_4_;
            local_548 = CONCAT44(local_548._4_4_,local_428.kstride._4_4_ + 1);
            local_538 = CONCAT44(local_538._4_4_,local_428.jstride._4_4_ + 1);
            dVar119 = (double)(long)(int)local_428.jstride;
            do {
              local_568 = dVar119;
              local_698 = (long)iVar70;
              if (iVar70 < lVar65) {
                local_698 = lVar65;
              }
              local_550 = CONCAT44(local_550._4_4_,iVar70);
              iVar118 = iVar70;
              if (iVar70 < iVar71) {
                iVar118 = iVar71;
              }
              if (local_428.p._4_4_ <= (int)(uint)local_428.kstride) {
                local_530 = (long)iVar118;
                local_6b8 = (long)local_568 * 4;
                local_610 = (long)local_5e8;
                local_628._M_t.
                super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
                super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl =
                     (tuple<amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>)
                     (long)local_5e4;
                local_2d8 = (double)CONCAT44(local_608._12_4_,local_608._8_4_);
                local_540._M_t.
                super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
                super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl =
                     (tuple<amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>)
                     ((local_6b8 - (long)local_5e0) * CONCAT44(local_608._20_4_,local_608._16_4_) *
                      4 + local_608._0_8_);
                iVar118 = (int)local_6b8;
                iVar37 = iVar118 + -3;
                if (iVar118 + -3 <= iVar71) {
                  iVar37 = iVar71;
                }
                local_508 = CONCAT44(local_508._4_4_,iVar37);
                iVar91 = iVar118 + 3;
                if ((int)local_4a8 < iVar118 + 3) {
                  iVar91 = (int)local_4a8;
                }
                local_510 = (double *)CONCAT44(local_510._4_4_,iVar91);
                local_6e8 = (double *)(long)iVar91;
                local_618 = local_698 + -1;
                iVar64 = iVar77;
                local_6a0 = local_630;
                do {
                  local_640 = (double *)(long)iVar64;
                  if ((long)iVar64 < (long)local_738) {
                    local_640 = local_738;
                  }
                  local_6a8._M_head_impl._0_4_ = iVar64;
                  iVar38 = iVar64;
                  if (iVar64 < (int)local_728) {
                    iVar38 = (int)local_728;
                  }
                  if ((int)local_428.p <= (int)local_428.jstride._4_4_) {
                    local_680 = (double *)(long)iVar38;
                    local_518 = (double *)
                                ((long)&(((iMultiFab *)
                                         local_540._M_t.
                                         super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                                         .super__Head_base<0UL,_amrex::iMultiFab_*,_false>.
                                         _M_head_impl)->super_FabArray<amrex::IArrayBox>).
                                        super_FabArrayBase._vptr_FabArrayBase +
                                (local_6a0 * 4 -
                                (long)local_628._M_t.
                                      super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                                      .super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl
                                ) * (long)local_2d8 * 4);
                    iVar38 = (int)(local_6a0 * 4);
                    iVar56 = iVar38 + -3;
                    if (iVar38 + -3 <= (int)local_728) {
                      iVar56 = (int)local_728;
                    }
                    local_6d8 = (double *)CONCAT44(local_6d8._4_4_,iVar56);
                    iVar57 = iVar38 + 3;
                    if ((int)local_498 < iVar38 + 3) {
                      iVar57 = (int)local_498;
                    }
                    local_6e0 = (double *)CONCAT44(local_6e0._4_4_,iVar57);
                    local_520 = (long)(int)local_5b0._8_4_;
                    local_690 = (local_6a0 - (int)local_5b0._12_4_) *
                                CONCAT44(local_5c8._12_4_,local_5c8._8_4_) * 8 +
                                CONCAT44(local_5c8._4_4_,local_5c8._0_4_) +
                                ((long)local_568 - (long)local_5a0) *
                                CONCAT44(iStack_5b4,local_5c8._16_4_) * 8;
                    local_528 = (long)local_640 + -1;
                    local_668 = CONCAT44(local_668._4_4_,(int)local_428.p * 4);
                    dVar119 = local_6c8;
                    iVar41 = local_2f8._0_4_;
                    do {
                      local_688 = dVar119;
                      local_638 = CONCAT44(local_638._4_4_,iVar41);
                      dVar119 = (double)(long)iVar41;
                      if ((long)iVar41 < (long)local_758) {
                        dVar119 = local_758;
                      }
                      dVar111 = 0.0;
                      if ((*(int *)((long)local_518 + ((long)local_688 * 4 - local_610) * 4) != 0)
                         && (iVar37 <= iVar91)) {
                        lVar85 = (long)dVar119 * 8;
                        uVar50 = (uint)((long)local_688 * 4);
                        uVar30 = uVar50 | 3;
                        if ((int)uVar31 < (int)uVar30) {
                          uVar30 = uVar31;
                        }
                        iVar51 = uVar50 - 3;
                        if (iVar51 <= iVar49) {
                          iVar51 = iVar49;
                        }
                        lVar100 = CONCAT44(local_488.nstride._4_4_,(undefined4)local_488.nstride);
                        local_740 = (double *)
                                    (CONCAT44(local_4f8.kstride._4_4_,(int)local_4f8.kstride) * 8);
                        lVar60 = CONCAT44(local_4f8.jstride._4_4_,(int)local_4f8.jstride) * 8;
                        local_6d0 = (double *)
                                    (CONCAT44(local_488.kstride._4_4_,(undefined4)local_488.kstride)
                                    * 8);
                        lVar95 = (local_618 - local_488.begin.z) * (long)local_6d0;
                        lVar76 = CONCAT44(local_488.jstride._4_4_,(uint)local_488.jstride) * 8;
                        lVar61 = (local_528 - local_488.begin.y) * lVar76;
                        lVar83 = lVar95 + lVar61 + lVar85;
                        lVar82 = ((long)local_640 - (long)local_488.begin.y) * lVar76;
                        lVar96 = lVar95 + lVar82 + lVar85;
                        lVar95 = (local_698 - local_488.begin.z) * (long)local_6d0;
                        lVar67 = lVar61 + lVar95 + lVar85;
                        lVar55 = lVar95 + lVar82 + lVar85;
                        lVar95 = lVar100 * 0x10;
                        lVar61 = (long)local_488.begin.x;
                        lVar62 = ((long)local_640 - (long)local_4f8.begin.y) * lVar60 +
                                 (local_698 - local_4f8.begin.z) * (long)local_740 + lVar85 +
                                 (long)local_4f8.begin.x * -8 + (long)local_4f8.p;
                        local_720 = (double *)(lVar83 + lVar61 * -8 + (long)local_488.p);
                        lVar90 = lVar100 * 8 + lVar83 + lVar61 * -8 + (long)local_488.p;
                        lVar83 = lVar83 + lVar95 + lVar61 * -8 + (long)local_488.p;
                        local_7f0 = lVar96 + lVar61 * -8 + (long)local_488.p;
                        lVar82 = lVar96 + lVar100 * 8 + lVar61 * -8 + (long)local_488.p;
                        lVar96 = lVar96 + lVar95 + lVar61 * -8 + (long)local_488.p;
                        local_7c8 = lVar67 + lVar61 * -8 + (long)local_488.p;
                        local_840 = lVar67 + lVar100 * 8 + lVar61 * -8 + (long)local_488.p;
                        lVar67 = lVar67 + lVar95 + lVar61 * -8 + (long)local_488.p;
                        local_828 = lVar55 + lVar61 * -8 + (long)local_488.p;
                        local_7c0 = lVar55 + lVar100 * 8 + lVar61 * -8 + (long)local_488.p;
                        lVar100 = lVar55 + lVar95 + lVar61 * -8 + (long)local_488.p;
                        lVar85 = local_530;
                        do {
                          if (iVar56 <= iVar57) {
                            iVar39 = iVar118 - (int)lVar85;
                            iVar46 = -iVar39;
                            if (iVar39 < 1) {
                              iVar46 = iVar39;
                            }
                            lVar61 = lVar85 + -1;
                            local_8a0 = local_7c0;
                            local_8d8 = local_828;
                            local_830 = local_840;
                            local_868 = local_7c8;
                            local_8b0 = local_7f0;
                            local_878 = local_720;
                            pdVar93 = local_680;
                            local_8a8 = lVar67;
                            local_890 = lVar96;
                            local_888 = lVar100;
                            local_870 = lVar62;
                            local_850 = lVar82;
                            local_838 = lVar90;
                            local_808 = lVar83;
                            do {
                              if (iVar51 <= (int)uVar30) {
                                iVar40 = iVar38 - (int)pdVar93;
                                iVar39 = -iVar40;
                                if (iVar40 < 1) {
                                  iVar39 = iVar40;
                                }
                                lVar95 = (long)pdVar93 - 1;
                                lVar55 = 0;
                                iVar40 = (int)local_668 - SUB84(dVar119,0);
                                do {
                                  lVar43 = (long)dVar119 + lVar55;
                                  iVar25 = -iVar40;
                                  if (iVar40 < 1) {
                                    iVar25 = iVar40;
                                  }
                                  if ((((((long)local_758 < lVar43) && (lVar43 < (long)local_730))
                                       && ((long)local_738 < (long)pdVar93)) &&
                                      (((long)pdVar93 < (long)local_6b0 && (lVar65 < lVar85)))) &&
                                     (lVar85 < (int)local_4a8)) {
                                    dVar110 = *(double *)(local_870 + lVar55 * 8);
                                  }
                                  else {
                                    lVar44 = (long)dVar119 + lVar55 + -1;
                                    dVar110 = 0.0;
                                    if (((lVar42 < lVar43) && (lVar44 <= lVar32)) &&
                                       ((lVar92 < (long)pdVar93 &&
                                        (((lVar95 <= lVar72 && (lVar78 < lVar85)) &&
                                         (lVar61 <= lVar81)))))) {
                                      dVar110 = *(double *)(local_808 + -8 + lVar55 * 8) * local_2c8
                                                + (local_878[lVar55 + -1] * local_228 -
                                                  *(double *)(local_838 + -8 + lVar55 * 8) *
                                                  local_670) + 0.0;
                                    }
                                    if (((lVar42 <= lVar43) && (lVar43 <= lVar32)) &&
                                       (((lVar92 < (long)pdVar93 &&
                                         ((lVar95 <= lVar72 && (lVar78 < lVar85)))) &&
                                        (lVar61 <= lVar81)))) {
                                      dVar110 = dVar110 + *(double *)(local_808 + lVar55 * 8) *
                                                          local_2c8 +
                                                          (local_878[lVar55] * local_248 -
                                                          *(double *)(local_838 + lVar55 * 8) *
                                                          local_670);
                                    }
                                    if ((((lVar42 < lVar43) && (lVar44 <= lVar32)) &&
                                        (lVar92 <= (long)pdVar93)) &&
                                       ((((long)pdVar93 <= lVar72 && (lVar78 < lVar85)) &&
                                        (lVar61 <= lVar81)))) {
                                      dVar110 = dVar110 + *(double *)(local_890 + -8 + lVar55 * 8) *
                                                          local_2c8 +
                                                          *(double *)(local_8b0 + -8 + lVar55 * 8) *
                                                          local_228 +
                                                          *(double *)(local_850 + -8 + lVar55 * 8) *
                                                          local_670;
                                    }
                                    if (((lVar42 <= lVar43) && (lVar43 <= lVar32)) &&
                                       ((lVar92 <= (long)pdVar93 &&
                                        ((((long)pdVar93 <= lVar72 && (lVar78 < lVar85)) &&
                                         (lVar61 <= lVar81)))))) {
                                      dVar110 = dVar110 + *(double *)(local_890 + lVar55 * 8) *
                                                          local_2c8 +
                                                          *(double *)(local_8b0 + lVar55 * 8) *
                                                          local_248 +
                                                          *(double *)(local_850 + lVar55 * 8) *
                                                          local_670;
                                    }
                                    if ((((lVar42 < lVar43) && (lVar44 <= lVar32)) &&
                                        ((lVar92 < (long)pdVar93 &&
                                         ((lVar95 <= lVar72 && (lVar78 <= lVar85)))))) &&
                                       (lVar85 <= lVar81)) {
                                      dVar110 = dVar110 + *(double *)(local_8a8 + -8 + lVar55 * 8) *
                                                          local_258 +
                                                          (*(double *)(local_868 + -8 + lVar55 * 8)
                                                           * local_228 -
                                                          *(double *)(local_830 + -8 + lVar55 * 8) *
                                                          local_670);
                                    }
                                    if (((((lVar42 <= lVar43) && (lVar43 <= lVar32)) &&
                                         (lVar92 < (long)pdVar93)) &&
                                        ((lVar95 <= lVar72 && (lVar78 <= lVar85)))) &&
                                       (lVar85 <= lVar81)) {
                                      dVar110 = dVar110 + *(double *)(local_8a8 + lVar55 * 8) *
                                                          local_258 +
                                                          (*(double *)(local_868 + lVar55 * 8) *
                                                           local_248 -
                                                          *(double *)(local_830 + lVar55 * 8) *
                                                          local_670);
                                    }
                                    if (((lVar42 < lVar43) && (lVar44 <= lVar32)) &&
                                       ((lVar92 <= (long)pdVar93 &&
                                        ((((long)pdVar93 <= lVar72 && (lVar78 <= lVar85)) &&
                                         (lVar85 <= lVar81)))))) {
                                      dVar110 = dVar110 + *(double *)(local_888 + -8 + lVar55 * 8) *
                                                          local_258 +
                                                          *(double *)(local_8d8 + -8 + lVar55 * 8) *
                                                          local_228 +
                                                          *(double *)(local_8a0 + -8 + lVar55 * 8) *
                                                          local_670;
                                    }
                                    if (((lVar42 <= lVar43) && (lVar43 <= lVar32)) &&
                                       (((lVar92 <= (long)pdVar93 &&
                                         (((long)pdVar93 <= lVar72 && (lVar78 <= lVar85)))) &&
                                        (lVar85 <= lVar81)))) {
                                      dVar110 = dVar110 + *(double *)(local_888 + lVar55 * 8) *
                                                          local_258 +
                                                          *(double *)(local_8d8 + lVar55 * 8) *
                                                          local_248 +
                                                          *(double *)(local_8a0 + lVar55 * 8) *
                                                          local_670;
                                    }
                                  }
                                  dVar111 = dVar111 + (double)((iVar25 + 4) *
                                                              (iVar39 + 4) * (iVar46 + 4)) * dVar110
                                  ;
                                  lVar43 = (long)dVar119 + lVar55;
                                  lVar55 = lVar55 + 1;
                                  iVar40 = iVar40 + -1;
                                } while (lVar43 < (int)uVar30);
                              }
                              local_870 = local_870 + lVar60;
                              local_878 = local_878 +
                                          CONCAT44(local_488.jstride._4_4_,(uint)local_488.jstride);
                              local_838 = local_838 + lVar76;
                              local_808 = local_808 + lVar76;
                              local_8b0 = local_8b0 + lVar76;
                              local_850 = local_850 + lVar76;
                              local_890 = local_890 + lVar76;
                              local_868 = local_868 + lVar76;
                              local_830 = local_830 + lVar76;
                              local_8a8 = local_8a8 + lVar76;
                              local_8d8 = local_8d8 + lVar76;
                              local_8a0 = local_8a0 + lVar76;
                              local_888 = local_888 + lVar76;
                              bVar101 = (long)pdVar93 < (long)iVar57;
                              pdVar93 = (double *)((long)pdVar93 + 1);
                            } while (bVar101);
                          }
                          lVar62 = lVar62 + (long)local_740;
                          local_720 = local_720 +
                                      CONCAT44(local_488.kstride._4_4_,(undefined4)local_488.kstride
                                              );
                          lVar90 = lVar90 + (long)local_6d0;
                          lVar83 = lVar83 + (long)local_6d0;
                          local_7f0 = local_7f0 + (long)local_6d0;
                          lVar82 = lVar82 + (long)local_6d0;
                          lVar96 = lVar96 + (long)local_6d0;
                          local_7c8 = local_7c8 + (long)local_6d0;
                          local_840 = local_840 + (long)local_6d0;
                          lVar67 = lVar67 + (long)local_6d0;
                          local_828 = local_828 + (long)local_6d0;
                          local_7c0 = local_7c0 + (long)local_6d0;
                          lVar100 = lVar100 + (long)local_6d0;
                          bVar101 = lVar85 < (long)local_6e8;
                          lVar85 = lVar85 + 1;
                        } while (bVar101);
                        dVar111 = dVar111 * 0.000244140625;
                      }
                      *(double *)(local_690 + ((long)local_688 - local_520) * 8) = dVar111;
                      iVar41 = iVar41 + 4;
                      local_668 = CONCAT44(local_668._4_4_,(int)local_668 + 4);
                      dVar119 = (double)((long)local_688 + 1U);
                    } while (local_428.jstride._4_4_ + 1 != (int)((long)local_688 + 1U));
                  }
                  local_6a0 = local_6a0 + 1;
                  iVar64 = iVar64 + 4;
                } while ((uint)local_428.kstride + 1 != (int)local_6a0);
              }
              iVar70 = iVar70 + 4;
              dVar119 = (double)((long)local_568 + 1U);
            } while (local_428.kstride._4_4_ + 1 != (int)((long)local_568 + 1U));
          }
          pFVar18 = &(local_270.
                      super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[(long)local_558]._M_t.
                      super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                      .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl)->
                     super_FabArray<amrex::FArrayBox>;
          if (pFVar18 != (FabArray<amrex::FArrayBox> *)0x0) {
            FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      (&local_3c8,pFVar18,(MFIter *)local_1b0);
            lVar32 = (long)(int)local_428.jstride;
            if (local_674 == 2) {
              if ((int)local_428.jstride <= local_428.kstride._4_4_) {
                iVar49 = (int)local_428.jstride * 2 + -2;
                do {
                  lVar92 = (long)iVar49;
                  if ((long)iVar49 < (long)iVar71) {
                    lVar92 = (long)iVar71;
                  }
                  iVar77 = iVar49;
                  if (iVar49 < iVar71) {
                    iVar77 = iVar71;
                  }
                  if (local_428.p._4_4_ <= (int)(uint)local_428.kstride) {
                    local_758 = (double)(lVar32 * 2);
                    iVar70 = SUB84(local_758,0);
                    iVar118 = iVar70 + -2;
                    if (iVar70 + -2 <= iVar71) {
                      iVar118 = iVar71;
                    }
                    iVar37 = iVar70 + 1;
                    if (local_388.kstride._4_4_ < iVar70 + 1) {
                      iVar37 = local_388.kstride._4_4_;
                    }
                    iVar91 = local_428.p._4_4_ * 2 + -2;
                    local_878 = (double *)(long)local_428.p._4_4_;
                    do {
                      lVar42 = (long)iVar91;
                      if ((long)iVar91 < (long)(int)local_728) {
                        lVar42 = (long)(int)local_728;
                      }
                      iVar64 = iVar91;
                      if (iVar91 < (int)local_728) {
                        iVar64 = (int)local_728;
                      }
                      if ((int)local_428.p <= (int)local_428.jstride._4_4_) {
                        iVar38 = (int)((long)local_878 * 2);
                        iVar56 = iVar38 + -2;
                        if (iVar38 + -2 <= (int)local_728) {
                          iVar56 = (int)local_728;
                        }
                        iVar57 = iVar38 + 1;
                        if ((int)local_388.kstride < iVar38 + 1) {
                          iVar57 = (int)local_388.kstride;
                        }
                        local_6b0 = (double)(local_608._0_8_ +
                                            ((long)local_878 * 2 - (long)local_5e4) *
                                            CONCAT44(local_608._12_4_,local_608._8_4_) * 4 +
                                            ((long)local_758 - (long)local_5e0) *
                                            CONCAT44(local_608._20_4_,local_608._16_4_) * 4);
                        lVar65 = ((long)local_878 - (long)(int)local_5b0._12_4_) *
                                 CONCAT44(local_5c8._12_4_,local_5c8._8_4_) * 8 +
                                 CONCAT44(local_5c8._4_4_,local_5c8._0_4_) +
                                 (lVar32 - local_5a0) * CONCAT44(iStack_5b4,local_5c8._16_4_) * 8;
                        pGVar68 = (Geometry *)(long)(int)local_428.p;
                        iVar51 = (int)local_428.p * 2 + -2;
                        iVar41 = (int)local_428.p * -2;
                        do {
                          lVar78 = (long)iVar51;
                          if ((long)iVar51 < (long)(int)local_6c0) {
                            lVar78 = (long)(int)local_6c0;
                          }
                          if (*(int *)((long)local_6b0 + ((long)pGVar68 * 2 - (long)local_5e8) * 4)
                              != 0) {
                            local_738 = (double *)CONCAT44(local_738._4_4_,iVar51);
                            dVar111 = 0.0;
                            dVar119 = 0.0;
                            if (iVar118 <= iVar37) {
                              uVar30 = (uint)((long)pGVar68 * 2);
                              uVar31 = uVar30 | 1;
                              if ((int)local_388.jstride._4_4_ < (int)uVar31) {
                                uVar31 = local_388.jstride._4_4_;
                              }
                              iVar46 = uVar30 - 2;
                              if (iVar46 <= (int)local_6c0) {
                                iVar46 = (int)local_6c0;
                              }
                              lVar85 = CONCAT44(local_3c8.jstride._4_4_,
                                                (undefined4)local_3c8.jstride) * 8;
                              lVar72 = (lVar42 - local_3c8.begin.y) * lVar85 +
                                       (lVar92 - local_3c8.begin.z) * local_3c8.kstride * 8 +
                                       lVar78 * 8 + (long)local_3c8.begin.x * -8 + (long)local_3c8.p
                              ;
                              lVar81 = (long)iVar77;
                              do {
                                if (iVar56 <= iVar57) {
                                  lVar100 = (long)iVar64;
                                  lVar61 = lVar72;
                                  do {
                                    if (iVar46 <= (int)uVar31) {
                                      lVar82 = 0;
                                      do {
                                        dVar111 = dVar111 + (2.0 - ABS((double)(iVar41 + (int)lVar78
                                                                               + (int)lVar82) + 0.5)
                                                            ) * (2.0 - ABS((double)((int)lVar100 -
                                                                                   iVar38) + 0.5)) *
                                                            (2.0 - ABS((double)((int)lVar81 - iVar70
                                                                               ) + 0.5)) *
                                                            *(double *)(lVar61 + lVar82 * 8);
                                        lVar60 = lVar78 + lVar82;
                                        lVar82 = lVar82 + 1;
                                      } while (lVar60 < (int)uVar31);
                                    }
                                    lVar61 = lVar61 + lVar85;
                                    bVar101 = lVar100 < iVar57;
                                    lVar100 = lVar100 + 1;
                                  } while (bVar101);
                                }
                                lVar72 = lVar72 + local_3c8.kstride * 8;
                                bVar101 = lVar81 < iVar37;
                                lVar81 = lVar81 + 1;
                                dVar119 = dVar111;
                              } while (bVar101);
                            }
                            *(double *)(lVar65 + ((long)pGVar68 - (long)(int)local_5b0._8_4_) * 8) =
                                 dVar119 * 0.015625 +
                                 *(double *)
                                  (lVar65 + ((long)pGVar68 - (long)(int)local_5b0._8_4_) * 8);
                            local_730 = pGVar68;
                          }
                          pGVar68 = (Geometry *)((long)&(pGVar68->super_CoordSys).c_sys + 1);
                          iVar51 = iVar51 + 2;
                          iVar41 = iVar41 + -2;
                        } while (local_428.jstride._4_4_ + 1 != (int)pGVar68);
                      }
                      local_878 = (double *)((long)local_878 + 1);
                      iVar91 = iVar91 + 2;
                    } while ((uint)local_428.kstride + 1 != (int)local_878);
                  }
                  lVar32 = lVar32 + 1;
                  iVar49 = iVar49 + 2;
                } while (local_428.kstride._4_4_ + 1 != (int)lVar32);
              }
            }
            else if ((int)local_428.jstride <= local_428.kstride._4_4_) {
              iVar49 = (int)local_428.jstride * 4 + -4;
              do {
                lVar92 = (long)iVar49;
                if ((long)iVar49 < (long)iVar71) {
                  lVar92 = (long)iVar71;
                }
                iVar77 = iVar49;
                if (iVar49 < iVar71) {
                  iVar77 = iVar71;
                }
                if (local_428.p._4_4_ <= (int)(uint)local_428.kstride) {
                  local_758 = (double)(lVar32 * 4);
                  iVar70 = SUB84(local_758,0);
                  iVar118 = iVar70 + -4;
                  if (iVar70 + -4 <= iVar71) {
                    iVar118 = iVar71;
                  }
                  iVar37 = iVar70 + 3;
                  if (local_388.kstride._4_4_ < iVar70 + 3) {
                    iVar37 = local_388.kstride._4_4_;
                  }
                  iVar91 = local_428.p._4_4_ * 4 + -4;
                  local_878 = (double *)(long)local_428.p._4_4_;
                  do {
                    lVar42 = (long)iVar91;
                    if ((long)iVar91 < (long)(int)local_728) {
                      lVar42 = (long)(int)local_728;
                    }
                    iVar64 = iVar91;
                    if (iVar91 < (int)local_728) {
                      iVar64 = (int)local_728;
                    }
                    if ((int)local_428.p <= (int)local_428.jstride._4_4_) {
                      iVar38 = (int)((long)local_878 * 4);
                      iVar56 = iVar38 + -4;
                      if (iVar38 + -4 <= (int)local_728) {
                        iVar56 = (int)local_728;
                      }
                      iVar57 = iVar38 + 3;
                      if ((int)local_388.kstride < iVar38 + 3) {
                        iVar57 = (int)local_388.kstride;
                      }
                      local_6b0 = (double)(local_608._0_8_ +
                                          ((long)local_878 * 4 - (long)local_5e4) *
                                          CONCAT44(local_608._12_4_,local_608._8_4_) * 4 +
                                          ((long)local_758 - (long)local_5e0) *
                                          CONCAT44(local_608._20_4_,local_608._16_4_) * 4);
                      lVar65 = ((long)local_878 - (long)(int)local_5b0._12_4_) *
                               CONCAT44(local_5c8._12_4_,local_5c8._8_4_) * 8 +
                               CONCAT44(local_5c8._4_4_,local_5c8._0_4_) +
                               (lVar32 - local_5a0) * CONCAT44(iStack_5b4,local_5c8._16_4_) * 8;
                      pGVar68 = (Geometry *)(long)(int)local_428.p;
                      iVar51 = (int)local_428.p * 4 + -4;
                      iVar41 = (int)local_428.p * -4;
                      do {
                        lVar78 = (long)iVar51;
                        if ((long)iVar51 < (long)(int)local_6c0) {
                          lVar78 = (long)(int)local_6c0;
                        }
                        if (*(int *)((long)local_6b0 + ((long)pGVar68 * 4 - (long)local_5e8) * 4) !=
                            0) {
                          local_738 = (double *)CONCAT44(local_738._4_4_,iVar51);
                          dVar111 = 0.0;
                          dVar119 = 0.0;
                          if (iVar118 <= iVar37) {
                            uVar30 = (uint)((long)pGVar68 * 4);
                            uVar31 = uVar30 | 3;
                            if ((int)local_388.jstride._4_4_ < (int)uVar31) {
                              uVar31 = local_388.jstride._4_4_;
                            }
                            iVar46 = uVar30 - 4;
                            if (iVar46 <= (int)local_6c0) {
                              iVar46 = (int)local_6c0;
                            }
                            lVar85 = CONCAT44(local_3c8.jstride._4_4_,(undefined4)local_3c8.jstride)
                                     * 8;
                            lVar72 = (lVar42 - local_3c8.begin.y) * lVar85 +
                                     (lVar92 - local_3c8.begin.z) * local_3c8.kstride * 8 +
                                     lVar78 * 8 + (long)local_3c8.begin.x * -8 + (long)local_3c8.p;
                            lVar81 = (long)iVar77;
                            do {
                              if (iVar56 <= iVar57) {
                                lVar100 = (long)iVar64;
                                lVar61 = lVar72;
                                do {
                                  if (iVar46 <= (int)uVar31) {
                                    lVar82 = 0;
                                    do {
                                      dVar111 = dVar111 + (4.0 - ABS((double)(iVar41 + (int)lVar78 +
                                                                             (int)lVar82) + 0.5)) *
                                                          (4.0 - ABS((double)((int)lVar100 - iVar38)
                                                                     + 0.5)) *
                                                          (4.0 - ABS((double)((int)lVar81 - iVar70)
                                                                     + 0.5)) *
                                                          *(double *)(lVar61 + lVar82 * 8);
                                      lVar60 = lVar78 + lVar82;
                                      lVar82 = lVar82 + 1;
                                    } while (lVar60 < (int)uVar31);
                                  }
                                  lVar61 = lVar61 + lVar85;
                                  bVar101 = lVar100 < iVar57;
                                  lVar100 = lVar100 + 1;
                                } while (bVar101);
                              }
                              lVar72 = lVar72 + local_3c8.kstride * 8;
                              bVar101 = lVar81 < iVar37;
                              lVar81 = lVar81 + 1;
                              dVar119 = dVar111;
                            } while (bVar101);
                          }
                          *(double *)(lVar65 + ((long)pGVar68 - (long)(int)local_5b0._8_4_) * 8) =
                               dVar119 * 0.000244140625 +
                               *(double *)
                                (lVar65 + ((long)pGVar68 - (long)(int)local_5b0._8_4_) * 8);
                          local_730 = pGVar68;
                        }
                        pGVar68 = (Geometry *)((long)&(pGVar68->super_CoordSys).c_sys + 1);
                        iVar51 = iVar51 + 4;
                        iVar41 = iVar41 + -4;
                      } while (local_428.jstride._4_4_ + 1 != (int)pGVar68);
                    }
                    local_878 = (double *)((long)local_878 + 1);
                    iVar91 = iVar91 + 4;
                  } while ((uint)local_428.kstride + 1 != (int)local_878);
                }
                lVar32 = lVar32 + 1;
                iVar49 = iVar49 + 4;
              } while (local_428.kstride._4_4_ + 1 != (int)lVar32);
            }
          }
          MFIter::operator++((MFIter *)local_1b0);
        } while (aiStack_190[0] < aiStack_190[2]);
      }
      MFIter::~MFIter((MFIter *)local_1b0);
      uVar63 = (ulong)(this->super_MLNodeLinOp).super_MLLinOp.m_num_amr_levels;
    } while ((long)local_558 < (long)(uVar63 - 1));
  }
  if (0 < (int)uVar63) {
    lVar32 = 0;
    do {
      pMVar20 = local_1c8.
                super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar32]._M_t.
                super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
                super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
      if (pMVar20 != (MultiFab *)0x0) {
        MultiFab::Add((local_6f0->
                      super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                      super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                      _M_impl.super__Vector_impl_data._M_start[lVar32],pMVar20,0,0,1,0);
        uVar63 = (ulong)(uint)(this->super_MLNodeLinOp).super_MLLinOp.m_num_amr_levels;
      }
      lVar32 = lVar32 + 1;
      iVar71 = (int)uVar63;
    } while (lVar32 < iVar71);
    if (1 < iVar71) {
      dVar119 = (double)(ulong)(iVar71 - 2);
      do {
        pGVar68 = *(Geometry **)
                   &(this->super_MLNodeLinOp).super_MLLinOp.m_geom.
                    super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                    .
                    super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[(long)dVar119].
                    super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                    super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
        pMVar20 = (local_6f0->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                  super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
                  super__Vector_impl_data._M_start[(long)dVar119];
        local_5c8._4_4_ = 0;
        local_5c8._0_4_ = 1;
        local_5b0 = (undefined1  [16])0x0;
        local_5c8._8_4_ = 0;
        local_5c8._12_4_ = 0;
        local_5c8._16_4_ = 0;
        iStack_5b4 = 0;
        local_488.p = (double *)&PTR__FabFactory_00712918;
        local_6c8 = dVar119;
        MultiFab::MultiFab((MultiFab *)local_1b0,
                           (BoxArray *)
                           ((long)&(pMVar20->super_FabArray<amrex::FArrayBox>).super_FabArrayBase +
                           8),(DistributionMapping *)
                              ((long)&(pMVar20->super_FabArray<amrex::FArrayBox>).super_FabArrayBase
                              + 0x70),1,0,(MFInfo *)local_5c8,
                           (FabFactory<amrex::FArrayBox> *)&local_488);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_5c8 + 0x10));
        FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                  ((FabArray<amrex::FArrayBox> *)local_1b0,0.0,0,local_e4,&local_f0);
        pFVar18 = &(local_200.
                    super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[(long)local_6c8]._M_t.
                    super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                    .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl)->
                   super_FabArray<amrex::FArrayBox>;
        PVar133 = Geometry::periodicity(pGVar68);
        local_5c8._0_4_ = PVar133.period.vect[0];
        local_5c8._4_4_ = PVar133.period.vect[1];
        local_5c8._8_4_ = PVar133.period.vect[2];
        FabArray<amrex::FArrayBox>::ParallelCopy
                  ((FabArray<amrex::FArrayBox> *)local_1b0,pFVar18,(Periodicity *)local_5c8,ADD);
        Geometry::growPeriodicDomain(pGVar68,1);
        pVVar48 = local_6f0;
        local_718.bigend.vect[1] = local_778.bigend.vect[1];
        local_718.bigend.vect[2] = local_778.bigend.vect[2];
        local_718.btype.itype = local_778.btype.itype;
        local_718.smallend.vect[0] = local_778.smallend.vect[0];
        local_718.smallend.vect[1] = local_778.smallend.vect[1];
        local_718.smallend.vect[2] = local_778.smallend.vect[2];
        local_718.bigend.vect[0] = local_778.bigend.vect[0];
        lVar32 = 0;
        do {
          if (*(int *)(local_660 + lVar32 * 4 + 0x10) == 0x6a) {
            piVar35 = local_718.smallend.vect + lVar32;
            *piVar35 = *piVar35 + -1;
          }
          if (*(int *)(local_660 + lVar32 * 4) == 0x6a) {
            piVar35 = local_718.bigend.vect + lVar32;
            *piVar35 = *piVar35 + 1;
          }
          lVar32 = lVar32 + 1;
        } while (lVar32 != 3);
        local_3e8.smallend.vect._0_8_ = *(undefined8 *)(pGVar68->domain).smallend.vect;
        uVar26 = *(undefined8 *)((pGVar68->domain).smallend.vect + 2);
        uVar27 = *(undefined8 *)((pGVar68->domain).bigend.vect + 2);
        local_3e8.bigend.vect[1] =
             (int)((ulong)*(undefined8 *)(pGVar68->domain).bigend.vect >> 0x20);
        local_3e8.bigend.vect[2] = (int)uVar27;
        local_3e8.btype.itype = (uint)((ulong)uVar27 >> 0x20);
        local_3e8.smallend.vect[2] = (int)uVar26;
        local_3e8.bigend.vect[0] = (int)((ulong)uVar26 >> 0x20);
        lVar32 = 0;
        do {
          if ((local_3e8.btype.itype >> ((uint)lVar32 & 0x1f) & 1) == 0) {
            piVar35 = local_3e8.bigend.vect + lVar32;
            *piVar35 = *piVar35 + 1;
          }
          lVar32 = lVar32 + 1;
        } while (lVar32 != 3);
        local_3e8.btype.itype = 7;
        local_568 = (pGVar68->super_CoordSys).inv_dx[0];
        uStack_560 = 0;
        local_498 = (iMultiFab *)(pGVar68->super_CoordSys).inv_dx[1];
        uStack_490 = 0;
        local_448._8_8_ = 0;
        local_448._0_8_ = (pGVar68->super_CoordSys).inv_dx[2];
        local_620 = (FabArray<amrex::IArrayBox> *)
                    **(undefined8 **)
                      &(this->super_MLNodeLinOp).m_dirichlet_mask.
                       super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                       .
                       super__Vector_base<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[(long)dVar119].
                       super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                       .
                       super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
        ;
        local_628._M_t.
        super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
        super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl =
             (this->super_MLNodeLinOp).m_nd_fine_mask.
             super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
             .
             super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[(long)local_6c8]._M_t.
             super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>._M_t;
        local_540._M_t.
        super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
        super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl =
             (this->super_MLNodeLinOp).m_cc_fine_mask.
             super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
             .
             super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[(long)local_6c8]._M_t.
             super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>._M_t;
        local_6a8._M_head_impl =
             *(LayoutData<int> **)
              &(this->super_MLNodeLinOp).m_has_fine_bndry.
               super_vector<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>,_std::allocator<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>_>_>
               .
               super__Vector_base<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>,_std::allocator<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[(long)local_6c8]._M_t.
               super___uniq_ptr_impl<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>
        ;
        local_214.device_sync = true;
        local_214.num_streams = Gpu::Device::max_gpu_streams;
        local_214.do_tiling = true;
        local_214.tilesize.vect[2] = DAT_00717ec0;
        local_214.tilesize.vect[0] = (int)FabArrayBase::mfiter_tile_size;
        local_214.tilesize.vect[1] = FabArrayBase::mfiter_tile_size._4_4_;
        local_214.dynamic = true;
        MFIter::MFIter((MFIter *)local_5c8,
                       (FabArrayBase *)
                       (local_6f0->
                       super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                       super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                       _M_impl.super__Vector_impl_data._M_start[(long)local_6c8],&local_214);
        iVar71 = local_718.smallend.vect[2];
        if ((int)local_5b0._8_4_ < local_5a0) {
          local_568 = local_568 * 0.25;
          local_498 = (iMultiFab *)((double)local_498 * 0.25);
          uVar122 = local_448._8_4_;
          uVar31 = local_448._12_4_;
          dVar119 = local_448._0_8_ * 0.25;
          lVar32 = (long)local_718.smallend.vect[0];
          lVar92 = (long)local_718.bigend.vect[0];
          lVar42 = (long)local_718.smallend.vect[1];
          lVar65 = (long)local_718.bigend.vect[1];
          local_2d8 = -local_568;
          uStack_2d0 = uStack_560 ^ 0x8000000000000000;
          local_2e8 = -(double)local_498;
          uStack_2e0 = uStack_490 ^ 0x8000000000000000;
          local_448._8_4_ = uVar122;
          local_448._0_8_ = dVar119;
          local_448._12_4_ = uVar31;
          lVar78 = (long)local_3e8.smallend.vect[0];
          local_758 = (double)CONCAT44(local_758._4_4_,local_718.bigend.vect[2]);
          local_2f8._8_4_ = uVar122;
          local_2f8._0_8_ = -dVar119;
          local_2f8._12_4_ = uVar31 ^ 0x80000000;
          do {
            iVar49 = local_5b0._8_4_;
            if (local_588 != (Vector<int,_std::allocator<int>_> *)0x0) {
              iVar49 = (local_588->super_vector<int,_std::allocator<int>_>).
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start[(int)local_5b0._8_4_];
            }
            if (*(int *)(*(long *)&((local_6a8._M_head_impl)->m_data).
                                   super_vector<int,_std::allocator<int>_> + (long)iVar49 * 4) != 0)
            {
              MFIter::tilebox(&local_28c,(MFIter *)local_5c8);
              dVar119 = local_6c8;
              FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                        ((Array4<double> *)&local_488,
                         &(pVVar48->
                          super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                          super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                          _M_impl.super__Vector_impl_data._M_start[(long)local_6c8]->
                          super_FabArray<amrex::FArrayBox>,(MFIter *)local_5c8);
              FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                        (&local_4f8,
                         &(local_4b8->
                          super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                          super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                          _M_impl.super__Vector_impl_data._M_start[(long)dVar119]->
                          super_FabArray<amrex::FArrayBox>,(MFIter *)local_5c8);
              FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                        ((Array4<const_double> *)local_608,(FabArray<amrex::FArrayBox> *)local_1b0,
                         (MFIter *)local_5c8);
              FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                        ((Array4<const_int> *)&local_3c8,local_620,(MFIter *)local_5c8);
              FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                        ((Array4<const_int> *)&local_428,
                         (FabArray<amrex::IArrayBox> *)
                         local_628._M_t.
                         super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                         .super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl,
                         (MFIter *)local_5c8);
              FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                        ((Array4<const_int> *)&local_388,
                         (FabArray<amrex::IArrayBox> *)
                         local_540._M_t.
                         super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                         .super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl,
                         (MFIter *)local_5c8);
              pFVar18 = &(local_270.
                          super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[(long)dVar119]._M_t.
                          super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>
                          .super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl)->
                         super_FabArray<amrex::FArrayBox>;
              if (pFVar18 == (FabArray<amrex::FArrayBox> *)0x0) {
                local_348.kstride._0_4_ = 0;
                local_348.kstride._4_4_ = 0;
                local_348.nstride = 0;
                local_348.p = (double *)0x0;
                local_348.jstride._0_4_ = 0;
                local_348.jstride._4_4_ = 0;
                local_348.begin.x = 1;
                local_348.begin.y = 1;
                local_348.begin.z = 1;
                local_348.end.x = 0;
                local_348.end.y = 0;
                local_348.end.z = 0;
                local_348.ncomp = 0;
              }
              else {
                FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                          (&local_348,pFVar18,(MFIter *)local_5c8);
              }
              local_538 = CONCAT44(local_538._4_4_,local_28c.bigend.vect[2]);
              pVVar48 = local_6f0;
              if (local_28c.smallend.vect[2] <= local_28c.bigend.vect[2]) {
                local_728 = (ulong)(uint)local_28c.bigend.vect[1];
                local_610 = (long)local_28c.smallend.vect[1];
                lVar81 = (long)local_28c.smallend.vect[0];
                local_690 = CONCAT44(local_690._4_4_,local_28c.bigend.vect[1] + 1U);
                local_6a0 = local_610 + -1;
                local_618 = CONCAT44(local_618._4_4_,local_28c.smallend.vect[2] + -1);
                local_668 = lVar81 * 8;
                local_6b8 = lVar81 * 4;
                local_638 = CONCAT44(local_638._4_4_,local_28c.bigend.vect[0]);
                local_530 = CONCAT44(local_530._4_4_,-local_28c.smallend.vect[0]);
                iVar49 = local_28c.smallend.vect[2];
                do {
                  if (local_28c.smallend.vect[1] <= local_28c.bigend.vect[1]) {
                    local_520 = (long)iVar49;
                    local_528 = (long)(int)local_618;
                    iVar77 = iVar49 + -1;
                    local_688 = (double)(CONCAT44(local_3c8.jstride._4_4_,
                                                  (undefined4)local_3c8.jstride) * 4);
                    lVar85 = (long)local_3c8.p +
                             (local_610 - local_3c8.begin.y) * (long)local_688 +
                             (local_520 - local_3c8.begin.z) * local_3c8.kstride * 4 +
                             (long)local_3c8.begin.x * -4 + local_6b8;
                    lVar72 = local_610;
                    local_7f0 = local_6a0;
                    do {
                      if (local_28c.smallend.vect[0] <= local_28c.bigend.vect[0]) {
                        lVar100 = CONCAT44(local_4f8.jstride._4_4_,(int)local_4f8.jstride);
                        lVar82 = CONCAT44(local_4f8.kstride._4_4_,(int)local_4f8.kstride);
                        lVar90 = local_4f8.nstride * 0x10;
                        dVar119 = *(double *)
                                   (&DAT_0067f160 +
                                   (ulong)((local_660._0_4_ - 0x66 & 0xfffffffb) == 0) * 8);
                        lVar83 = lVar72 - local_4f8.begin.y;
                        lVar62 = lVar100 * lVar83 + lVar81;
                        lVar96 = local_520 - local_4f8.begin.z;
                        lVar45 = lVar82 * lVar96;
                        lVar61 = lVar62 + lVar45;
                        lVar55 = local_7f0 - local_4f8.begin.y;
                        lVar45 = lVar100 * lVar55 + lVar81 + lVar45;
                        lVar43 = local_528 - local_4f8.begin.z;
                        lVar62 = lVar82 * lVar43 + lVar62;
                        lVar60 = CONCAT44(local_388.kstride._4_4_,(int)local_388.kstride) * 4;
                        lVar36 = (local_520 - local_388.begin.z) * lVar60;
                        lVar60 = (local_528 - local_388.begin.z) * lVar60;
                        lVar76 = CONCAT44(local_388.jstride._4_4_,(int)local_388.jstride) * 4;
                        lVar44 = (local_7f0 - local_388.begin.y) * lVar76;
                        lVar76 = (lVar72 - local_388.begin.y) * lVar76;
                        lVar95 = (long)local_388.begin.x;
                        lVar67 = CONCAT44(local_388.p._4_4_,(int)local_388.p) + local_6b8;
                        local_6b0 = (double)(lVar44 + lVar36 + lVar95 * -4 + lVar67);
                        local_730 = (Geometry *)(lVar44 + lVar60 + lVar95 * -4 + lVar67);
                        lVar53 = lVar36 + lVar76 + lVar95 * -4 + lVar67;
                        local_738 = (double *)(lVar76 + lVar60 + lVar95 * -4 + lVar67);
                        lVar58 = lVar72 - local_348.begin.y;
                        lVar47 = local_7f0 - local_348.begin.y;
                        lVar67 = local_520 - local_348.begin.z;
                        lVar44 = local_528 - local_348.begin.z;
                        lVar60 = CONCAT44(local_348.jstride._4_4_,(int)local_348.jstride);
                        lVar54 = lVar60 * lVar58 + lVar81;
                        lVar95 = CONCAT44(local_348.kstride._4_4_,(int)local_348.kstride);
                        lVar79 = lVar95 * lVar67;
                        lVar98 = lVar47 * lVar60 * 8;
                        lVar58 = lVar60 * 8 * lVar58;
                        lVar36 = lVar44 * lVar95 * 8;
                        lVar67 = lVar95 * 8 * lVar67;
                        lVar76 = (long)local_348.begin.x;
                        local_6c0 = (long)local_348.p + lVar36 + lVar98 + lVar76 * -8 + local_668;
                        local_4a0 = (long)local_348.p + lVar36 + lVar58 + lVar76 * -8 + local_668;
                        local_698 = (long)local_348.p + lVar98 + lVar67 + lVar76 * -8 + local_668;
                        local_508 = (long)local_348.p + lVar67 + lVar58 + lVar76 * -8 + local_668;
                        lVar55 = lVar55 * lVar100 * 8;
                        lVar83 = lVar100 * 8 * lVar83;
                        lVar43 = lVar43 * lVar82 * 8;
                        lVar96 = lVar82 * 8 * lVar96;
                        lVar100 = lVar55 + lVar43;
                        lVar43 = lVar43 + lVar83;
                        lVar55 = lVar55 + lVar96;
                        lVar96 = lVar96 + lVar83;
                        lVar83 = (long)local_4f8.begin.x;
                        local_720 = local_4f8.p + ((lVar61 + local_4f8.nstride * 2 + -1) - lVar83);
                        local_6d0 = local_4f8.p + ((lVar45 + -1) - lVar83);
                        local_740 = local_4f8.p + ((lVar45 + local_4f8.nstride + -1) - lVar83);
                        local_6d8 = local_4f8.p + ((lVar45 + local_4f8.nstride * 2 + -1) - lVar83);
                        local_6e0 = local_4f8.p + ((lVar62 + -1) - lVar83);
                        local_6e8 = local_4f8.p + ((local_4f8.nstride + lVar62 + -1) - lVar83);
                        local_680 = local_4f8.p + ((lVar62 + local_4f8.nstride * 2 + -1) - lVar83);
                        lVar82 = lVar100 + lVar83 * -8 + local_668;
                        lVar62 = lVar100 + local_4f8.nstride * 8 + lVar83 * -8 + local_668;
                        lVar67 = lVar100 + lVar90 + lVar83 * -8 + local_668;
                        local_510 = local_348.p + ((lVar54 + lVar79 + -1) - lVar76);
                        local_640 = local_348.p +
                                    ((lVar60 * lVar47 + lVar81 + lVar79 + -1) - lVar76);
                        local_518 = local_348.p + ((lVar95 * lVar44 + lVar54 + -1) - lVar76);
                        lVar100 = lVar72 + -1;
                        lVar60 = (long)local_778.bigend.vect[0];
                        lVar95 = 0;
                        do {
                          if ((*(int *)(lVar85 + lVar95 * 4) == 0) &&
                             (*(int *)((local_520 - local_428.begin.z) *
                                       CONCAT44(local_428.kstride._4_4_,(uint)local_428.kstride) * 4
                                       + (lVar72 - local_428.begin.y) *
                                         CONCAT44(local_428.jstride._4_4_,(int)local_428.jstride) *
                                         4 + (long)local_428.begin.x * -4 +
                                       CONCAT44(local_428.p._4_4_,(int)local_428.p) + local_6b8 +
                                      lVar95 * 4) == 1)) {
                            lVar76 = lVar81 + lVar95;
                            puVar117 = *(undefined **)
                                        (local_608._0_8_ +
                                        (lVar81 + (((lVar72 - local_5e4) *
                                                    CONCAT44(local_608._12_4_,local_608._8_4_) +
                                                   (local_520 - local_5e0) *
                                                   CONCAT44(local_608._20_4_,local_608._16_4_) +
                                                   lVar95) - (long)local_5e8)) * 8);
                            lVar44 = lVar81 + lVar95 + -1;
                            if (((((*(int *)((long)(local_730->super_CoordSys).offset +
                                            lVar95 * 4 + -0xc) == 0) &&
                                  (((((lVar32 < lVar76 && (lVar44 <= lVar92)) && (lVar42 < lVar72))
                                    && ((lVar100 <= lVar65 && (iVar71 < iVar49)))) &&
                                   (iVar77 <= (int)local_758)))) &&
                                 (((puVar117 = (undefined *)
                                               ((double)puVar117 +
                                               *(double *)
                                                ((long)local_4f8.p + lVar95 * 8 + lVar67 + -8) *
                                               (double)local_2f8._0_8_ +
                                               *(double *)
                                                ((long)local_4f8.p + lVar95 * 8 + lVar82 + -8) *
                                               local_2d8 +
                                               *(double *)
                                                ((long)local_4f8.p + lVar95 * 8 + lVar62 + -8) *
                                               local_2e8), local_348.p != (double *)0x0 &&
                                   (local_778.smallend.vect[0] < lVar76)) && (lVar44 <= lVar60))))
                                && (((local_778.smallend.vect[1] < lVar72 &&
                                     (lVar100 <= local_778.bigend.vect[1])) &&
                                    (local_778.smallend.vect[2] < iVar49)))) &&
                               (iVar77 <= local_778.bigend.vect[2])) {
                              puVar117 = (undefined *)
                                         ((double)puVar117 +
                                         *(double *)(local_6c0 + -8 + lVar95 * 8) * 0.125);
                            }
                            if ((((*(int *)((long)(local_730->super_CoordSys).offset +
                                           lVar95 * 4 + -8) == 0) && (lVar32 <= lVar76)) &&
                                ((lVar76 <= lVar92 && ((lVar42 < lVar72 && (lVar100 <= lVar65))))))
                               && ((iVar71 < iVar49 &&
                                   (((((iVar77 <= (int)local_758 &&
                                       (puVar117 = (undefined *)
                                                   ((double)puVar117 +
                                                   *(double *)
                                                    ((long)local_4f8.p + lVar95 * 8 + lVar67) *
                                                   (double)local_2f8._0_8_ +
                                                   *(double *)
                                                    ((long)local_4f8.p + lVar95 * 8 + lVar82) *
                                                   local_568 +
                                                   *(double *)
                                                    ((long)local_4f8.p + lVar95 * 8 + lVar62) *
                                                   local_2e8), local_348.p != (double *)0x0)) &&
                                      (local_778.smallend.vect[0] <= lVar76)) &&
                                     ((lVar76 <= lVar60 && (local_778.smallend.vect[1] < lVar72))))
                                    && ((lVar100 <= local_778.bigend.vect[1] &&
                                        ((local_778.smallend.vect[2] < iVar49 &&
                                         (iVar77 <= local_778.bigend.vect[2])))))))))) {
                              puVar117 = (undefined *)
                                         ((double)puVar117 +
                                         *(double *)(local_6c0 + lVar95 * 8) * 0.125);
                            }
                            if ((((((*(int *)((long)local_738 + lVar95 * 4 + -4) == 0) &&
                                   (lVar32 < lVar76)) && (lVar44 <= lVar92)) &&
                                 ((lVar42 <= lVar72 && (lVar72 <= lVar65)))) &&
                                ((((iVar71 < iVar49 &&
                                   ((iVar77 <= (int)local_758 &&
                                    (puVar117 = (undefined *)
                                                ((double)puVar117 +
                                                local_680[lVar95] * (double)local_2f8._0_8_ +
                                                local_6e0[lVar95] * local_2d8 +
                                                local_6e8[lVar95] * (double)local_498),
                                    local_348.p != (double *)0x0)))) &&
                                  (local_778.smallend.vect[0] < lVar76)) &&
                                 (((lVar44 <= lVar60 && (local_778.smallend.vect[1] <= lVar72)) &&
                                  (lVar72 <= local_778.bigend.vect[1])))))) &&
                               ((local_778.smallend.vect[2] < iVar49 &&
                                (iVar77 <= local_778.bigend.vect[2])))) {
                              puVar117 = (undefined *)((double)puVar117 + local_518[lVar95] * 0.125)
                              ;
                            }
                            if (((((*(int *)((long)local_738 + lVar95 * 4) == 0) &&
                                  (lVar32 <= lVar76)) &&
                                 ((lVar76 <= lVar92 &&
                                  (((lVar42 <= lVar72 && (lVar72 <= lVar65)) && (iVar71 < iVar49))))
                                 )) && ((iVar77 <= (int)local_758 &&
                                        (puVar117 = (undefined *)
                                                    ((double)puVar117 +
                                                    *(double *)
                                                     ((long)local_4f8.p +
                                                     lVar95 * 8 +
                                                     lVar43 + lVar90 + lVar83 * -8 + local_668) *
                                                    (double)local_2f8._0_8_ +
                                                    *(double *)
                                                     ((long)local_4f8.p +
                                                     lVar95 * 8 + lVar43 + lVar83 * -8 + local_668)
                                                    * local_568 +
                                                    *(double *)
                                                     ((long)local_4f8.p +
                                                     lVar95 * 8 +
                                                     lVar43 + local_4f8.nstride * 8 + lVar83 * -8 +
                                                     local_668) * (double)local_498),
                                        local_348.p != (double *)0x0)))) &&
                               ((local_778.smallend.vect[0] <= lVar76 &&
                                (((lVar76 <= lVar60 && (local_778.smallend.vect[1] <= lVar72)) &&
                                 ((lVar72 <= local_778.bigend.vect[1] &&
                                  ((local_778.smallend.vect[2] < iVar49 &&
                                   (iVar77 <= local_778.bigend.vect[2])))))))))) {
                              puVar117 = (undefined *)
                                         ((double)puVar117 +
                                         *(double *)(local_4a0 + lVar95 * 8) * 0.125);
                            }
                            if (((((((*(int *)((long)local_6b0 + -4 + lVar95 * 4) == 0) &&
                                    (lVar32 < lVar76)) && (lVar44 <= lVar92)) &&
                                  ((lVar42 < lVar72 && (lVar100 <= lVar65)))) &&
                                 ((iVar71 <= iVar49 &&
                                  ((iVar49 <= (int)local_758 &&
                                   (puVar117 = (undefined *)
                                               ((double)puVar117 +
                                               local_6d8[lVar95] * (double)local_448._0_8_ +
                                               local_6d0[lVar95] * local_2d8 +
                                               local_740[lVar95] * local_2e8),
                                   local_348.p != (double *)0x0)))))) &&
                                ((local_778.smallend.vect[0] < lVar76 &&
                                 (((lVar44 <= lVar60 && (local_778.smallend.vect[1] < lVar72)) &&
                                  (lVar100 <= local_778.bigend.vect[1])))))) &&
                               ((local_778.smallend.vect[2] <= iVar49 &&
                                (iVar49 <= local_778.bigend.vect[2])))) {
                              puVar117 = (undefined *)((double)puVar117 + local_640[lVar95] * 0.125)
                              ;
                            }
                            if ((((*(int *)((long)local_6b0 + lVar95 * 4) == 0) &&
                                 (lVar32 <= lVar76)) &&
                                ((lVar76 <= lVar92 &&
                                 (((lVar42 < lVar72 && (lVar100 <= lVar65)) && (iVar71 <= iVar49))))
                                )) && (((iVar49 <= (int)local_758 &&
                                        (puVar117 = (undefined *)
                                                    ((double)puVar117 +
                                                    *(double *)
                                                     ((long)local_4f8.p +
                                                     lVar95 * 8 +
                                                     lVar55 + lVar90 + lVar83 * -8 + local_668) *
                                                    (double)local_448._0_8_ +
                                                    *(double *)
                                                     ((long)local_4f8.p +
                                                     lVar95 * 8 + lVar55 + lVar83 * -8 + local_668)
                                                    * local_568 +
                                                    *(double *)
                                                     ((long)local_4f8.p +
                                                     lVar95 * 8 +
                                                     lVar55 + local_4f8.nstride * 8 + lVar83 * -8 +
                                                     local_668) * local_2e8),
                                        local_348.p != (double *)0x0)) &&
                                       ((local_778.smallend.vect[0] <= lVar76 &&
                                        (((lVar76 <= lVar60 && (local_778.smallend.vect[1] < lVar72)
                                          ) && ((lVar100 <= local_778.bigend.vect[1] &&
                                                ((local_778.smallend.vect[2] <= iVar49 &&
                                                 (iVar49 <= local_778.bigend.vect[2])))))))))))) {
                              puVar117 = (undefined *)
                                         ((double)puVar117 +
                                         *(double *)(local_698 + lVar95 * 8) * 0.125);
                            }
                            if ((((((((*(int *)(lVar53 + -4 + lVar95 * 4) == 0) && (lVar32 < lVar76)
                                     ) && (lVar44 <= lVar92)) &&
                                   ((lVar42 <= lVar72 && (lVar72 <= lVar65)))) && (iVar71 <= iVar49)
                                  ) && ((iVar49 <= (int)local_758 &&
                                        (puVar117 = (undefined *)
                                                    ((double)puVar117 +
                                                    local_720[lVar95] * (double)local_448._0_8_ +
                                                    local_4f8.p[(lVar61 + lVar95 + -1) - lVar83] *
                                                    local_2d8 +
                                                    local_4f8.p
                                                    [(local_4f8.nstride + lVar61 + lVar95 + -1) -
                                                     lVar83] * (double)local_498),
                                        local_348.p != (double *)0x0)))) &&
                                ((local_778.smallend.vect[0] < lVar76 &&
                                 (((lVar44 <= lVar60 && (local_778.smallend.vect[1] <= lVar72)) &&
                                  (lVar72 <= local_778.bigend.vect[1])))))) &&
                               ((local_778.smallend.vect[2] <= iVar49 &&
                                (iVar49 <= local_778.bigend.vect[2])))) {
                              puVar117 = (undefined *)((double)puVar117 + local_510[lVar95] * 0.125)
                              ;
                            }
                            if ((((((*(int *)(lVar53 + lVar95 * 4) == 0) && (lVar32 <= lVar76)) &&
                                  ((lVar76 <= lVar92 &&
                                   (((lVar42 <= lVar72 && (lVar72 <= lVar65)) && (iVar71 <= iVar49))
                                   )))) && ((iVar49 <= (int)local_758 &&
                                            (puVar117 = (undefined *)
                                                        ((double)puVar117 +
                                                        *(double *)
                                                         ((long)local_4f8.p +
                                                         lVar95 * 8 +
                                                         lVar96 + lVar90 + lVar83 * -8 + local_668)
                                                        * (double)local_448._0_8_ +
                                                        *(double *)
                                                         ((long)local_4f8.p +
                                                         lVar95 * 8 +
                                                         lVar96 + lVar83 * -8 + local_668) *
                                                        local_568 +
                                                        *(double *)
                                                         ((long)local_4f8.p +
                                                         lVar95 * 8 +
                                                         lVar96 + local_4f8.nstride * 8 +
                                                         lVar83 * -8 + local_668) *
                                                        (double)local_498),
                                            local_348.p != (double *)0x0)))) &&
                                (local_778.smallend.vect[0] <= lVar76)) &&
                               (((lVar76 <= lVar60 && (local_778.smallend.vect[1] <= lVar72)) &&
                                ((lVar72 <= local_778.bigend.vect[1] &&
                                 ((local_778.smallend.vect[2] <= iVar49 &&
                                  (iVar49 <= local_778.bigend.vect[2])))))))) {
                              puVar117 = (undefined *)
                                         ((double)puVar117 +
                                         *(double *)(local_508 + lVar95 * 8) * 0.125);
                            }
                            if (((lVar78 - lVar81 != lVar95) ||
                                ((dVar111 = 2.0, local_660._16_4_ != 0x66 &&
                                 (dVar111 = 2.0, local_660._16_4_ != 0x6a)))) &&
                               (dVar111 = 1.0,
                               local_3e8.bigend.vect[0] + -local_28c.smallend.vect[0] == (int)lVar95
                               )) {
                              dVar111 = dVar119;
                            }
                            if (((local_3e8.smallend.vect[1] == (int)lVar72) &&
                                ((iStack_64c == 0x6a || (iStack_64c == 0x66)))) ||
                               ((local_3e8.bigend.vect[1] == (int)lVar72 &&
                                ((local_660._4_4_ == 0x6a || (local_660._4_4_ == 0x66)))))) {
                              dVar111 = dVar111 + dVar111;
                            }
                            if (((local_3e8.smallend.vect[2] == iVar49) &&
                                ((local_648 == inflow || (local_648 == Neumann)))) ||
                               ((local_3e8.bigend.vect[2] == iVar49 &&
                                ((local_660._8_4_ == inflow || (local_660._8_4_ == Neumann)))))) {
                              dVar111 = dVar111 + dVar111;
                            }
                            local_488.p
                            [lVar81 + (((lVar72 - local_488.begin.y) *
                                        CONCAT44(local_488.jstride._4_4_,(uint)local_488.jstride) +
                                       (local_520 - local_488.begin.z) *
                                       CONCAT44(local_488.kstride._4_4_,
                                                (undefined4)local_488.kstride) + lVar95) -
                                      (long)local_488.begin.x)] =
                                 (double)((double)puVar117 * dVar111);
                          }
                          lVar95 = lVar95 + 1;
                        } while ((local_28c.bigend.vect[0] - local_28c.smallend.vect[0]) + 1 !=
                                 (int)lVar95);
                      }
                      lVar72 = lVar72 + 1;
                      local_7f0 = local_7f0 + 1;
                      lVar85 = lVar85 + (long)local_688;
                    } while (local_28c.bigend.vect[1] + 1U != (int)lVar72);
                  }
                  local_618 = CONCAT44(local_618._4_4_,(int)local_618 + 1);
                  bVar101 = iVar49 != local_28c.bigend.vect[2];
                  iVar49 = iVar49 + 1;
                } while (bVar101);
              }
            }
            MFIter::operator++((MFIter *)local_5c8);
          } while ((int)local_5b0._8_4_ < local_5a0);
        }
        MFIter::~MFIter((MFIter *)local_5c8);
        MultiFab::~MultiFab((MultiFab *)local_1b0);
        dVar119 = (double)((long)local_6c8 - 1);
      } while (0 < (long)local_6c8);
      uVar63 = (ulong)(uint)(this->super_MLNodeLinOp).super_MLLinOp.m_num_amr_levels;
    }
    if (0 < (int)uVar63) {
      lVar32 = 0;
      do {
        ppMVar23 = (local_1e8->
                   super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>).
                   super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        if ((lVar32 < (long)(local_1e8->
                            super_vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                            ).
                            super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppMVar23 >> 3) &&
           (pMVar20 = ppMVar23[lVar32], pMVar20 != (MultiFab *)0x0)) {
          MultiFab::Add((local_6f0->
                        super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                        super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                        _M_impl.super__Vector_impl_data._M_start[lVar32],pMVar20,0,0,1,0);
          uVar63 = (ulong)(uint)(this->super_MLNodeLinOp).super_MLLinOp.m_num_amr_levels;
        }
        lVar32 = lVar32 + 1;
      } while (lVar32 < (int)uVar63);
      if (0 < (int)uVar63) {
        lVar32 = 0;
        do {
          EB_set_covered((local_6f0->
                         super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                         super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                         _M_impl.super__Vector_impl_data._M_start[lVar32],0.0);
          lVar32 = lVar32 + 1;
        } while (lVar32 < (this->super_MLNodeLinOp).super_MLLinOp.m_num_amr_levels);
      }
    }
  }
  std::
  vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  ::~vector(&local_200);
  std::
  vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  ::~vector(&local_1c8);
  std::
  vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
  ::~vector(&local_270);
  return;
}

Assistant:

void
MLNodeLaplacian::compRHS (const Vector<MultiFab*>& rhs, const Vector<MultiFab*>& vel,
                          const Vector<const MultiFab*>& rhnd,
                          const Vector<MultiFab*>& a_rhcc)
{
#if (AMREX_SPACEDIM == 1)
    amrex::ignore_unused(rhs,vel,rhnd,a_rhcc);
#else
    //
    // Note that div vel we copmute on a coarse/fine nodes is not a
    // composite divergence.  It has been restricted so that it is suitable
    // as RHS for our geometric mulitgrid solver with a MG hirerachy
    // including multiple AMR levels.
    //
    // Also note that even for RAP, we do doubling at Nuemann boundary,
    // because unimposeNeumannBC will be called on rhs for RAP.
    //

    BL_PROFILE("MLNodeLaplacian::compRHS()");

    if (!m_masks_built) buildMasks();

#ifdef AMREX_USE_EB
    if (!m_integral_built) buildIntegral();
    if (m_build_surface_integral && !m_surface_integral_built) buildSurfaceIntegral();
#endif

#if (AMREX_SPACEDIM == 2)
    bool is_rz = m_is_rz;
#endif

    const auto lobc = LoBC();
    const auto hibc = HiBC();

    bool has_inflow = false;
    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        has_inflow = has_inflow || (lobc[idim] == LinOpBCType::inflow ||
                                    hibc[idim] == LinOpBCType::inflow);
    }

    Vector<std::unique_ptr<MultiFab> > rhcc(m_num_amr_levels);
    Vector<std::unique_ptr<MultiFab> > rhs_cc(m_num_amr_levels);

    for (int ilev = 0; ilev < m_num_amr_levels; ++ilev)
    {
        const Geometry& geom = m_geom[ilev][0];
        AMREX_ASSERT(vel[ilev]->nComp() >= AMREX_SPACEDIM);
        AMREX_ASSERT(vel[ilev]->nGrow() >= 1);

        if (has_inflow) { // Zero out transverse velocity so that it's not seen.
            Box domain = geom.Domain();
            for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
                if (lobc[idim] != LinOpBCType::inflow) {
                    domain.growLo(idim,1);
                }
                if (hibc[idim] != LinOpBCType::inflow) {
                    domain.growHi(idim,1);
                }
            }
            const auto dlo = domain.smallEnd();
            const auto dhi = domain.bigEnd();
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
            for (MFIter mfi(*vel[ilev],TilingIfNotGPU()); mfi.isValid(); ++mfi)
            {
                const Box& bx = mfi.growntilebox(1);
                Array4<Real> const& vfab = vel[ilev]->array(mfi);
                if ( ! domain.contains(bx) ) {
                    AMREX_HOST_DEVICE_PARALLEL_FOR_3D(bx, i, j, k,
                    {
                        IntVect cell(AMREX_D_DECL(i,j,k));
                        for (int in = 0; in < AMREX_SPACEDIM; ++in) {
                            for (int it = 0; it < AMREX_SPACEDIM; ++it) {
                                if (it != in) {
                                    if (cell[in] < dlo[in] || cell[in] > dhi[in]) {
                                        vfab(i,j,k,it) = Real(0.0);
                                    }
                                }
                            }
                        }
                    });
                }
            }
        }

        vel[ilev]->FillBoundary(0, AMREX_SPACEDIM, IntVect(1), geom.periodicity());

        if (ilev < a_rhcc.size() && a_rhcc[ilev])
        {
            rhcc[ilev] = std::make_unique<MultiFab>(a_rhcc[ilev]->boxArray(),
                                                    a_rhcc[ilev]->DistributionMap(), 1, 1);
            rhcc[ilev]->setVal(0.0);
            MultiFab::Copy(*rhcc[ilev], *a_rhcc[ilev], 0, 0, 1, 0);
            rhcc[ilev]->FillBoundary(geom.periodicity());

            rhs_cc[ilev] = std::make_unique<MultiFab>(rhs[ilev]->boxArray(),
                                                      rhs[ilev]->DistributionMap(), 1, 0);
        }

        const auto dxinvarr = geom.InvCellSizeArray();
        const Box& nddom = amrex::surroundingNodes(geom.Domain());

        const iMultiFab& dmsk = *m_dirichlet_mask[ilev][0];

#ifdef AMREX_USE_EB
        auto factory = dynamic_cast<EBFArrayBoxFactory const*>(m_factory[ilev][0].get());
        const FabArray<EBCellFlagFab>* flags = (factory) ? &(factory->getMultiEBCellFlagFab()) : nullptr;
        const MultiFab* vfrac = (factory) ? &(factory->getVolFrac()) : nullptr;
        const MultiCutFab* barea = (factory) ? &(factory->getBndryArea()) : nullptr;
        const MultiFab* intg = m_integral[ilev].get();
        const MultiFab* sintg = m_surface_integral[ilev].get();

        AMREX_ALWAYS_ASSERT(ilev == m_num_amr_levels-1 || AMRRefRatio(ilev) == 2
                            || factory == nullptr || factory->isAllRegular());
#endif

        MFItInfo mfi_info;
        if (Gpu::notInLaunchRegion()) mfi_info.EnableTiling().SetDynamic(true);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(*rhs[ilev],mfi_info); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.tilebox();
            Array4<Real> const& rhsarr = rhs[ilev]->array(mfi);
            Array4<Real const> const& velarr = vel[ilev]->const_array(mfi);
            Array4<int const> const& dmskarr = dmsk.const_array(mfi);

#ifdef AMREX_USE_EB
            bool regular = !factory;
            FabType typ = FabType::regular;
            if (factory)
            {
                const auto& flag = (*flags)[mfi];
                const auto& ccbx = amrex::grow(amrex::enclosedCells(bx),1);
                typ = flag.getType(ccbx);
                if (typ == FabType::covered)
                {
                    AMREX_HOST_DEVICE_PARALLEL_FOR_3D(bx, i, j, k,
                    {
                        rhsarr(i,j,k) = 0.0;
                    });
                }
                else if (typ == FabType::singlevalued)
                {
                    Array4<Real const> const& vfracarr = vfrac->const_array(mfi);
                    Array4<Real const> const& intgarr = intg->const_array(mfi);
                    AMREX_HOST_DEVICE_FOR_3D(bx, i, j, k,
                    {
                        mlndlap_divu_eb(i,j,k,rhsarr,velarr,vfracarr,intgarr,dmskarr,dxinvarr,nddom,lobc,hibc);
                    });

                    if (m_eb_vel_dot_n[ilev]) {
                        Array4<Real const> const& eb_vel_dot_n = m_eb_vel_dot_n[ilev]->const_array(mfi);
                        Array4<Real const> const& bareaarr = barea->const_array(mfi);
                        Array4<Real const> const& sintgarr = sintg->const_array(mfi);

                        AMREX_HOST_DEVICE_FOR_3D(bx, i, j, k,
                        {
                            add_eb_flow_contribution(i,j,k,rhsarr,dmskarr,
                                dxinvarr,bareaarr,sintgarr,eb_vel_dot_n);
                        });
                    }
                }
                else
                {
                    regular = true;
                }
            }
            if (regular)
#endif
            {
#if (AMREX_SPACEDIM == 2)
                AMREX_HOST_DEVICE_PARALLEL_FOR_3D (bx, i, j, k,
                {
                    mlndlap_divu(i,j,k,rhsarr,velarr,dmskarr,dxinvarr,
                                 nddom,lobc,hibc,is_rz);
                });
#else
                AMREX_HOST_DEVICE_PARALLEL_FOR_3D (bx, i, j, k,
                {
                    mlndlap_divu(i,j,k,rhsarr,velarr,dmskarr,dxinvarr,
                                 nddom,lobc,hibc);
                });
#endif
            }

            mlndlap_impose_neumann_bc(bx, rhsarr, nddom, lobc, hibc);

            if (rhcc[ilev])
            {
                Array4<Real> const& rhs_cc_a = rhs_cc[ilev]->array(mfi);
                Array4<Real const> const& rhccarr = rhcc[ilev]->const_array(mfi);
#ifdef AMREX_USE_EB
                if (typ == FabType::singlevalued)
                {
                    Array4<Real const> const& vfracarr = vfrac->const_array(mfi);
                    Array4<Real const> const& intgarr = intg->const_array(mfi);
                    AMREX_HOST_DEVICE_FOR_3D(bx, i, j, k,
                    {
                        rhs_cc_a(i,j,k) = mlndlap_rhcc_eb(i,j,k,rhccarr,vfracarr,intgarr,dmskarr);
                    });
                }
                else if (typ == FabType::covered)
                {
                    AMREX_HOST_DEVICE_PARALLEL_FOR_3D(bx, i, j, k,
                    {
                        rhs_cc_a(i,j,k) = 0.0;
                    });
                }
                else
#endif
                {
                    AMREX_HOST_DEVICE_PARALLEL_FOR_3D(bx, i, j, k,
                    {
                        rhs_cc_a(i,j,k) = mlndlap_rhcc(i, j, k, rhccarr, dmskarr);
                    });
                }

                mlndlap_impose_neumann_bc(bx, rhs_cc_a, nddom, lobc, hibc);
            }
        }
    }

    Vector<std::unique_ptr<MultiFab> > frhs(m_num_amr_levels);

    for (int ilev = 0; ilev < m_num_amr_levels-1; ++ilev)
    {
        const int amrrr = AMRRefRatio(ilev);
        const Geometry& fgeom = m_geom[ilev+1][0];
        AMREX_ALWAYS_ASSERT(amrrr == 2 || amrrr == 4);

        frhs[ilev] = std::make_unique<MultiFab>(amrex::coarsen(rhs[ilev+1]->boxArray(),amrrr),
                                                rhs[ilev+1]->DistributionMap(), 1, 0);

        const Box& ccfdom = fgeom.Domain();
        const auto fdxinv = fgeom.InvCellSizeArray();
        const iMultiFab& fdmsk = *m_dirichlet_mask[ilev+1][0];

        MFItInfo mfi_info;
        if (Gpu::notInLaunchRegion()) mfi_info.EnableTiling().SetDynamic(true);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(*frhs[ilev],mfi_info); mfi.isValid(); ++mfi)
        {
            const Box& cbx = mfi.tilebox();
            const Box& fvbx = amrex::refine(mfi.validbox(),amrrr);
            const Box& cc_fvbx = amrex::enclosedCells(fvbx);

            Box bx_vel = cc_fvbx;
            for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
            {
                if (m_lobc[0][idim] == LinOpBCType::inflow)
                {
                    if (bx_vel.smallEnd(idim) == ccfdom.smallEnd(idim)) {
                        bx_vel.growLo(idim, 1);
                    }
                }
                if (m_hibc[0][idim] == LinOpBCType::inflow)
                {
                    if (bx_vel.bigEnd(idim) == ccfdom.bigEnd(idim)) {
                        bx_vel.growHi(idim, 1);
                    }
                }
            }

            Array4<Real> const& rhsarr = frhs[ilev]->array(mfi);
            Array4<Real const> const& velarr = vel[ilev+1]->const_array(mfi);
            Array4<Real const> const& rhsarr_fine = rhs[ilev+1]->const_array(mfi);
            Array4<int const> const& mskarr = fdmsk.const_array(mfi);
#if (AMREX_SPACEDIM == 2)
            if (amrrr == 2) {
                AMREX_HOST_DEVICE_PARALLEL_FOR_3D(cbx, i, j, k,
                {
                    mlndlap_divu_fine_contrib<2>(i,j,k,fvbx,bx_vel,rhsarr,velarr,rhsarr_fine,
                                                 mskarr,fdxinv,is_rz);
                });
            } else {
                AMREX_HOST_DEVICE_PARALLEL_FOR_3D(cbx, i, j, k,
                {
                    mlndlap_divu_fine_contrib<4>(i,j,k,fvbx,bx_vel,rhsarr,velarr,rhsarr_fine,
                                                 mskarr,fdxinv,is_rz);
                });
            }
#elif (AMREX_SPACEDIM == 3)
            if (amrrr == 2) {
                AMREX_HOST_DEVICE_PARALLEL_FOR_3D(cbx, i, j, k,
                {
                    mlndlap_divu_fine_contrib<2>(i,j,k,fvbx,bx_vel,rhsarr,velarr,rhsarr_fine,
                                                 mskarr,fdxinv);
                });
            } else {
                AMREX_HOST_DEVICE_PARALLEL_FOR_3D(cbx, i, j, k,
                {
                    mlndlap_divu_fine_contrib<4>(i,j,k,fvbx,bx_vel,rhsarr,velarr,rhsarr_fine,
                                                 mskarr,fdxinv);
                });
            }
#endif

            if (rhcc[ilev+1])
            {
                // xxxxx TODO: incorrect if cut cells are too close to coarse/fine boundary
                Array4<Real const> const& rhccarr = rhcc[ilev+1]->const_array(mfi);
                if (amrrr == 2) {
                    AMREX_HOST_DEVICE_FOR_3D(cbx, i, j, k,
                    {
                        mlndlap_rhcc_fine_contrib<2>(i,j,k,cc_fvbx,rhsarr,rhccarr,mskarr);
                    });
                } else {
                    AMREX_HOST_DEVICE_FOR_3D(cbx, i, j, k,
                    {
                        mlndlap_rhcc_fine_contrib<4>(i,j,k,cc_fvbx,rhsarr,rhccarr,mskarr);
                    });
                }
            }
        }
    }

    for (int ilev = 0; ilev < m_num_amr_levels; ++ilev)
    {
        if (rhs_cc[ilev]) {
            MultiFab::Add(*rhs[ilev], *rhs_cc[ilev], 0, 0, 1, 0);
        }
    }

    for (int ilev = m_num_amr_levels-2; ilev >= 0; --ilev)
    {
        const Geometry& cgeom = m_geom[ilev][0];

        MultiFab crhs(rhs[ilev]->boxArray(), rhs[ilev]->DistributionMap(), 1, 0);
        crhs.setVal(0.0);
        crhs.ParallelAdd(*frhs[ilev], cgeom.periodicity());

        const Box& cccdom = cgeom.Domain();
        const Box& cccdom_p = cgeom.growPeriodicDomain(1);
        Box cccdom_pi = cccdom_p;
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
            if (lobc[idim] == LinOpBCType::inflow) {
                cccdom_pi.growLo(idim,1);
            }
            if (hibc[idim] == LinOpBCType::inflow) {
                cccdom_pi.growHi(idim,1);
            }
        }
        const Box& cnddom = amrex::surroundingNodes(cccdom);
        const auto cdxinv = cgeom.InvCellSizeArray();
        const iMultiFab& cdmsk = *m_dirichlet_mask[ilev][0];
        const iMultiFab& c_nd_mask = *m_nd_fine_mask[ilev];
        const iMultiFab& c_cc_mask = *m_cc_fine_mask[ilev];
        const auto& has_fine_bndry = *m_has_fine_bndry[ilev];

        MFItInfo mfi_info;
        if (Gpu::notInLaunchRegion()) mfi_info.EnableTiling().SetDynamic(true);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(*rhs[ilev],mfi_info); mfi.isValid(); ++mfi)
        {
            if (has_fine_bndry[mfi])
            {
                const Box& bx = mfi.tilebox();

                Array4<Real> const& rhsarr = rhs[ilev]->array(mfi);
                Array4<Real const> const& velarr = vel[ilev]->const_array(mfi);
                Array4<Real const> const& crhsarr = crhs.const_array(mfi);
                Array4<int const> const& cdmskarr = cdmsk.const_array(mfi);
                Array4<int const> const& ndmskarr = c_nd_mask.const_array(mfi);
                Array4<int const> const& ccmskarr = c_cc_mask.const_array(mfi);

                Array4<Real const> rhccarr = (rhcc[ilev])
                    ? rhcc[ilev]->const_array(mfi) : Array4<Real const>{};
#if (AMREX_SPACEDIM == 2)
                AMREX_HOST_DEVICE_FOR_3D(bx, i, j, k,
                {
                    mlndlap_divu_cf_contrib(i,j,k,rhsarr,velarr,crhsarr,rhccarr,
                                            cdmskarr,ndmskarr,ccmskarr,
                                            is_rz,
                                            cdxinv,cccdom_p,cccdom_pi,cnddom,lobc,hibc);
                });
#elif (AMREX_SPACEDIM == 3)
                AMREX_HOST_DEVICE_FOR_3D(bx, i, j, k,
                {
                    mlndlap_divu_cf_contrib(i,j,k,rhsarr,velarr,crhsarr,rhccarr,
                                            cdmskarr,ndmskarr,ccmskarr,
                                            cdxinv,cccdom_p,cccdom_pi,cnddom,lobc,hibc);
                });
#endif
            }
        }
    }

    for (int ilev = 0; ilev < m_num_amr_levels; ++ilev)
    {
        if (ilev < rhnd.size() && rhnd[ilev]) {
            MultiFab::Add(*rhs[ilev], *rhnd[ilev], 0, 0, 1, 0);
        }
    }

#ifdef AMREX_USE_EB
    for (int ilev = 0; ilev < m_num_amr_levels; ++ilev) {
        amrex::EB_set_covered(*rhs[ilev], 0.0);
    }
#endif
#endif
}